

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined4 uVar11;
  uint uVar12;
  _func_int *p_Var13;
  int *piVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  _func_int **pp_Var19;
  _func_int **pp_Var20;
  _func_int **pp_Var21;
  Layer *pLVar22;
  byte bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  byte bVar32;
  byte bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  ulong uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined4 uVar134;
  undefined4 uVar135;
  undefined1 auVar136 [64];
  Mat *pMVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  long lVar143;
  Allocator *pAVar144;
  int iVar145;
  uint uVar146;
  ulong uVar147;
  uint uVar148;
  ulong uVar149;
  void *pvVar150;
  int y_4;
  void *pvVar151;
  int iVar152;
  undefined1 (*pauVar153) [64];
  undefined1 (*pauVar154) [32];
  ulong uVar155;
  undefined1 (*pauVar156) [16];
  uint uVar157;
  Allocator *pAVar158;
  long lVar159;
  long lVar160;
  int iVar161;
  ulong uVar162;
  int y_12;
  int y_5;
  uint uVar163;
  ulong uVar164;
  ulong uVar165;
  int iVar166;
  void *pvVar167;
  int y;
  void *pvVar168;
  undefined1 (*pauVar169) [64];
  float *pfVar170;
  int y_2;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float *pfVar171;
  int iVar172;
  int iVar173;
  int iVar174;
  int iVar175;
  void *pvVar176;
  void *pvVar177;
  ushort uVar178;
  ulong uVar179;
  ulong uVar180;
  undefined1 auVar181 [16];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [64];
  undefined1 auVar294 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar315 [64];
  undefined1 auVar317 [64];
  float afVar318 [16];
  float afVar319 [16];
  float afVar320 [16];
  float afVar321 [16];
  float afVar322 [16];
  float afVar323 [16];
  float afVar324 [16];
  float afVar325 [16];
  float afVar326 [16];
  float afVar327 [16];
  float afVar328 [16];
  float afVar329 [16];
  float afVar330 [16];
  float afVar331 [16];
  float afVar332 [16];
  float afVar333 [16];
  float afVar334 [16];
  float afVar335 [16];
  float afVar336 [16];
  float afVar337 [16];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  undefined1 auVar345 [64];
  undefined1 auVar346 [64];
  int iVar347;
  int iVar348;
  int iVar349;
  int iVar350;
  int iVar351;
  int iVar352;
  int iVar353;
  int iVar354;
  int iVar355;
  int iVar356;
  float fVar357;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  float fVar372;
  undefined1 auVar367 [64];
  undefined1 auVar368 [64];
  undefined1 auVar369 [64];
  undefined1 auVar370 [64];
  undefined1 auVar371 [64];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  float fVar379;
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  v4sf one;
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [16];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar410 [64];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar484 [32];
  undefined1 auVar481 [16];
  float in_ZMM13 [16];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  float afVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 auVar493 [32];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [32];
  undefined1 auVar498 [32];
  undefined1 auVar499 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM20 [64];
  float in_ZMM21 [16];
  undefined1 in_ZMM29 [64];
  int size;
  int h_3;
  int h;
  int outw;
  int outh_3;
  int outh;
  Option opt_b;
  long local_2f8;
  Allocator *local_2e0;
  Allocator *local_2d0;
  undefined1 local_248 [16];
  Mat local_228;
  _func_int **local_1e0;
  int local_1d4;
  long local_1d0;
  undefined1 local_1c8 [64];
  Allocator *local_188;
  Allocator *local_180;
  Option *local_178;
  int local_170;
  int local_16c;
  undefined1 local_168 [72];
  Mat *local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  void *local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  size_t local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  undefined1 auVar316 [64];
  
  iVar8 = bottom_blob->w;
  uVar9 = bottom_blob->h;
  pvVar151 = (void *)(ulong)uVar9;
  uVar149 = bottom_blob->elemsize;
  p_Var13 = this->_vptr_Deconvolution_x86_avx512[-3];
  local_16c = (*(int *)(&this->field_0xd4 + (long)p_Var13) + -1) *
              *(int *)(&this->field_0xdc + (long)p_Var13);
  iVar173 = bottom_blob->elempack;
  iVar145 = *(int *)(&this->field_0xe4 + (long)p_Var13);
  local_170 = (*(int *)(&this->field_0xd8 + (long)p_Var13) + -1) *
              *(int *)(&this->field_0xe0 + (long)p_Var13);
  iVar152 = *(int *)(&this->field_0xe8 + (long)p_Var13);
  iVar172 = *(int *)(&this->field_0xfc + (long)p_Var13);
  iVar161 = *(int *)(&this->field_0x100 + (long)p_Var13);
  uVar162 = 1;
  if (opt->use_packing_layout == true) {
    uVar146 = *(uint *)(&this->field_0xd0 + (long)p_Var13);
    if ((uVar146 & 0xf) == 0) {
      uVar162 = 0x10;
    }
    else if ((uVar146 & 7) == 0) {
      uVar162 = 8;
    }
    else {
      uVar162 = (ulong)((uint)((uVar146 & 3) == 0) * 3 + 1);
    }
  }
  uVar146 = (uint)uVar162;
  uVar147 = (long)*(int *)(&this->field_0xd0 + (long)p_Var13) / (long)(int)uVar146;
  iVar142 = (int)uVar147;
  local_228.cstep = 0;
  local_228.data = (Allocator *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize._0_4_ = 0;
  local_228.elempack = 0;
  p_Var13 = this->_vptr_Deconvolution_x86_avx512[-3];
  pvVar168 = (void *)0x10;
  local_228.elemsize._4_4_ = (int)local_228.refcount;
  local_228.allocator = (Allocator *)local_228.data;
  local_228.dims = (int)local_228.refcount;
  local_228.w = local_228.refcount._4_4_;
  local_228.h = (int)local_228.elemsize;
  local_228.d = (int)local_228.refcount;
  local_228.c = local_228.elempack;
  if ((((((*(int *)(&this->field_0xec + (long)p_Var13) < 1) &&
         (*(int *)(&this->field_0xf0 + (long)p_Var13) < 1)) &&
        (*(int *)(&this->field_0xf4 + (long)p_Var13) < 1)) &&
       (*(int *)(&this->field_0xf8 + (long)p_Var13) < 1)) &&
      ((*(int *)(&this->field_0x104 + (long)p_Var13) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var13) < 1)))) &&
     (pvVar168 = (void *)0x8, &local_228 != top_blob)) {
    auVar181._8_8_ = 0;
    auVar181._0_8_ = local_248._8_8_;
    local_248 = auVar181 << 0x40;
    piVar14 = top_blob->refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    local_228.data = top_blob->data;
    local_228.refcount._0_4_ = (int)top_blob->refcount;
    local_228.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
    local_228.elemsize._0_4_ = (int)top_blob->elemsize;
    local_228.elemsize._4_4_ = (int)(top_blob->elemsize >> 0x20);
    local_228.elempack = top_blob->elempack;
    local_228.allocator = top_blob->allocator;
    uVar4 = top_blob->dims;
    uVar5 = top_blob->w;
    uVar6 = top_blob->h;
    uVar7 = top_blob->d;
    local_228.c = top_blob->c;
    local_228.cstep = top_blob->cstep;
    local_228.dims = uVar4;
    local_228.w = uVar5;
    local_228.h = uVar6;
    local_228.d = uVar7;
  }
  iVar172 = (iVar8 + -1) * iVar145 + local_16c + iVar172 + 1;
  local_178 = opt;
  local_120 = top_blob;
  Mat::create(&local_228,iVar172,iVar161 + (uVar9 - 1) * iVar152 + local_170 + 1,iVar142,
              (uVar149 / (ulong)(long)iVar173) * uVar162,uVar146,
              *(Allocator **)(&opt->lightmode + (long)pvVar168));
  iVar145 = local_228.w;
  afVar327 = _ps512_cephes_exp_p5;
  afVar326 = _ps512_cephes_exp_p4;
  afVar325 = _ps512_cephes_exp_p3;
  afVar324 = _ps512_cephes_exp_p2;
  afVar323 = _ps512_cephes_exp_p1;
  afVar322 = _ps512_cephes_exp_p0;
  afVar321 = _ps512_cephes_LOG2EF;
  afVar320 = _ps512_exp_lo;
  afVar319 = _ps512_exp_hi;
  afVar318 = _ps512_1;
  iVar152 = -100;
  if (((Allocator *)local_228.data == (Allocator *)0x0) ||
     ((long)local_228.c * local_228.cstep == 0)) goto LAB_00291354;
  local_1e0 = this->_vptr_Deconvolution_x86_avx512;
  p_Var13 = local_1e0[-3];
  uVar157 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
  local_1c8._0_8_ = p_Var13;
  uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
  local_1d4 = uVar10 * uVar157;
  if (local_178->use_sgemm_convolution == true) {
    piVar14 = bottom_blob->refcount;
    local_c8 = bottom_blob->data;
    uStack_c0 = SUB84(bottom_blob->refcount,0);
    uStack_bc = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    local_b8 = (undefined4)bottom_blob->elemsize;
    uStack_b4 = (undefined4)(bottom_blob->elemsize >> 0x20);
    local_b0 = bottom_blob->elempack;
    local_a8 = bottom_blob->allocator;
    uVar134 = bottom_blob->dims;
    uVar135 = bottom_blob->d;
    local_90 = bottom_blob->c;
    local_88 = bottom_blob->cstep;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    local_a0 = CONCAT44(bottom_blob->h * bottom_blob->w,uVar134);
    uStack_98 = CONCAT44(uVar135,1);
    local_d8 = 0;
    local_118 = (long *)0x0;
    uStack_110 = 0;
    iStack_10c = 0;
    local_108 = 0;
    uStack_100 = 0;
    uStack_e8 = 0;
    auStack_68 = SUB6448(*local_178,0x10);
    local_78 = SUB648(*local_178,0);
    pAStack_70 = local_228.allocator;
    uStack_104 = uStack_110;
    local_f8 = local_118;
    uStack_f0 = uStack_110;
    iStack_ec = iStack_10c;
    local_e0 = uStack_100;
    (*this->gemm->_vptr_Layer[7])(this->gemm,&local_c8,&local_118);
    iVar173 = (iVar172 * *(int *)(&this->field_0xe8 + (long)this->_vptr_Deconvolution_x86_avx512[-3]
                                 ) -
              *(int *)(&this->field_0xe4 + (long)this->_vptr_Deconvolution_x86_avx512[-3]) * iVar8)
              * uVar146;
    if (uVar146 < 8) {
      if (uVar146 == 1) {
        if (0 < iVar142) {
          uVar149 = CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize);
          lVar160 = (long)local_228.h * (long)local_228.w;
          local_248._0_8_ = 0;
          iVar145 = (int)((uVar149 * lVar160 + 0xf & 0xfffffffffffffff0) / uVar149);
          if (local_228.dims == 4) {
            iVar145 = (int)lVar160;
          }
          pp_Var21 = this->_vptr_Deconvolution_x86_avx512;
          uVar162 = 1;
          if (1 < iVar142) {
            uVar162 = uVar147 & 0xffffffff;
          }
          auVar341 = vpbroadcastq_avx512f();
          auVar342 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar343 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          pAVar158 = (Allocator *)local_228.data;
          do {
            p_Var13 = pp_Var21[-3];
            auVar181 = ZEXT816(0) << 0x40;
            if ((*(long *)(&this->field_0x1a8 + (long)p_Var13) != 0) &&
               ((long)*(int *)(&this->field_0x1e0 + (long)p_Var13) *
                *(long *)(&this->field_0x1e8 + (long)p_Var13) != 0)) {
              auVar181 = ZEXT416(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var13) +
                                          local_248._0_8_ * 4));
            }
            if (0 < iVar145 * local_228.d) {
              auVar344 = vbroadcastss_avx512f(auVar181);
              uVar147 = 0;
              do {
                auVar345 = vpbroadcastq_avx512f();
                auVar346 = vporq_avx512f(auVar345,auVar342);
                auVar345 = vporq_avx512f(auVar345,auVar343);
                uVar42 = vpcmpuq_avx512f(auVar345,auVar341,2);
                uVar43 = vpcmpuq_avx512f(auVar346,auVar341,2);
                bVar32 = (byte)uVar43;
                uVar178 = CONCAT11(bVar32,(byte)uVar42);
                puVar1 = (uint *)((long)&pAVar158->_vptr_Allocator + uVar147 * 4);
                bVar24 = (bool)((byte)uVar42 & 1);
                bVar25 = (bool)((byte)(uVar178 >> 1) & 1);
                bVar26 = (bool)((byte)(uVar178 >> 2) & 1);
                bVar27 = (bool)((byte)(uVar178 >> 3) & 1);
                bVar28 = (bool)((byte)(uVar178 >> 4) & 1);
                bVar29 = (bool)((byte)(uVar178 >> 5) & 1);
                bVar30 = (bool)((byte)(uVar178 >> 6) & 1);
                bVar31 = (bool)((byte)(uVar178 >> 7) & 1);
                bVar34 = (bool)(bVar32 >> 1 & 1);
                bVar35 = (bool)(bVar32 >> 2 & 1);
                bVar36 = (bool)(bVar32 >> 3 & 1);
                bVar37 = (bool)(bVar32 >> 4 & 1);
                bVar38 = (bool)(bVar32 >> 5 & 1);
                bVar39 = (bool)(bVar32 >> 6 & 1);
                *puVar1 = (uint)bVar24 * auVar344._0_4_ | (uint)!bVar24 * *puVar1;
                puVar1[1] = (uint)bVar25 * auVar344._4_4_ | (uint)!bVar25 * puVar1[1];
                puVar1[2] = (uint)bVar26 * auVar344._8_4_ | (uint)!bVar26 * puVar1[2];
                puVar1[3] = (uint)bVar27 * auVar344._12_4_ | (uint)!bVar27 * puVar1[3];
                puVar1[4] = (uint)bVar28 * auVar344._16_4_ | (uint)!bVar28 * puVar1[4];
                puVar1[5] = (uint)bVar29 * auVar344._20_4_ | (uint)!bVar29 * puVar1[5];
                puVar1[6] = (uint)bVar30 * auVar344._24_4_ | (uint)!bVar30 * puVar1[6];
                puVar1[7] = (uint)bVar31 * auVar344._28_4_ | (uint)!bVar31 * puVar1[7];
                puVar1[8] = (uint)(bVar32 & 1) * auVar344._32_4_ |
                            (uint)!(bool)(bVar32 & 1) * puVar1[8];
                puVar1[9] = (uint)bVar34 * auVar344._36_4_ | (uint)!bVar34 * puVar1[9];
                puVar1[10] = (uint)bVar35 * auVar344._40_4_ | (uint)!bVar35 * puVar1[10];
                puVar1[0xb] = (uint)bVar36 * auVar344._44_4_ | (uint)!bVar36 * puVar1[0xb];
                puVar1[0xc] = (uint)bVar37 * auVar344._48_4_ | (uint)!bVar37 * puVar1[0xc];
                puVar1[0xd] = (uint)bVar38 * auVar344._52_4_ | (uint)!bVar38 * puVar1[0xd];
                puVar1[0xe] = (uint)bVar39 * auVar344._56_4_ | (uint)!bVar39 * puVar1[0xe];
                puVar1[0xf] = (uint)(bVar32 >> 7) * auVar344._60_4_ |
                              (uint)!(bool)(bVar32 >> 7) * puVar1[0xf];
                uVar147 = uVar147 + 0x10;
              } while ((iVar145 * local_228.d + 0xfU & 0xfffffff0) != uVar147);
            }
            if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3])) {
              pfVar170 = (float *)(local_248._0_8_ *
                                   (long)local_1d4 *
                                   (long)iStack_ec * CONCAT44(uStack_104,local_108) +
                                  (long)local_118);
              iVar152 = 0;
              do {
                p_Var13 = pp_Var21[-3];
                if (0 < *(int *)(&this->field_0xd4 + (long)p_Var13)) {
                  iVar172 = 0;
                  do {
                    if (0 < (int)uVar9) {
                      pfVar171 = (float *)((long)(_func_int ***)local_228.data +
                                          (long)iVar172 *
                                          (long)*(int *)(&this->field_0xdc + (long)p_Var13) * 4 +
                                          (long)iVar152 *
                                          (long)*(int *)(&this->field_0xe0 + (long)p_Var13) *
                                          uVar149 * (long)local_228.w +
                                          local_228.cstep * uVar149 * local_248._0_8_);
                      uVar146 = 0;
                      do {
                        iVar161 = iVar8;
                        if (0 < iVar8) {
                          do {
                            *pfVar171 = *pfVar171 + *pfVar170;
                            pfVar171 = pfVar171 + *(int *)(&this->field_0xe4 + (long)pp_Var21[-3]);
                            pfVar170 = pfVar170 + 1;
                            iVar161 = iVar161 + -1;
                          } while (iVar161 != 0);
                        }
                        pfVar171 = pfVar171 + iVar173;
                        uVar146 = uVar146 + 1;
                      } while (uVar146 != uVar9);
                    }
                    iVar172 = iVar172 + 1;
                    p_Var13 = pp_Var21[-3];
                  } while (iVar172 < *(int *)(&this->field_0xd4 + (long)p_Var13));
                }
                iVar152 = iVar152 + 1;
              } while (iVar152 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3]));
            }
            local_248._0_8_ = local_248._0_8_ + 1;
            pAVar158 = (Allocator *)((long)&pAVar158->_vptr_Allocator + local_228.cstep * uVar149);
          } while (local_248._0_8_ != uVar162);
        }
      }
      else {
LAB_00290cf8:
        if ((uVar146 == 4) && (0 < iVar142)) {
          pp_Var21 = this->_vptr_Deconvolution_x86_avx512;
          lVar160 = (long)local_1d4;
          uVar149 = 0;
          do {
            pfVar170 = (float *)((long)iStack_ec * uVar149 * lVar160 *
                                 CONCAT44(uStack_104,local_108) + (long)local_118);
            lVar159 = (long)local_228.w;
            uVar162 = CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize);
            pAVar158 = (Allocator *)
                       ((long)(_func_int ***)local_228.data + local_228.cstep * uVar149 * uVar162);
            uVar155 = local_228.h * lVar159;
            uVar164 = (uVar162 * uVar155 + 0xf & 0xfffffffffffffff0) / uVar162;
            if (local_228.dims == 4) {
              uVar164 = uVar155;
            }
            p_Var13 = pp_Var21[-3];
            if ((*(long *)(&this->field_0x1a8 + (long)p_Var13) == 0) ||
               ((long)*(int *)(&this->field_0x1e0 + (long)p_Var13) *
                *(long *)(&this->field_0x1e8 + (long)p_Var13) == 0)) {
              uVar146 = local_228.d * (int)uVar164;
              if (0 < (int)uVar146) {
                memset(pAVar158,0,(ulong)uVar146 << 4);
              }
            }
            else {
              iVar145 = local_228.d * (int)uVar164;
              if (0 < iVar145) {
                auVar181 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x1a8 + (long)p_Var13) + uVar149 * 0x10);
                pAVar144 = pAVar158;
                do {
                  *(undefined1 (*) [16])pAVar144 = auVar181;
                  pAVar144 = pAVar144 + 2;
                  iVar145 = iVar145 + -1;
                } while (iVar145 != 0);
              }
            }
            if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3])) {
              iVar145 = 0;
              do {
                p_Var13 = pp_Var21[-3];
                if (0 < *(int *)(&this->field_0xd4 + (long)p_Var13)) {
                  iVar152 = 0;
                  do {
                    if (0 < (int)uVar9) {
                      pauVar156 = (undefined1 (*) [16])
                                  ((long)&pAVar158->_vptr_Allocator +
                                  (long)(*(int *)(&this->field_0xdc + (long)p_Var13) * iVar152 * 4)
                                  * 4 + (long)*(int *)(&this->field_0xe0 + (long)p_Var13) *
                                        (long)iVar145 * uVar162 * lVar159);
                      uVar146 = 0;
                      do {
                        iVar172 = iVar8;
                        if (0 < iVar8) {
                          do {
                            auVar358._0_4_ = *pfVar170 + *(float *)*pauVar156;
                            auVar358._4_4_ = pfVar170[1] + *(float *)(*pauVar156 + 4);
                            auVar358._8_4_ = pfVar170[2] + *(float *)(*pauVar156 + 8);
                            auVar358._12_4_ = pfVar170[3] + *(float *)(*pauVar156 + 0xc);
                            *pauVar156 = auVar358;
                            pauVar156 = pauVar156 + *(int *)(&this->field_0xe4 + (long)pp_Var21[-3])
                            ;
                            pfVar170 = pfVar170 + 4;
                            iVar172 = iVar172 + -1;
                          } while (iVar172 != 0);
                        }
                        pauVar156 = (undefined1 (*) [16])(*pauVar156 + (long)iVar173 * 4);
                        uVar146 = uVar146 + 1;
                      } while (uVar146 != uVar9);
                    }
                    iVar152 = iVar152 + 1;
                    p_Var13 = pp_Var21[-3];
                  } while (iVar152 < *(int *)(&this->field_0xd4 + (long)p_Var13));
                }
                iVar145 = iVar145 + 1;
              } while (iVar145 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3]));
            }
            uVar149 = uVar149 + 1;
          } while (uVar149 != (uVar147 & 0xffffffff));
        }
      }
    }
    else {
      if (uVar146 == 8) {
        if (0 < iVar142) {
          pp_Var21 = this->_vptr_Deconvolution_x86_avx512;
          lVar160 = (long)local_1d4;
          uVar149 = 0;
          do {
            pfVar170 = (float *)((long)iStack_ec * uVar149 * lVar160 *
                                 CONCAT44(uStack_104,local_108) + (long)local_118);
            lVar159 = (long)local_228.w;
            uVar162 = CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize);
            pAVar158 = (Allocator *)
                       ((long)(_func_int ***)local_228.data + local_228.cstep * uVar149 * uVar162);
            uVar155 = local_228.h * lVar159;
            uVar164 = (uVar162 * uVar155 + 0xf & 0xfffffffffffffff0) / uVar162;
            if (local_228.dims == 4) {
              uVar164 = uVar155;
            }
            p_Var13 = pp_Var21[-3];
            if ((*(long *)(&this->field_0x1a8 + (long)p_Var13) == 0) ||
               ((long)*(int *)(&this->field_0x1e0 + (long)p_Var13) *
                *(long *)(&this->field_0x1e8 + (long)p_Var13) == 0)) {
              uVar157 = local_228.d * (int)uVar164;
              if (0 < (int)uVar157) {
                memset(pAVar158,0,(ulong)uVar157 << 5);
              }
            }
            else {
              iVar145 = local_228.d * (int)uVar164;
              if (0 < iVar145) {
                auVar235 = *(undefined1 (*) [32])
                            (*(long *)(&this->field_0x1a8 + (long)p_Var13) + uVar149 * 0x20);
                pAVar144 = pAVar158;
                do {
                  *(undefined1 (*) [32])pAVar144 = auVar235;
                  pAVar144 = pAVar144 + 4;
                  iVar145 = iVar145 + -1;
                } while (iVar145 != 0);
              }
            }
            if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3])) {
              iVar145 = 0;
              do {
                p_Var13 = pp_Var21[-3];
                if (0 < *(int *)(&this->field_0xd4 + (long)p_Var13)) {
                  iVar152 = 0;
                  do {
                    if (0 < (int)uVar9) {
                      pauVar154 = (undefined1 (*) [32])
                                  ((long)&pAVar158->_vptr_Allocator +
                                  (long)(*(int *)(&this->field_0xdc + (long)p_Var13) * iVar152 * 8)
                                  * 4 + (long)*(int *)(&this->field_0xe0 + (long)p_Var13) *
                                        (long)iVar145 * uVar162 * lVar159);
                      uVar157 = 0;
                      do {
                        iVar172 = iVar8;
                        if (0 < iVar8) {
                          do {
                            auVar235._0_4_ = *pfVar170 + *(float *)*pauVar154;
                            auVar235._4_4_ = pfVar170[1] + *(float *)(*pauVar154 + 4);
                            auVar235._8_4_ = pfVar170[2] + *(float *)(*pauVar154 + 8);
                            auVar235._12_4_ = pfVar170[3] + *(float *)(*pauVar154 + 0xc);
                            auVar235._16_4_ = pfVar170[4] + *(float *)(*pauVar154 + 0x10);
                            auVar235._20_4_ = pfVar170[5] + *(float *)(*pauVar154 + 0x14);
                            auVar235._24_4_ = pfVar170[6] + *(float *)(*pauVar154 + 0x18);
                            auVar235._28_4_ = pfVar170[7] + *(float *)(*pauVar154 + 0x1c);
                            *pauVar154 = auVar235;
                            pauVar154 = pauVar154 + *(int *)(&this->field_0xe4 + (long)pp_Var21[-3])
                            ;
                            pfVar170 = pfVar170 + 8;
                            iVar172 = iVar172 + -1;
                          } while (iVar172 != 0);
                        }
                        pauVar154 = (undefined1 (*) [32])(*pauVar154 + (long)iVar173 * 4);
                        uVar157 = uVar157 + 1;
                      } while (uVar157 != uVar9);
                    }
                    iVar152 = iVar152 + 1;
                    p_Var13 = pp_Var21[-3];
                  } while (iVar152 < *(int *)(&this->field_0xd4 + (long)p_Var13));
                }
                iVar145 = iVar145 + 1;
              } while (iVar145 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3]));
            }
            uVar149 = uVar149 + 1;
          } while (uVar149 != (uVar147 & 0xffffffff));
        }
        goto LAB_00290cf8;
      }
      if ((uVar146 == 0x10) && (0 < iVar142)) {
        pp_Var21 = this->_vptr_Deconvolution_x86_avx512;
        lVar160 = (long)local_1d4;
        uVar149 = 0;
        do {
          pauVar169 = (undefined1 (*) [64])
                      ((long)iStack_ec * uVar149 * lVar160 * CONCAT44(uStack_104,local_108) +
                      (long)local_118);
          lVar159 = (long)local_228.w;
          uVar162 = CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize);
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data + local_228.cstep * uVar149 * uVar162);
          uVar155 = local_228.h * lVar159;
          uVar164 = (uVar162 * uVar155 + 0xf & 0xfffffffffffffff0) / uVar162;
          if (local_228.dims == 4) {
            uVar164 = uVar155;
          }
          p_Var13 = pp_Var21[-3];
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var13) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var13) *
              *(long *)(&this->field_0x1e8 + (long)p_Var13) == 0)) {
            uVar146 = local_228.d * (int)uVar164;
            if (0 < (int)uVar146) {
              memset(pAVar158,0,(ulong)uVar146 << 6);
            }
          }
          else {
            iVar145 = local_228.d * (int)uVar164;
            if (0 < iVar145) {
              auVar341 = *(undefined1 (*) [64])
                          (*(long *)(&this->field_0x1a8 + (long)p_Var13) + uVar149 * 0x40);
              pAVar144 = pAVar158;
              do {
                *(undefined1 (*) [64])pAVar144 = auVar341;
                pAVar144 = pAVar144 + 8;
                iVar145 = iVar145 + -1;
              } while (iVar145 != 0);
            }
          }
          if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3])) {
            iVar145 = 0;
            do {
              p_Var13 = pp_Var21[-3];
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var13)) {
                iVar152 = 0;
                do {
                  if (0 < (int)uVar9) {
                    pauVar153 = (undefined1 (*) [64])
                                ((long)&pAVar158->_vptr_Allocator +
                                (long)(*(int *)(&this->field_0xdc + (long)p_Var13) * iVar152 * 0x10)
                                * 4 + (long)*(int *)(&this->field_0xe0 + (long)p_Var13) *
                                      (long)iVar145 * uVar162 * lVar159);
                    uVar146 = 0;
                    do {
                      iVar172 = iVar8;
                      if (0 < iVar8) {
                        do {
                          auVar341 = vaddps_avx512f(*pauVar169,*pauVar153);
                          *pauVar153 = auVar341;
                          pauVar153 = pauVar153 + *(int *)(&this->field_0xe4 + (long)pp_Var21[-3]);
                          pauVar169 = pauVar169 + 1;
                          iVar172 = iVar172 + -1;
                        } while (iVar172 != 0);
                      }
                      pauVar153 = (undefined1 (*) [64])(*pauVar153 + (long)iVar173 * 4);
                      uVar146 = uVar146 + 1;
                    } while (uVar146 != uVar9);
                  }
                  iVar152 = iVar152 + 1;
                  p_Var13 = pp_Var21[-3];
                } while (iVar152 < *(int *)(&this->field_0xd4 + (long)p_Var13));
              }
              iVar145 = iVar145 + 1;
            } while (iVar145 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3]));
          }
          uVar149 = uVar149 + 1;
        } while (uVar149 != (uVar147 & 0xffffffff));
      }
    }
    pLVar22 = this->activation;
    if (pLVar22 != (Layer *)0x0) {
      (*pLVar22->_vptr_Layer[9])(pLVar22,&local_228,local_178);
    }
    piVar14 = (int *)CONCAT44(iStack_10c,uStack_110);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_f8 == (long *)0x0) {
          if (local_118 != (long *)0x0) {
            free(local_118);
          }
        }
        else {
          (**(code **)(*local_f8 + 0x18))();
        }
      }
    }
    local_d8 = 0;
    local_118 = (long *)0x0;
    uStack_110 = 0;
    iStack_10c = 0;
    local_108 = 0;
    uStack_104 = 0;
    uStack_100 = 0;
    uStack_f0 = 0;
    iStack_ec = 0;
    uStack_e8 = 0;
    local_e0 = 0;
    piVar14 = (int *)CONCAT44(uStack_bc,uStack_c0);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_a8 == (Allocator *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (*local_a8->_vptr_Allocator[3])();
        }
      }
    }
    local_88 = 0;
    local_c8 = (void *)0x0;
    uStack_c0 = 0;
    uStack_bc = 0;
    local_b8 = 0;
    uStack_b4 = 0;
    local_b0 = 0;
    local_a0 = 0;
    uStack_98 = 0;
    local_90 = 0;
  }
  else {
    if (((iVar173 == 0x10) && (uVar146 == 0x10)) && (local_1d0 = (long)local_228.c, 0 < local_1d0))
    {
      iVar8 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      uVar11 = *(undefined4 *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      auVar341 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar342 = vxorps_avx512dq(auVar341,(undefined1  [64])_ps512_cephes_log_q2);
      auVar343 = vxorps_avx512dq(auVar341,(undefined1  [64])_ps512_cephes_log_q1);
      auVar344 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_168._0_64_ = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar341);
      local_2f8 = 0;
      auVar181 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar181);
      auVar341 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        if (0 < local_228.h) {
          iVar142 = bottom_blob->w;
          iVar175 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar9 = bottom_blob->c;
          iVar166 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar174 = (1 - uVar157) * iVar8;
              do {
                if (lVar160 == 0) {
                  auVar345 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar345 = *(undefined1 (*) [64])(lVar160 + local_2f8 * 0x40);
                }
                if (0 < (int)uVar9) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar10) {
                      pvVar151 = (void *)(bottom_blob->cstep * bottom_blob->elemsize * uVar149 +
                                         (long)bottom_blob->data);
                      uVar162 = 0;
                      pvVar168 = (void *)0x0;
                      do {
                        iVar138 = (((int)pvVar168 - uVar10) + 1) * iVar152 + iVar166;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar161, iVar138 % iVar161 == 0)
                            ) && ((0 < (int)uVar157 && (iVar139 < iVar175)))) {
                          lVar159 = (long)iVar139 * (long)bottom_blob->w * bottom_blob->elemsize;
                          uVar147 = uVar162;
                          uVar164 = (ulong)uVar157;
                          iVar138 = iVar174;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar139 = iVar138 / iVar172, iVar138 % iVar172 == 0)) &&
                               (iVar139 < iVar142)) {
                              lVar143 = (long)(iVar139 << 4);
                              auVar346 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159)));
                              auVar287 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 8)));
                              auVar288 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0xc)));
                              auVar289 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x10)))
                              ;
                              auVar290 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x14)))
                              ;
                              in_ZMM20 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x18)))
                              ;
                              in_ZMM21 = (float  [16])
                                         vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x1c)))
                              ;
                              auVar291 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x20)))
                              ;
                              auVar292 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x24)))
                              ;
                              auVar293 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x28)))
                              ;
                              auVar294 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x2c)))
                              ;
                              auVar295 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x30)))
                              ;
                              auVar296 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x34)))
                              ;
                              auVar297 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x38)))
                              ;
                              auVar298 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar151 +
                                                                     lVar143 * 4 + lVar159 + 0x3c)))
                              ;
                              uVar155 = uVar147 & 0xffffffff;
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar346,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4));
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar287,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x40))
                              ;
                              auVar345 = vfmadd231ps_avx512f(auVar345,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x80))
                              ;
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar288,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0xc0))
                              ;
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar289,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x100)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar290,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x140)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,in_ZMM20,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x180)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,(undefined1  [64])in_ZMM21,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x1c0)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar291,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x200)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar292,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x240)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar293,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x280)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar294,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x2c0)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar295,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x300)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar296,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x340)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar297,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x380)
                                                            );
                              auVar345 = vfmadd231ps_avx512f(auVar345,auVar298,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar155 * 4 + 0x3c0)
                                                            );
                            }
                            uVar147 = uVar147 + 0x100;
                            iVar138 = iVar138 + iVar8;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        pvVar168 = (void *)((long)pvVar168 + 1);
                        uVar162 = uVar162 + (ulong)uVar157 * 0x100;
                      } while (pvVar168 != (void *)(ulong)uVar10);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar157 * uVar10 * 0x100) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar9);
                }
                switch(uVar11) {
                case 1:
                  auVar345 = vmaxps_avx512f(auVar345,in_ZMM29);
                  break;
                case 2:
                  uVar149 = vcmpps_avx512f(auVar345,in_ZMM29,1);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar294._4_4_ = uVar2;
                  auVar294._0_4_ = uVar2;
                  auVar294._8_4_ = uVar2;
                  auVar294._12_4_ = uVar2;
                  auVar294._16_4_ = uVar2;
                  auVar294._20_4_ = uVar2;
                  auVar294._24_4_ = uVar2;
                  auVar294._28_4_ = uVar2;
                  auVar294._32_4_ = uVar2;
                  auVar294._36_4_ = uVar2;
                  auVar294._40_4_ = uVar2;
                  auVar294._44_4_ = uVar2;
                  auVar294._48_4_ = uVar2;
                  auVar294._52_4_ = uVar2;
                  auVar294._56_4_ = uVar2;
                  auVar294._60_4_ = uVar2;
                  auVar346 = vmulps_avx512f(auVar345,auVar294);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar295._0_4_ = (uint)bVar24 * auVar346._0_4_ | (uint)!bVar24 * auVar345._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar295._4_4_ = (uint)bVar24 * auVar346._4_4_ | (uint)!bVar24 * auVar345._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar295._8_4_ = (uint)bVar24 * auVar346._8_4_ | (uint)!bVar24 * auVar345._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar295._12_4_ = (uint)bVar24 * auVar346._12_4_ | (uint)!bVar24 * auVar345._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar295._16_4_ = (uint)bVar24 * auVar346._16_4_ | (uint)!bVar24 * auVar345._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar295._20_4_ = (uint)bVar24 * auVar346._20_4_ | (uint)!bVar24 * auVar345._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar295._24_4_ = (uint)bVar24 * auVar346._24_4_ | (uint)!bVar24 * auVar345._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar295._28_4_ = (uint)bVar24 * auVar346._28_4_ | (uint)!bVar24 * auVar345._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar295._32_4_ = (uint)bVar24 * auVar346._32_4_ | (uint)!bVar24 * auVar345._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar295._36_4_ = (uint)bVar24 * auVar346._36_4_ | (uint)!bVar24 * auVar345._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar295._40_4_ = (uint)bVar24 * auVar346._40_4_ | (uint)!bVar24 * auVar345._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar295._44_4_ = (uint)bVar24 * auVar346._44_4_ | (uint)!bVar24 * auVar345._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar295._48_4_ = (uint)bVar24 * auVar346._48_4_ | (uint)!bVar24 * auVar345._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar295._52_4_ = (uint)bVar24 * auVar346._52_4_ | (uint)!bVar24 * auVar345._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar295._56_4_ = (uint)bVar24 * auVar346._56_4_ | (uint)!bVar24 * auVar345._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar295._60_4_ = (uint)bVar24 * auVar346._60_4_ | (uint)!bVar24 * auVar345._60_4_
                  ;
                  auVar345 = auVar295;
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar293._4_4_ = uVar2;
                  auVar293._0_4_ = uVar2;
                  auVar293._8_4_ = uVar2;
                  auVar293._12_4_ = uVar2;
                  auVar293._16_4_ = uVar2;
                  auVar293._20_4_ = uVar2;
                  auVar293._24_4_ = uVar2;
                  auVar293._28_4_ = uVar2;
                  auVar293._32_4_ = uVar2;
                  auVar293._36_4_ = uVar2;
                  auVar293._40_4_ = uVar2;
                  auVar293._44_4_ = uVar2;
                  auVar293._48_4_ = uVar2;
                  auVar293._52_4_ = uVar2;
                  auVar293._56_4_ = uVar2;
                  auVar293._60_4_ = uVar2;
                  auVar346 = vmaxps_avx512f(auVar345,auVar293);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar345._4_4_ = uVar2;
                  auVar345._0_4_ = uVar2;
                  auVar345._8_4_ = uVar2;
                  auVar345._12_4_ = uVar2;
                  auVar345._16_4_ = uVar2;
                  auVar345._20_4_ = uVar2;
                  auVar345._24_4_ = uVar2;
                  auVar345._28_4_ = uVar2;
                  auVar345._32_4_ = uVar2;
                  auVar345._36_4_ = uVar2;
                  auVar345._40_4_ = uVar2;
                  auVar345._44_4_ = uVar2;
                  auVar345._48_4_ = uVar2;
                  auVar345._52_4_ = uVar2;
                  auVar345._56_4_ = uVar2;
                  auVar345._60_4_ = uVar2;
                  auVar345 = vminps_avx512f(auVar346,auVar345);
                  break;
                case 4:
                  auVar288._8_4_ = 0x80000000;
                  auVar288._0_8_ = 0x8000000080000000;
                  auVar288._12_4_ = 0x80000000;
                  auVar288._16_4_ = 0x80000000;
                  auVar288._20_4_ = 0x80000000;
                  auVar288._24_4_ = 0x80000000;
                  auVar288._28_4_ = 0x80000000;
                  auVar288._32_4_ = 0x80000000;
                  auVar288._36_4_ = 0x80000000;
                  auVar288._40_4_ = 0x80000000;
                  auVar288._44_4_ = 0x80000000;
                  auVar288._48_4_ = 0x80000000;
                  auVar288._52_4_ = 0x80000000;
                  auVar288._56_4_ = 0x80000000;
                  auVar288._60_4_ = 0x80000000;
                  auVar345 = vxorps_avx512dq(auVar345,auVar288);
                  auVar345 = vminps_avx512f(auVar345,(undefined1  [64])afVar319);
                  auVar345 = vmaxps_avx512f(auVar345,(undefined1  [64])afVar320);
                  auVar346 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar345,
                                                 (undefined1  [64])afVar327);
                  auVar287 = vrndscaleps_avx512f(auVar346,1);
                  uVar149 = vcmpps_avx512f(auVar346,auVar287,1);
                  auVar346 = vsubps_avx512f(auVar287,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar292._0_4_ = (uint)bVar24 * auVar346._0_4_ | (uint)!bVar24 * auVar287._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar292._4_4_ = (uint)bVar24 * auVar346._4_4_ | (uint)!bVar24 * auVar287._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar292._8_4_ = (uint)bVar24 * auVar346._8_4_ | (uint)!bVar24 * auVar287._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar292._12_4_ = (uint)bVar24 * auVar346._12_4_ | (uint)!bVar24 * auVar287._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar292._16_4_ = (uint)bVar24 * auVar346._16_4_ | (uint)!bVar24 * auVar287._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar292._20_4_ = (uint)bVar24 * auVar346._20_4_ | (uint)!bVar24 * auVar287._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar292._24_4_ = (uint)bVar24 * auVar346._24_4_ | (uint)!bVar24 * auVar287._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar292._28_4_ = (uint)bVar24 * auVar346._28_4_ | (uint)!bVar24 * auVar287._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar292._32_4_ = (uint)bVar24 * auVar346._32_4_ | (uint)!bVar24 * auVar287._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar292._36_4_ = (uint)bVar24 * auVar346._36_4_ | (uint)!bVar24 * auVar287._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar292._40_4_ = (uint)bVar24 * auVar346._40_4_ | (uint)!bVar24 * auVar287._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar292._44_4_ = (uint)bVar24 * auVar346._44_4_ | (uint)!bVar24 * auVar287._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar292._48_4_ = (uint)bVar24 * auVar346._48_4_ | (uint)!bVar24 * auVar287._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar292._52_4_ = (uint)bVar24 * auVar346._52_4_ | (uint)!bVar24 * auVar287._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar292._56_4_ = (uint)bVar24 * auVar346._56_4_ | (uint)!bVar24 * auVar287._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar292._60_4_ = (uint)bVar24 * auVar346._60_4_ | (uint)!bVar24 * auVar287._60_4_
                  ;
                  auVar345 = vfmadd231ps_avx512f(auVar345,auVar292,auVar342);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar345,auVar292,auVar343);
                  auVar345 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar346 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar346 = vfmadd213ps_avx512f(auVar346,in_ZMM16,(undefined1  [64])afVar324);
                  auVar346 = vfmadd213ps_avx512f(auVar346,in_ZMM16,(undefined1  [64])afVar325);
                  auVar346 = vfmadd213ps_avx512f(auVar346,in_ZMM16,(undefined1  [64])afVar326);
                  auVar346 = vfmadd213ps_avx512f(auVar346,in_ZMM16,(undefined1  [64])afVar327);
                  auVar345 = vfmadd213ps_avx512f(auVar346,auVar345,in_ZMM16);
                  auVar345 = vaddps_avx512f(auVar345,(undefined1  [64])afVar318);
                  auVar346 = vcvttps2dq_avx512f(auVar292);
                  auVar346 = vpaddd_avx512f(auVar346,auVar344);
                  auVar346 = vpslld_avx512f(auVar346,0x17);
                  auVar345 = vfmadd213ps_avx512f(auVar346,auVar345,auVar341);
                  auVar346 = vrcp14ps_avx512f(auVar345);
                  auVar345 = vfmsub213ps_avx512f(auVar345,auVar346,auVar341);
                  auVar345 = vfnmadd132ps_avx512vl(auVar345,auVar346,auVar346);
                  break;
                case 5:
                  auVar346 = vminps_avx512f(auVar345,(undefined1  [64])afVar319);
                  auVar346 = vmaxps_avx512f(auVar346,(undefined1  [64])afVar320);
                  auVar287 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar346,
                                                 (undefined1  [64])afVar327);
                  auVar288 = vrndscaleps_avx512f(auVar287,1);
                  uVar149 = vcmpps_avx512f(auVar287,auVar288,1);
                  auVar289 = vsubps_avx512f(auVar288,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar287._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar288._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar287._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar288._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar287._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar288._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar287._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar288._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar287._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar288._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar287._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar288._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar287._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar288._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar287._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar288._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar287._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar288._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar287._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar288._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar287._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar288._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar287._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar288._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar287._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar288._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar287._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar288._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar287._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar288._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar287._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar288._60_4_
                  ;
                  auVar346 = vfmadd231ps_avx512f(auVar346,auVar287,auVar342);
                  auVar346 = vfmadd231ps_avx512f(auVar346,auVar287,auVar343);
                  auVar288 = vmulps_avx512f(auVar346,auVar346);
                  auVar289 = vfmadd213ps_avx512f(auVar346,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar346,(undefined1  [64])afVar324);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar346,(undefined1  [64])afVar325);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar346,(undefined1  [64])afVar326);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar346,(undefined1  [64])afVar327);
                  auVar346 = vfmadd213ps_avx512f(auVar289,auVar288,auVar346);
                  auVar346 = vaddps_avx512f(auVar346,(undefined1  [64])afVar318);
                  auVar287 = vcvttps2dq_avx512f(auVar287);
                  auVar287 = vpaddd_avx512f(auVar287,auVar344);
                  auVar287 = vpslld_avx512f(auVar287,0x17);
                  auVar346 = vfmadd213ps_avx512f(auVar287,auVar346,auVar341);
                  auVar287 = vmaxps_avx512f(auVar346,(undefined1  [64])_ps512_min_norm_pos);
                  auVar288 = vpsrld_avx512f(auVar287,0x17);
                  auVar287 = vpternlogd_avx512f(auVar287,(undefined1  [64])afVar327,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar149 = vcmpps_avx512f(auVar287,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar289 = vsubps_avx512f(auVar287,(undefined1  [64])afVar318);
                  auVar287 = vaddps_avx512f(auVar289,auVar287);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar290._0_4_ = (uint)bVar24 * auVar287._0_4_ | (uint)!bVar24 * auVar289._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar290._4_4_ = (uint)bVar24 * auVar287._4_4_ | (uint)!bVar24 * auVar289._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar290._8_4_ = (uint)bVar24 * auVar287._8_4_ | (uint)!bVar24 * auVar289._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar290._12_4_ = (uint)bVar24 * auVar287._12_4_ | (uint)!bVar24 * auVar289._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar290._16_4_ = (uint)bVar24 * auVar287._16_4_ | (uint)!bVar24 * auVar289._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar290._20_4_ = (uint)bVar24 * auVar287._20_4_ | (uint)!bVar24 * auVar289._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar290._24_4_ = (uint)bVar24 * auVar287._24_4_ | (uint)!bVar24 * auVar289._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar290._28_4_ = (uint)bVar24 * auVar287._28_4_ | (uint)!bVar24 * auVar289._28_4_
                  ;
                  bVar32 = (byte)(uVar149 >> 8);
                  bVar24 = (bool)(bVar32 & 1);
                  auVar290._32_4_ = (uint)bVar24 * auVar287._32_4_ | (uint)!bVar24 * auVar289._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar290._36_4_ = (uint)bVar24 * auVar287._36_4_ | (uint)!bVar24 * auVar289._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar290._40_4_ = (uint)bVar24 * auVar287._40_4_ | (uint)!bVar24 * auVar289._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar290._44_4_ = (uint)bVar24 * auVar287._44_4_ | (uint)!bVar24 * auVar289._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar290._48_4_ = (uint)bVar24 * auVar287._48_4_ | (uint)!bVar24 * auVar289._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar290._52_4_ = (uint)bVar24 * auVar287._52_4_ | (uint)!bVar24 * auVar289._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar290._56_4_ = (uint)bVar24 * auVar287._56_4_ | (uint)!bVar24 * auVar289._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar290._60_4_ = (uint)bVar24 * auVar287._60_4_ | (uint)!bVar24 * auVar289._60_4_
                  ;
                  auVar287 = vmulps_avx512f(auVar290,auVar290);
                  auVar289 = vfmadd132ps_avx512f(auVar290,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar290,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar290,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar290,
                                                 (undefined1  [64])_ps512_cephes_log_p4);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar290,
                                                 (undefined1  [64])_ps512_cephes_log_p5);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar290,
                                                 (undefined1  [64])_ps512_cephes_log_p6);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar290,
                                                 (undefined1  [64])_ps512_cephes_log_p7);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar290,
                                                 (undefined1  [64])_ps512_cephes_log_p8);
                  auVar291 = vmulps_avx512f(auVar287,auVar290);
                  auVar289 = vfmadd213ps_avx512f(auVar291,auVar289,auVar290);
                  uVar162 = vcmpps_avx512f(auVar346,in_ZMM29,2);
                  auVar346 = vpsubd_avx512f(auVar288,auVar344);
                  auVar346 = vcvtdq2ps_avx512f(auVar346);
                  auVar288 = vaddps_avx512f(auVar346,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar291._0_4_ = (uint)bVar24 * auVar346._0_4_ | (uint)!bVar24 * auVar288._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar291._4_4_ = (uint)bVar24 * auVar346._4_4_ | (uint)!bVar24 * auVar288._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar291._8_4_ = (uint)bVar24 * auVar346._8_4_ | (uint)!bVar24 * auVar288._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar291._12_4_ = (uint)bVar24 * auVar346._12_4_ | (uint)!bVar24 * auVar288._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar291._16_4_ = (uint)bVar24 * auVar346._16_4_ | (uint)!bVar24 * auVar288._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar291._20_4_ = (uint)bVar24 * auVar346._20_4_ | (uint)!bVar24 * auVar288._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar291._24_4_ = (uint)bVar24 * auVar346._24_4_ | (uint)!bVar24 * auVar288._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar291._28_4_ = (uint)bVar24 * auVar346._28_4_ | (uint)!bVar24 * auVar288._28_4_
                  ;
                  bVar24 = (bool)(bVar32 & 1);
                  auVar291._32_4_ = (uint)bVar24 * auVar346._32_4_ | (uint)!bVar24 * auVar288._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar291._36_4_ = (uint)bVar24 * auVar346._36_4_ | (uint)!bVar24 * auVar288._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar291._40_4_ = (uint)bVar24 * auVar346._40_4_ | (uint)!bVar24 * auVar288._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar291._44_4_ = (uint)bVar24 * auVar346._44_4_ | (uint)!bVar24 * auVar288._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar291._48_4_ = (uint)bVar24 * auVar346._48_4_ | (uint)!bVar24 * auVar288._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar291._52_4_ = (uint)bVar24 * auVar346._52_4_ | (uint)!bVar24 * auVar288._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar291._56_4_ = (uint)bVar24 * auVar346._56_4_ | (uint)!bVar24 * auVar288._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar291._60_4_ = (uint)bVar24 * auVar346._60_4_ | (uint)!bVar24 * auVar288._60_4_
                  ;
                  auVar346 = vfmadd231ps_avx512f(auVar289,auVar291,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar346 = vfmadd231ps_avx512f(auVar346,auVar287,local_168._0_64_);
                  auVar346 = vfmadd231ps_avx512f(auVar346,auVar291,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar287 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
                  auVar346 = vmulps_avx512f(auVar346,auVar287);
                  auVar288 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar289._0_4_ = (uint)bVar24 * auVar288._0_4_ | (uint)!bVar24 * auVar346._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar289._4_4_ = (uint)bVar24 * auVar288._4_4_ | (uint)!bVar24 * auVar346._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar289._8_4_ = (uint)bVar24 * auVar288._8_4_ | (uint)!bVar24 * auVar346._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar289._12_4_ = (uint)bVar24 * auVar288._12_4_ | (uint)!bVar24 * auVar346._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                  auVar289._16_4_ = (uint)bVar24 * auVar288._16_4_ | (uint)!bVar24 * auVar346._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                  auVar289._20_4_ = (uint)bVar24 * auVar288._20_4_ | (uint)!bVar24 * auVar346._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                  auVar289._24_4_ = (uint)bVar24 * auVar288._24_4_ | (uint)!bVar24 * auVar346._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 7) & 1);
                  auVar289._28_4_ = (uint)bVar24 * auVar288._28_4_ | (uint)!bVar24 * auVar346._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 8) & 1);
                  auVar289._32_4_ = (uint)bVar24 * auVar288._32_4_ | (uint)!bVar24 * auVar346._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 9) & 1);
                  auVar289._36_4_ = (uint)bVar24 * auVar288._36_4_ | (uint)!bVar24 * auVar346._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 10) & 1);
                  auVar289._40_4_ = (uint)bVar24 * auVar288._40_4_ | (uint)!bVar24 * auVar346._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xb) & 1);
                  auVar289._44_4_ = (uint)bVar24 * auVar288._44_4_ | (uint)!bVar24 * auVar346._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xc) & 1);
                  auVar289._48_4_ = (uint)bVar24 * auVar288._48_4_ | (uint)!bVar24 * auVar346._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xd) & 1);
                  auVar289._52_4_ = (uint)bVar24 * auVar288._52_4_ | (uint)!bVar24 * auVar346._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xe) & 1);
                  auVar289._56_4_ = (uint)bVar24 * auVar288._56_4_ | (uint)!bVar24 * auVar346._56_4_
                  ;
                  bVar24 = SUB81(uVar162 >> 0xf,0);
                  auVar289._60_4_ = (uint)bVar24 * auVar288._60_4_ | (uint)!bVar24 * auVar346._60_4_
                  ;
                  auVar346 = vminps_avx512f(auVar289,(undefined1  [64])afVar319);
                  auVar346 = vmaxps_avx512f(auVar346,(undefined1  [64])afVar320);
                  auVar288 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar346,
                                                 (undefined1  [64])afVar327);
                  auVar289 = vrndscaleps_avx512f(auVar288,1);
                  uVar149 = vcmpps_avx512f(auVar288,auVar289,1);
                  auVar288 = vsubps_avx512f(auVar289,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  in_ZMM16._0_4_ = (uint)bVar24 * auVar288._0_4_ | (uint)!bVar24 * auVar289._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar24 * auVar288._4_4_ | (uint)!bVar24 * auVar289._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar24 * auVar288._8_4_ | (uint)!bVar24 * auVar289._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar24 * auVar288._12_4_ | (uint)!bVar24 * auVar289._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar24 * auVar288._16_4_ | (uint)!bVar24 * auVar289._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar24 * auVar288._20_4_ | (uint)!bVar24 * auVar289._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar24 * auVar288._24_4_ | (uint)!bVar24 * auVar289._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar24 * auVar288._28_4_ | (uint)!bVar24 * auVar289._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar24 * auVar288._32_4_ | (uint)!bVar24 * auVar289._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar24 * auVar288._36_4_ | (uint)!bVar24 * auVar289._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar24 * auVar288._40_4_ | (uint)!bVar24 * auVar289._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar24 * auVar288._44_4_ | (uint)!bVar24 * auVar289._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar24 * auVar288._48_4_ | (uint)!bVar24 * auVar289._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar24 * auVar288._52_4_ | (uint)!bVar24 * auVar289._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar24 * auVar288._56_4_ | (uint)!bVar24 * auVar289._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar24 * auVar288._60_4_ | (uint)!bVar24 * auVar289._60_4_
                  ;
                  auVar346 = vfmadd231ps_avx512f(auVar346,in_ZMM16,auVar342);
                  auVar346 = vfmadd231ps_avx512f(auVar346,in_ZMM16,auVar343);
                  auVar288 = vmulps_avx512f(auVar346,auVar346);
                  auVar289 = vfmadd213ps_avx512f(auVar346,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar346,(undefined1  [64])afVar324);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar346,(undefined1  [64])afVar325);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar346,(undefined1  [64])afVar326);
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar346,(undefined1  [64])afVar327);
                  auVar346 = vfmadd213ps_avx512f(auVar289,auVar288,auVar346);
                  auVar346 = vaddps_avx512f(auVar346,(undefined1  [64])afVar318);
                  auVar288 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar288 = vpaddd_avx512f(auVar288,auVar344);
                  auVar288 = vpslld_avx512f(auVar288,0x17);
                  auVar346 = vfmadd213ps_avx512f(auVar288,auVar346,auVar341);
                  auVar288 = vrcp14ps_avx512f(auVar346);
                  auVar346 = vfmsub213ps_avx512f(auVar346,auVar288,auVar341);
                  auVar346 = vfnmadd132ps_avx512vl(auVar346,auVar288,auVar288);
                  auVar346 = vfnmsub213ps_avx512f(auVar346,auVar287,auVar341);
                  auVar345 = vmulps_avx512f(auVar346,auVar345);
                  break;
                case 6:
                  auVar287 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var13)));
                  uVar12 = (*(uint **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar346._4_4_ = uVar12;
                  auVar346._0_4_ = uVar12;
                  auVar346._8_4_ = uVar12;
                  auVar346._12_4_ = uVar12;
                  auVar346._16_4_ = uVar12;
                  auVar346._20_4_ = uVar12;
                  auVar346._24_4_ = uVar12;
                  auVar346._28_4_ = uVar12;
                  auVar346._32_4_ = uVar12;
                  auVar346._36_4_ = uVar12;
                  auVar346._40_4_ = uVar12;
                  auVar346._44_4_ = uVar12;
                  auVar346._48_4_ = uVar12;
                  auVar346._52_4_ = uVar12;
                  auVar346._56_4_ = uVar12;
                  auVar346._60_4_ = uVar12;
                  auVar346 = vfmadd213ps_avx512f(auVar287,auVar345,auVar346);
                  auVar346 = vmaxps_avx512f(auVar346,in_ZMM29);
                  auVar346 = vminps_avx512f(auVar346,auVar341);
                  auVar345 = vmulps_avx512f(auVar346,auVar345);
                }
                *(undefined1 (*) [64])pAVar158 = auVar345;
                pAVar158 = pAVar158 + 8;
                uVar163 = uVar163 + 1;
                iVar174 = iVar174 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar166 = iVar166 + 1;
          } while (iVar166 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
        in_ZMM13 = afVar325;
      } while (local_2f8 != local_1d0);
    }
    afVar331 = _ps512_cephes_log_p8;
    afVar330 = _ps512_cephes_log_p7;
    afVar329 = _ps512_cephes_log_p6;
    afVar328 = _ps512_cephes_log_p5;
    afVar487 = _ps512_cephes_log_p4;
    afVar327 = _ps512_cephes_exp_p5;
    afVar326 = _ps512_cephes_exp_p4;
    afVar325 = _ps512_cephes_exp_p3;
    afVar324 = _ps512_cephes_exp_p2;
    afVar323 = _ps512_cephes_exp_p1;
    afVar322 = _ps512_cephes_exp_p0;
    afVar321 = _ps512_cephes_LOG2EF;
    afVar320 = _ps512_exp_lo;
    afVar319 = _ps512_exp_hi;
    afVar318 = _ps512_1;
    if (((iVar173 == 8) && (uVar146 == 0x10)) && (0 < (long)local_228.c)) {
      local_1c8._0_8_ = local_1e0[-3];
      iVar8 = *(int *)(&this->field_0xdc + local_1c8._0_8_);
      iVar152 = *(int *)(&this->field_0xe0 + local_1c8._0_8_);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + local_1c8._0_8_);
      iVar161 = *(int *)(&this->field_0xe8 + local_1c8._0_8_);
      uVar11 = *(undefined4 *)(&this->field_0x114 + local_1c8._0_8_);
      lVar160 = *(long *)(&this->field_0x1a8 + local_1c8._0_8_);
      uVar9 = *(uint *)(&this->field_0xd4 + local_1c8._0_8_);
      uVar157 = *(uint *)(&this->field_0xd8 + local_1c8._0_8_);
      auVar341 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar342 = vxorps_avx512dq(auVar341,(undefined1  [64])_ps512_cephes_log_q2);
      auVar343 = vxorps_avx512dq(auVar341,(undefined1  [64])_ps512_cephes_log_q1);
      auVar344 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar345 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar341);
      local_2f8 = 0;
      auVar181 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar181);
      auVar346 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar287 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar142 = bottom_blob->w;
          iVar175 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar166 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar174 = (1 - uVar9) * iVar8;
              do {
                if (lVar160 == 0) {
                  auVar288 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar288 = *(undefined1 (*) [64])(lVar160 + local_2f8 * 0x40);
                }
                if (0 < (int)uVar10) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar150 = bottom_blob->data;
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      pvVar151 = (void *)0x0;
                      pvVar168 = (void *)0x0;
                      do {
                        iVar138 = (((int)pvVar168 - uVar157) + 1) * iVar152 + iVar166;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar161, iVar138 % iVar161 == 0)
                            ) && ((0 < (int)uVar9 && (iVar139 < iVar175)))) {
                          lVar159 = (long)iVar139 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                          uVar162 = (ulong)uVar9;
                          pvVar177 = pvVar151;
                          iVar138 = iVar174;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar139 = iVar138 / iVar172, iVar138 % iVar172 == 0)) &&
                               (iVar139 < iVar142)) {
                              lVar143 = (long)(iVar139 << 3);
                              auVar289 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159)));
                              auVar290 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 8)));
                              auVar291 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0xc)));
                              auVar292 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x10)))
                              ;
                              auVar293 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x14)))
                              ;
                              in_ZMM20 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x18)))
                              ;
                              in_ZMM21 = (float  [16])
                                         vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x1c)))
                              ;
                              uVar147 = (ulong)pvVar177 & 0xffffffff;
                              auVar288 = vfmadd231ps_avx512f(auVar288,auVar289,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar147 * 4));
                              auVar288 = vfmadd231ps_avx512f(auVar288,auVar290,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar147 * 4 + 0x40))
                              ;
                              auVar288 = vfmadd231ps_avx512f(auVar288,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar147 * 4 + 0x80))
                              ;
                              auVar288 = vfmadd231ps_avx512f(auVar288,auVar291,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar147 * 4 + 0xc0))
                              ;
                              auVar288 = vfmadd231ps_avx512f(auVar288,auVar292,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar147 * 4 + 0x100)
                                                            );
                              auVar288 = vfmadd231ps_avx512f(auVar288,auVar293,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar147 * 4 + 0x140)
                                                            );
                              auVar288 = vfmadd231ps_avx512f(auVar288,in_ZMM20,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar147 * 4 + 0x180)
                                                            );
                              auVar288 = vfmadd231ps_avx512f(auVar288,(undefined1  [64])in_ZMM21,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar147 * 4 + 0x1c0)
                                                            );
                            }
                            pvVar177 = (void *)((long)pvVar177 + 0x80);
                            iVar138 = iVar138 + iVar8;
                            uVar162 = uVar162 - 1;
                          } while (uVar162 != 0);
                        }
                        pvVar168 = (void *)((long)pvVar168 + 1);
                        pvVar151 = (void *)((long)pvVar151 + (ulong)uVar9 * 0x80);
                      } while (pvVar168 != (void *)(ulong)uVar157);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar9 * uVar157 * 0x80) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                switch(uVar11) {
                case 1:
                  auVar288 = vmaxps_avx512f(auVar288,in_ZMM29);
                  break;
                case 2:
                  uVar149 = vcmpps_avx512f(auVar288,in_ZMM29,1);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + local_1c8._0_8_);
                  auVar125._4_4_ = uVar2;
                  auVar125._0_4_ = uVar2;
                  auVar125._8_4_ = uVar2;
                  auVar125._12_4_ = uVar2;
                  auVar125._16_4_ = uVar2;
                  auVar125._20_4_ = uVar2;
                  auVar125._24_4_ = uVar2;
                  auVar125._28_4_ = uVar2;
                  auVar125._32_4_ = uVar2;
                  auVar125._36_4_ = uVar2;
                  auVar125._40_4_ = uVar2;
                  auVar125._44_4_ = uVar2;
                  auVar125._48_4_ = uVar2;
                  auVar125._52_4_ = uVar2;
                  auVar125._56_4_ = uVar2;
                  auVar125._60_4_ = uVar2;
                  auVar289 = vmulps_avx512f(auVar288,auVar125);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar302._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar288._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar302._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar288._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar302._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar288._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar302._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar288._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar302._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar288._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar302._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar288._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar302._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar288._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar302._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar288._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar302._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar288._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar302._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar288._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar302._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar288._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar302._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar288._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar302._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar288._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar302._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar288._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar302._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar288._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar302._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar288._60_4_
                  ;
                  auVar288 = auVar302;
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + local_1c8._0_8_);
                  auVar123._4_4_ = uVar2;
                  auVar123._0_4_ = uVar2;
                  auVar123._8_4_ = uVar2;
                  auVar123._12_4_ = uVar2;
                  auVar123._16_4_ = uVar2;
                  auVar123._20_4_ = uVar2;
                  auVar123._24_4_ = uVar2;
                  auVar123._28_4_ = uVar2;
                  auVar123._32_4_ = uVar2;
                  auVar123._36_4_ = uVar2;
                  auVar123._40_4_ = uVar2;
                  auVar123._44_4_ = uVar2;
                  auVar123._48_4_ = uVar2;
                  auVar123._52_4_ = uVar2;
                  auVar123._56_4_ = uVar2;
                  auVar123._60_4_ = uVar2;
                  auVar288 = vmaxps_avx512f(auVar288,auVar123);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + local_1c8._0_8_))[1];
                  auVar124._4_4_ = uVar2;
                  auVar124._0_4_ = uVar2;
                  auVar124._8_4_ = uVar2;
                  auVar124._12_4_ = uVar2;
                  auVar124._16_4_ = uVar2;
                  auVar124._20_4_ = uVar2;
                  auVar124._24_4_ = uVar2;
                  auVar124._28_4_ = uVar2;
                  auVar124._32_4_ = uVar2;
                  auVar124._36_4_ = uVar2;
                  auVar124._40_4_ = uVar2;
                  auVar124._44_4_ = uVar2;
                  auVar124._48_4_ = uVar2;
                  auVar124._52_4_ = uVar2;
                  auVar124._56_4_ = uVar2;
                  auVar124._60_4_ = uVar2;
                  auVar288 = vminps_avx512f(auVar288,auVar124);
                  break;
                case 4:
                  auVar288 = vxorps_avx512dq(auVar288,auVar341);
                  auVar288 = vminps_avx512f(auVar288,(undefined1  [64])afVar319);
                  auVar288 = vmaxps_avx512f(auVar288,(undefined1  [64])afVar320);
                  auVar289 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar288,
                                                 (undefined1  [64])afVar327);
                  auVar290 = vrndscaleps_avx512f(auVar289,1);
                  uVar149 = vcmpps_avx512f(auVar289,auVar290,1);
                  auVar289 = vsubps_avx512f(auVar290,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar301._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar290._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar301._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar290._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar301._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar290._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar301._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar290._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar301._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar290._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar301._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar290._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar301._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar290._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar301._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar290._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar301._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar290._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar301._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar290._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar301._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar290._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar301._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar290._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar301._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar290._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar301._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar290._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar301._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar290._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar301._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar290._60_4_
                  ;
                  auVar288 = vfmadd231ps_avx512f(auVar288,auVar301,auVar342);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar288,auVar301,auVar343);
                  auVar288 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar289 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar289 = vfmadd213ps_avx512f(auVar289,in_ZMM16,(undefined1  [64])afVar324);
                  auVar289 = vfmadd213ps_avx512f(auVar289,in_ZMM16,(undefined1  [64])afVar325);
                  auVar289 = vfmadd213ps_avx512f(auVar289,in_ZMM16,(undefined1  [64])afVar326);
                  auVar289 = vfmadd213ps_avx512f(auVar289,in_ZMM16,(undefined1  [64])afVar327);
                  auVar288 = vfmadd213ps_avx512f(auVar289,auVar288,in_ZMM16);
                  auVar288 = vaddps_avx512f(auVar288,(undefined1  [64])afVar318);
                  auVar289 = vcvttps2dq_avx512f(auVar301);
                  auVar289 = vpaddd_avx512f(auVar289,auVar344);
                  auVar289 = vpslld_avx512f(auVar289,0x17);
                  auVar288 = vfmadd213ps_avx512f(auVar289,auVar288,auVar346);
                  auVar289 = vrcp14ps_avx512f(auVar288);
                  auVar288 = vfmsub213ps_avx512f(auVar288,auVar289,auVar346);
                  auVar288 = vfnmadd132ps_avx512vl(auVar288,auVar289,auVar289);
                  break;
                case 5:
                  auVar289 = vminps_avx512f(auVar288,(undefined1  [64])afVar319);
                  auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar320);
                  auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar289,
                                                 (undefined1  [64])afVar327);
                  auVar291 = vrndscaleps_avx512f(auVar290,1);
                  uVar149 = vcmpps_avx512f(auVar290,auVar291,1);
                  auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar297._0_4_ = (uint)bVar24 * auVar290._0_4_ | (uint)!bVar24 * auVar291._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar297._4_4_ = (uint)bVar24 * auVar290._4_4_ | (uint)!bVar24 * auVar291._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar297._8_4_ = (uint)bVar24 * auVar290._8_4_ | (uint)!bVar24 * auVar291._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar297._12_4_ = (uint)bVar24 * auVar290._12_4_ | (uint)!bVar24 * auVar291._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar297._16_4_ = (uint)bVar24 * auVar290._16_4_ | (uint)!bVar24 * auVar291._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar297._20_4_ = (uint)bVar24 * auVar290._20_4_ | (uint)!bVar24 * auVar291._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar297._24_4_ = (uint)bVar24 * auVar290._24_4_ | (uint)!bVar24 * auVar291._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar297._28_4_ = (uint)bVar24 * auVar290._28_4_ | (uint)!bVar24 * auVar291._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar297._32_4_ = (uint)bVar24 * auVar290._32_4_ | (uint)!bVar24 * auVar291._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar297._36_4_ = (uint)bVar24 * auVar290._36_4_ | (uint)!bVar24 * auVar291._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar297._40_4_ = (uint)bVar24 * auVar290._40_4_ | (uint)!bVar24 * auVar291._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar297._44_4_ = (uint)bVar24 * auVar290._44_4_ | (uint)!bVar24 * auVar291._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar297._48_4_ = (uint)bVar24 * auVar290._48_4_ | (uint)!bVar24 * auVar291._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar297._52_4_ = (uint)bVar24 * auVar290._52_4_ | (uint)!bVar24 * auVar291._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar297._56_4_ = (uint)bVar24 * auVar290._56_4_ | (uint)!bVar24 * auVar291._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar297._60_4_ = (uint)bVar24 * auVar290._60_4_ | (uint)!bVar24 * auVar291._60_4_
                  ;
                  auVar289 = vfmadd231ps_avx512f(auVar289,auVar297,auVar342);
                  auVar289 = vfmadd231ps_avx512f(auVar289,auVar297,auVar343);
                  auVar290 = vmulps_avx512f(auVar289,auVar289);
                  auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar324);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar325);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar326);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar327);
                  auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
                  auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar318);
                  auVar290 = vcvttps2dq_avx512f(auVar297);
                  auVar290 = vpaddd_avx512f(auVar290,auVar344);
                  auVar290 = vpslld_avx512f(auVar290,0x17);
                  auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar346);
                  auVar290 = vmaxps_avx512f(auVar289,(undefined1  [64])_ps512_min_norm_pos);
                  auVar291 = vpsrld_avx512f(auVar290,0x17);
                  auVar290 = vpternlogd_avx512f(auVar290,(undefined1  [64])afVar327,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar149 = vcmpps_avx512f(auVar290,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar292 = vsubps_avx512f(auVar290,(undefined1  [64])afVar318);
                  auVar290 = vaddps_avx512f(auVar292,auVar290);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar298._0_4_ = (uint)bVar24 * auVar290._0_4_ | (uint)!bVar24 * auVar292._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar298._4_4_ = (uint)bVar24 * auVar290._4_4_ | (uint)!bVar24 * auVar292._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar298._8_4_ = (uint)bVar24 * auVar290._8_4_ | (uint)!bVar24 * auVar292._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar298._12_4_ = (uint)bVar24 * auVar290._12_4_ | (uint)!bVar24 * auVar292._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar298._16_4_ = (uint)bVar24 * auVar290._16_4_ | (uint)!bVar24 * auVar292._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar298._20_4_ = (uint)bVar24 * auVar290._20_4_ | (uint)!bVar24 * auVar292._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar298._24_4_ = (uint)bVar24 * auVar290._24_4_ | (uint)!bVar24 * auVar292._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar298._28_4_ = (uint)bVar24 * auVar290._28_4_ | (uint)!bVar24 * auVar292._28_4_
                  ;
                  bVar32 = (byte)(uVar149 >> 8);
                  bVar24 = (bool)(bVar32 & 1);
                  auVar298._32_4_ = (uint)bVar24 * auVar290._32_4_ | (uint)!bVar24 * auVar292._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar298._36_4_ = (uint)bVar24 * auVar290._36_4_ | (uint)!bVar24 * auVar292._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar298._40_4_ = (uint)bVar24 * auVar290._40_4_ | (uint)!bVar24 * auVar292._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar298._44_4_ = (uint)bVar24 * auVar290._44_4_ | (uint)!bVar24 * auVar292._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar298._48_4_ = (uint)bVar24 * auVar290._48_4_ | (uint)!bVar24 * auVar292._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar298._52_4_ = (uint)bVar24 * auVar290._52_4_ | (uint)!bVar24 * auVar292._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar298._56_4_ = (uint)bVar24 * auVar290._56_4_ | (uint)!bVar24 * auVar292._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar298._60_4_ = (uint)bVar24 * auVar290._60_4_ | (uint)!bVar24 * auVar292._60_4_
                  ;
                  auVar290 = vmulps_avx512f(auVar298,auVar298);
                  auVar292 = vfmadd132ps_avx512f(auVar298,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar298,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar298,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar298,(undefined1  [64])afVar487);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar298,(undefined1  [64])afVar328);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar298,(undefined1  [64])afVar329);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar298,(undefined1  [64])afVar330);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar298,(undefined1  [64])afVar331);
                  auVar293 = vmulps_avx512f(auVar290,auVar298);
                  auVar292 = vfmadd213ps_avx512f(auVar293,auVar292,auVar298);
                  uVar162 = vcmpps_avx512f(auVar289,in_ZMM29,2);
                  auVar289 = vpsubd_avx512f(auVar291,auVar344);
                  auVar289 = vcvtdq2ps_avx512f(auVar289);
                  auVar291 = vaddps_avx512f(auVar289,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar299._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar291._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar299._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar291._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar299._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar291._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar299._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar291._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar299._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar291._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar299._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar291._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar299._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar291._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar299._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar291._28_4_
                  ;
                  bVar24 = (bool)(bVar32 & 1);
                  auVar299._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar291._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar299._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar291._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar299._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar291._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar299._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar291._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar299._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar291._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar299._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar291._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar299._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar291._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar299._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar291._60_4_
                  ;
                  auVar289 = vfmadd231ps_avx512f(auVar292,auVar299,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar289 = vfmadd231ps_avx512f(auVar289,auVar345,auVar290);
                  auVar289 = vfmadd231ps_avx512f(auVar289,auVar299,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar289 = vmulps_avx512f(auVar289,auVar287);
                  auVar290 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar300._0_4_ = (uint)bVar24 * auVar290._0_4_ | (uint)!bVar24 * auVar289._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar300._4_4_ = (uint)bVar24 * auVar290._4_4_ | (uint)!bVar24 * auVar289._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar300._8_4_ = (uint)bVar24 * auVar290._8_4_ | (uint)!bVar24 * auVar289._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar300._12_4_ = (uint)bVar24 * auVar290._12_4_ | (uint)!bVar24 * auVar289._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                  auVar300._16_4_ = (uint)bVar24 * auVar290._16_4_ | (uint)!bVar24 * auVar289._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                  auVar300._20_4_ = (uint)bVar24 * auVar290._20_4_ | (uint)!bVar24 * auVar289._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                  auVar300._24_4_ = (uint)bVar24 * auVar290._24_4_ | (uint)!bVar24 * auVar289._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 7) & 1);
                  auVar300._28_4_ = (uint)bVar24 * auVar290._28_4_ | (uint)!bVar24 * auVar289._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 8) & 1);
                  auVar300._32_4_ = (uint)bVar24 * auVar290._32_4_ | (uint)!bVar24 * auVar289._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 9) & 1);
                  auVar300._36_4_ = (uint)bVar24 * auVar290._36_4_ | (uint)!bVar24 * auVar289._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 10) & 1);
                  auVar300._40_4_ = (uint)bVar24 * auVar290._40_4_ | (uint)!bVar24 * auVar289._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xb) & 1);
                  auVar300._44_4_ = (uint)bVar24 * auVar290._44_4_ | (uint)!bVar24 * auVar289._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xc) & 1);
                  auVar300._48_4_ = (uint)bVar24 * auVar290._48_4_ | (uint)!bVar24 * auVar289._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xd) & 1);
                  auVar300._52_4_ = (uint)bVar24 * auVar290._52_4_ | (uint)!bVar24 * auVar289._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xe) & 1);
                  auVar300._56_4_ = (uint)bVar24 * auVar290._56_4_ | (uint)!bVar24 * auVar289._56_4_
                  ;
                  bVar24 = SUB81(uVar162 >> 0xf,0);
                  auVar300._60_4_ = (uint)bVar24 * auVar290._60_4_ | (uint)!bVar24 * auVar289._60_4_
                  ;
                  auVar289 = vminps_avx512f(auVar300,(undefined1  [64])afVar319);
                  auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar320);
                  auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar289,
                                                 (undefined1  [64])afVar327);
                  auVar291 = vrndscaleps_avx512f(auVar290,1);
                  uVar149 = vcmpps_avx512f(auVar290,auVar291,1);
                  auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  in_ZMM16._0_4_ = (uint)bVar24 * auVar290._0_4_ | (uint)!bVar24 * auVar291._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar24 * auVar290._4_4_ | (uint)!bVar24 * auVar291._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar24 * auVar290._8_4_ | (uint)!bVar24 * auVar291._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar24 * auVar290._12_4_ | (uint)!bVar24 * auVar291._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar24 * auVar290._16_4_ | (uint)!bVar24 * auVar291._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar24 * auVar290._20_4_ | (uint)!bVar24 * auVar291._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar24 * auVar290._24_4_ | (uint)!bVar24 * auVar291._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar24 * auVar290._28_4_ | (uint)!bVar24 * auVar291._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar24 * auVar290._32_4_ | (uint)!bVar24 * auVar291._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar24 * auVar290._36_4_ | (uint)!bVar24 * auVar291._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar24 * auVar290._40_4_ | (uint)!bVar24 * auVar291._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar24 * auVar290._44_4_ | (uint)!bVar24 * auVar291._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar24 * auVar290._48_4_ | (uint)!bVar24 * auVar291._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar24 * auVar290._52_4_ | (uint)!bVar24 * auVar291._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar24 * auVar290._56_4_ | (uint)!bVar24 * auVar291._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar24 * auVar290._60_4_ | (uint)!bVar24 * auVar291._60_4_
                  ;
                  auVar289 = vfmadd231ps_avx512f(auVar289,in_ZMM16,auVar342);
                  auVar289 = vfmadd231ps_avx512f(auVar289,in_ZMM16,auVar343);
                  auVar290 = vmulps_avx512f(auVar289,auVar289);
                  auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar324);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar325);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar326);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar327);
                  auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
                  auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar318);
                  auVar290 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar290 = vpaddd_avx512f(auVar290,auVar344);
                  auVar290 = vpslld_avx512f(auVar290,0x17);
                  auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar346);
                  auVar290 = vrcp14ps_avx512f(auVar289);
                  auVar289 = vfmsub213ps_avx512f(auVar289,auVar290,auVar346);
                  auVar289 = vfnmadd132ps_avx512vl(auVar289,auVar290,auVar290);
                  auVar289 = vfnmsub213ps_avx512f(auVar289,auVar287,auVar346);
                  auVar288 = vmulps_avx512f(auVar289,auVar288);
                  break;
                case 6:
                  auVar289 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + local_1c8._0_8_)));
                  uVar12 = (*(uint **)(&this->field_0x118 + local_1c8._0_8_))[1];
                  auVar296._4_4_ = uVar12;
                  auVar296._0_4_ = uVar12;
                  auVar296._8_4_ = uVar12;
                  auVar296._12_4_ = uVar12;
                  auVar296._16_4_ = uVar12;
                  auVar296._20_4_ = uVar12;
                  auVar296._24_4_ = uVar12;
                  auVar296._28_4_ = uVar12;
                  auVar296._32_4_ = uVar12;
                  auVar296._36_4_ = uVar12;
                  auVar296._40_4_ = uVar12;
                  auVar296._44_4_ = uVar12;
                  auVar296._48_4_ = uVar12;
                  auVar296._52_4_ = uVar12;
                  auVar296._56_4_ = uVar12;
                  auVar296._60_4_ = uVar12;
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar288,auVar296);
                  auVar289 = vmaxps_avx512f(auVar289,in_ZMM29);
                  auVar289 = vminps_avx512f(auVar289,auVar346);
                  auVar288 = vmulps_avx512f(auVar289,auVar288);
                }
                *(undefined1 (*) [64])pAVar158 = auVar288;
                pAVar158 = pAVar158 + 8;
                uVar163 = uVar163 + 1;
                iVar174 = iVar174 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar166 = iVar166 + 1;
          } while (iVar166 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
        in_ZMM13 = afVar325;
      } while (local_2f8 != local_228.c);
    }
    if (((iVar173 == 0x10) && (uVar146 == 8)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar8 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      iVar142 = *(int *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      pvVar168 = (void *)(ulong)uVar157;
      local_2f8 = 0;
      auVar257._8_4_ = 0x42b0c0a5;
      auVar257._0_8_ = 0x42b0c0a542b0c0a5;
      auVar257._12_4_ = 0x42b0c0a5;
      auVar257._16_4_ = 0x42b0c0a5;
      auVar257._20_4_ = 0x42b0c0a5;
      auVar257._24_4_ = 0x42b0c0a5;
      auVar257._28_4_ = 0x42b0c0a5;
      auVar258._8_4_ = 0xc2b0c0a5;
      auVar258._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar258._12_4_ = 0xc2b0c0a5;
      auVar258._16_4_ = 0xc2b0c0a5;
      auVar258._20_4_ = 0xc2b0c0a5;
      auVar258._24_4_ = 0xc2b0c0a5;
      auVar258._28_4_ = 0xc2b0c0a5;
      auVar259._8_4_ = 0x3f000000;
      auVar259._0_8_ = 0x3f0000003f000000;
      auVar259._12_4_ = 0x3f000000;
      auVar259._16_4_ = 0x3f000000;
      auVar259._20_4_ = 0x3f000000;
      auVar259._24_4_ = 0x3f000000;
      auVar259._28_4_ = 0x3f000000;
      auVar260._8_4_ = 0x3fb8aa3b;
      auVar260._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar260._12_4_ = 0x3fb8aa3b;
      auVar260._16_4_ = 0x3fb8aa3b;
      auVar260._20_4_ = 0x3fb8aa3b;
      auVar260._24_4_ = 0x3fb8aa3b;
      auVar260._28_4_ = 0x3fb8aa3b;
      auVar261._8_4_ = 0x3f800000;
      auVar261._0_8_ = 0x3f8000003f800000;
      auVar261._12_4_ = 0x3f800000;
      auVar261._16_4_ = 0x3f800000;
      auVar261._20_4_ = 0x3f800000;
      auVar261._24_4_ = 0x3f800000;
      auVar261._28_4_ = 0x3f800000;
      auVar262._8_4_ = 0x3f318000;
      auVar262._0_8_ = 0x3f3180003f318000;
      auVar262._12_4_ = 0x3f318000;
      auVar262._16_4_ = 0x3f318000;
      auVar262._20_4_ = 0x3f318000;
      auVar262._24_4_ = 0x3f318000;
      auVar262._28_4_ = 0x3f318000;
      auVar235 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar263._8_4_ = 0x3ab743ce;
      auVar263._0_8_ = 0x3ab743ce3ab743ce;
      auVar263._12_4_ = 0x3ab743ce;
      auVar263._16_4_ = 0x3ab743ce;
      auVar263._20_4_ = 0x3ab743ce;
      auVar263._24_4_ = 0x3ab743ce;
      auVar263._28_4_ = 0x3ab743ce;
      auVar264._8_4_ = 0x3c088908;
      auVar264._0_8_ = 0x3c0889083c088908;
      auVar264._12_4_ = 0x3c088908;
      auVar264._16_4_ = 0x3c088908;
      auVar264._20_4_ = 0x3c088908;
      auVar264._24_4_ = 0x3c088908;
      auVar264._28_4_ = 0x3c088908;
      auVar265._8_4_ = 0x3d2aa9c1;
      auVar265._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar265._12_4_ = 0x3d2aa9c1;
      auVar265._16_4_ = 0x3d2aa9c1;
      auVar265._20_4_ = 0x3d2aa9c1;
      auVar265._24_4_ = 0x3d2aa9c1;
      auVar265._28_4_ = 0x3d2aa9c1;
      auVar266._8_4_ = 0x3e2aaaaa;
      auVar266._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar266._12_4_ = 0x3e2aaaaa;
      auVar266._16_4_ = 0x3e2aaaaa;
      auVar266._20_4_ = 0x3e2aaaaa;
      auVar266._24_4_ = 0x3e2aaaaa;
      auVar266._28_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT3264(auVar266);
      auVar267._8_4_ = 0x3f800000;
      auVar267._0_8_ = 0x3f8000003f800000;
      auVar267._12_4_ = 0x3f800000;
      auVar267._16_4_ = 0x3f800000;
      auVar267._20_4_ = 0x3f800000;
      auVar267._24_4_ = 0x3f800000;
      auVar267._28_4_ = 0x3f800000;
      auVar268._8_4_ = 0xb95e8083;
      auVar268._0_8_ = 0xb95e8083b95e8083;
      auVar268._12_4_ = 0xb95e8083;
      auVar268._16_4_ = 0xb95e8083;
      auVar268._20_4_ = 0xb95e8083;
      auVar268._24_4_ = 0xb95e8083;
      auVar268._28_4_ = 0xb95e8083;
      auVar236 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar175 = bottom_blob->w;
          iVar166 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar174 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar138 = (1 - uVar9) * iVar8;
              do {
                if (lVar160 == 0) {
                  auVar341 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar341 = ZEXT3264(*(undefined1 (*) [32])(lVar160 + local_2f8 * 0x20));
                }
                if (0 < (int)uVar10) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar150 = bottom_blob->data;
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      pvVar151 = (void *)0x0;
                      pvVar177 = (void *)0x0;
                      do {
                        iVar139 = (((int)pvVar177 - uVar157) + 1) * iVar152 + iVar174;
                        if (((-1 < iVar139) && (iVar140 = iVar139 / iVar161, iVar139 % iVar161 == 0)
                            ) && ((0 < (int)uVar9 && (iVar140 < iVar166)))) {
                          lVar159 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                          uVar162 = (ulong)uVar9;
                          pvVar167 = pvVar151;
                          iVar139 = iVar138;
                          do {
                            if (((-1 < iVar139) &&
                                (iVar140 = iVar139 / iVar172, iVar139 % iVar172 == 0)) &&
                               (iVar140 < iVar175)) {
                              lVar143 = (long)(iVar140 << 4);
                              uVar11 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159);
                              auVar453._4_4_ = uVar11;
                              auVar453._0_4_ = uVar11;
                              auVar453._8_4_ = uVar11;
                              auVar453._12_4_ = uVar11;
                              auVar453._16_4_ = uVar11;
                              auVar453._20_4_ = uVar11;
                              auVar453._24_4_ = uVar11;
                              auVar453._28_4_ = uVar11;
                              uVar11 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159 + 4);
                              auVar451._4_4_ = uVar11;
                              auVar451._0_4_ = uVar11;
                              auVar451._8_4_ = uVar11;
                              auVar451._12_4_ = uVar11;
                              auVar451._16_4_ = uVar11;
                              auVar451._20_4_ = uVar11;
                              auVar451._24_4_ = uVar11;
                              auVar451._28_4_ = uVar11;
                              auVar237 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 8)));
                              in_ZMM16 = ZEXT3264(auVar237);
                              auVar238 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0xc)));
                              auVar239 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x10)))
                              ;
                              auVar240 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x14)))
                              ;
                              in_ZMM20 = ZEXT3264(auVar240);
                              auVar241 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x18)))
                              ;
                              auVar242 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x1c)))
                              ;
                              auVar243 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x20)))
                              ;
                              auVar244 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x24)))
                              ;
                              auVar245 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x28)))
                              ;
                              auVar246 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x2c)))
                              ;
                              auVar247 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x30)))
                              ;
                              auVar248 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x34)))
                              ;
                              in_ZMM29 = ZEXT3264(auVar248);
                              auVar249 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x38)))
                              ;
                              auVar250 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x3c)))
                              ;
                              in_ZMM21 = (float  [16])ZEXT3264(auVar250);
                              uVar147 = (ulong)pvVar167 & 0xffffffff;
                              auVar181 = vfmadd231ps_fma(auVar341._0_32_,auVar453,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar176 + uVar147 * 4));
                              auVar181 = vfmadd231ps_fma(ZEXT1632(auVar181),auVar451,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar176 + uVar147 * 4 + 0x20));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar181),auVar237,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x40));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar238,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x60));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar239,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x80));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar240,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0xa0));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar241,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0xc0));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar242,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0xe0));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar243,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x100));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar244,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x120));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar245,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x140));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar246,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x160));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar247,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x180));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar248,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x1a0));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar249,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x1c0));
                              auVar237 = vfmadd231ps_avx512vl
                                                   (auVar237,auVar250,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar147 * 4 + 0x1e0));
                              auVar341 = ZEXT3264(auVar237);
                            }
                            pvVar167 = (void *)((long)pvVar167 + 0x80);
                            iVar139 = iVar139 + iVar8;
                            uVar162 = uVar162 - 1;
                          } while (uVar162 != 0);
                        }
                        pvVar177 = (void *)((long)pvVar177 + 1);
                        pvVar151 = (void *)((long)pvVar151 + (ulong)uVar9 * 0x80);
                      } while (pvVar177 != pvVar168);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar9 * uVar157 * 0x80) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                auVar237 = auVar341._0_32_;
                if (iVar142 - 1U < 6) {
                  auVar238 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar342._28_36_ = auVar341._28_36_;
                  switch(iVar142) {
                  case 1:
                    auVar237 = vmaxps_avx(auVar237,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar239 = vmaxps_avx(auVar237,auVar238);
                    auVar237 = vminps_avx(auVar237,auVar238);
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar92._4_4_ = uVar11;
                    auVar92._0_4_ = uVar11;
                    auVar92._8_4_ = uVar11;
                    auVar92._12_4_ = uVar11;
                    auVar92._16_4_ = uVar11;
                    auVar92._20_4_ = uVar11;
                    auVar92._24_4_ = uVar11;
                    auVar92._28_4_ = uVar11;
                    auVar237 = vfmadd132ps_avx512vl(auVar237,auVar239,auVar92);
                    break;
                  case 3:
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar90._4_4_ = uVar11;
                    auVar90._0_4_ = uVar11;
                    auVar90._8_4_ = uVar11;
                    auVar90._12_4_ = uVar11;
                    auVar90._16_4_ = uVar11;
                    auVar90._20_4_ = uVar11;
                    auVar90._24_4_ = uVar11;
                    auVar90._28_4_ = uVar11;
                    auVar237 = vmaxps_avx512vl(auVar237,auVar90);
                    uVar11 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                    auVar91._4_4_ = uVar11;
                    auVar91._0_4_ = uVar11;
                    auVar91._8_4_ = uVar11;
                    auVar91._12_4_ = uVar11;
                    auVar91._16_4_ = uVar11;
                    auVar91._20_4_ = uVar11;
                    auVar91._24_4_ = uVar11;
                    auVar91._28_4_ = uVar11;
                    auVar237 = vminps_avx512vl(auVar237,auVar91);
                    break;
                  case 4:
                    auVar88._8_4_ = 0x80000000;
                    auVar88._0_8_ = 0x8000000080000000;
                    auVar88._12_4_ = 0x80000000;
                    auVar88._16_4_ = 0x80000000;
                    auVar88._20_4_ = 0x80000000;
                    auVar88._24_4_ = 0x80000000;
                    auVar88._28_4_ = 0x80000000;
                    auVar237 = vxorps_avx512vl(auVar237,auVar88);
                    auVar237 = vminps_avx(auVar237,auVar257);
                    auVar237 = vmaxps_avx(auVar237,auVar258);
                    auVar181 = vfmadd231ps_fma(auVar259,auVar237,auVar260);
                    auVar238 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar238,1);
                    auVar239 = vsubps_avx512vl(auVar238,auVar261);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar256._0_4_ = (uint)bVar24 * auVar239._0_4_ | (uint)!bVar24 * auVar238._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar256._4_4_ = (uint)bVar24 * auVar239._4_4_ | (uint)!bVar24 * auVar238._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar256._8_4_ = (uint)bVar24 * auVar239._8_4_ | (uint)!bVar24 * auVar238._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar256._12_4_ =
                         (uint)bVar24 * auVar239._12_4_ | (uint)!bVar24 * auVar238._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar256._16_4_ =
                         (uint)bVar24 * auVar239._16_4_ | (uint)!bVar24 * auVar238._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar256._20_4_ =
                         (uint)bVar24 * auVar239._20_4_ | (uint)!bVar24 * auVar238._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar256._24_4_ =
                         (uint)bVar24 * auVar239._24_4_ | (uint)!bVar24 * auVar238._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar256._28_4_ =
                         (uint)bVar24 * auVar239._28_4_ | (uint)!bVar24 * auVar238._28_4_;
                    in_ZMM16 = ZEXT3264(auVar256);
                    auVar237 = vfmsub231ps_avx512vl(auVar237,auVar256,auVar262);
                    auVar89._8_4_ = 0x395e8083;
                    auVar89._0_8_ = 0x395e8083395e8083;
                    auVar89._12_4_ = 0x395e8083;
                    auVar89._16_4_ = 0x395e8083;
                    auVar89._20_4_ = 0x395e8083;
                    auVar89._24_4_ = 0x395e8083;
                    auVar89._28_4_ = 0x395e8083;
                    auVar237 = vfmsub231ps_avx512vl(auVar237,auVar256,auVar89);
                    auVar426._0_4_ = auVar237._0_4_ * auVar237._0_4_;
                    auVar426._4_4_ = auVar237._4_4_ * auVar237._4_4_;
                    auVar426._8_4_ = auVar237._8_4_ * auVar237._8_4_;
                    auVar426._12_4_ = auVar237._12_4_ * auVar237._12_4_;
                    auVar426._16_4_ = auVar237._16_4_ * auVar237._16_4_;
                    auVar426._20_4_ = auVar237._20_4_ * auVar237._20_4_;
                    auVar426._24_4_ = auVar237._24_4_ * auVar237._24_4_;
                    auVar426._28_4_ = 0;
                    auVar181 = vfmadd213ps_fma(auVar235,auVar237,auVar263);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar237,auVar264);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar237,auVar265);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar237,auVar266);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar237,auVar259);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar426,auVar237);
                    auVar427._0_4_ = auVar181._0_4_ + 1.0;
                    auVar427._4_4_ = auVar181._4_4_ + 1.0;
                    auVar427._8_4_ = auVar181._8_4_ + 1.0;
                    auVar427._12_4_ = auVar181._12_4_ + 1.0;
                    auVar427._16_4_ = 0x3f800000;
                    auVar427._20_4_ = 0x3f800000;
                    auVar427._24_4_ = 0x3f800000;
                    auVar427._28_4_ = 0x3f800000;
                    auVar237 = vcvttps2dq_avx512vl(auVar256);
                    auVar237 = vpslld_avx2(auVar237,0x17);
                    auVar237 = vpaddd_avx2(auVar267,auVar237);
                    auVar181 = vfmadd213ps_fma(auVar237,auVar427,auVar261);
                    auVar237 = vrcpps_avx(ZEXT1632(auVar181));
                    auVar181 = vfmsub213ps_fma(ZEXT1632(auVar181),auVar237,auVar261);
                    auVar181 = vfnmadd132ps_fma(ZEXT1632(auVar181),auVar237,auVar237);
                    auVar237 = ZEXT1632(auVar181);
                    break;
                  case 5:
                    auVar237 = vminps_avx(auVar237,auVar257);
                    auVar237 = vmaxps_avx(auVar237,auVar258);
                    auVar181 = vfmadd213ps_fma(auVar260,auVar237,auVar259);
                    auVar239 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar239,1);
                    auVar240 = vsubps_avx512vl(auVar239,auVar261);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar251._0_4_ = (uint)bVar24 * auVar240._0_4_ | (uint)!bVar24 * auVar239._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar251._4_4_ = (uint)bVar24 * auVar240._4_4_ | (uint)!bVar24 * auVar239._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar251._8_4_ = (uint)bVar24 * auVar240._8_4_ | (uint)!bVar24 * auVar239._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar251._12_4_ =
                         (uint)bVar24 * auVar240._12_4_ | (uint)!bVar24 * auVar239._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar251._16_4_ =
                         (uint)bVar24 * auVar240._16_4_ | (uint)!bVar24 * auVar239._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar251._20_4_ =
                         (uint)bVar24 * auVar240._20_4_ | (uint)!bVar24 * auVar239._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar251._24_4_ =
                         (uint)bVar24 * auVar240._24_4_ | (uint)!bVar24 * auVar239._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar251._28_4_ =
                         (uint)bVar24 * auVar240._28_4_ | (uint)!bVar24 * auVar239._28_4_;
                    auVar237 = vfmsub231ps_avx512vl(auVar237,auVar251,auVar262);
                    auVar237 = vfnmsub231ps_avx512vl(auVar237,auVar251,auVar268);
                    auVar452._0_4_ = auVar237._0_4_ * auVar237._0_4_;
                    auVar452._4_4_ = auVar237._4_4_ * auVar237._4_4_;
                    auVar452._8_4_ = auVar237._8_4_ * auVar237._8_4_;
                    auVar452._12_4_ = auVar237._12_4_ * auVar237._12_4_;
                    auVar452._16_4_ = auVar237._16_4_ * auVar237._16_4_;
                    auVar452._20_4_ = auVar237._20_4_ * auVar237._20_4_;
                    auVar452._24_4_ = auVar237._24_4_ * auVar237._24_4_;
                    auVar452._28_4_ = 0;
                    auVar239 = vfmadd213ps_avx512vl(auVar235,auVar237,auVar263);
                    auVar239 = vfmadd213ps_avx512vl(auVar239,auVar237,auVar264);
                    auVar239 = vfmadd213ps_avx512vl(auVar239,auVar237,auVar265);
                    auVar239 = vfmadd213ps_avx512vl(auVar239,auVar237,auVar266);
                    auVar239 = vfmadd213ps_avx512vl(auVar239,auVar237,auVar259);
                    auVar237 = vfmadd213ps_avx512vl(auVar239,auVar452,auVar237);
                    auVar239 = vaddps_avx512vl(auVar237,auVar261);
                    auVar237 = vcvttps2dq_avx512vl(auVar251);
                    auVar237 = vpslld_avx2(auVar237,0x17);
                    auVar237 = vpaddd_avx2(auVar237,auVar267);
                    auVar181 = vfmadd213ps_fma(auVar237,auVar239,auVar261);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar238,2);
                    auVar237._8_4_ = 0x800000;
                    auVar237._0_8_ = 0x80000000800000;
                    auVar237._12_4_ = 0x800000;
                    auVar237._16_4_ = 0x800000;
                    auVar237._20_4_ = 0x800000;
                    auVar237._24_4_ = 0x800000;
                    auVar237._28_4_ = 0x800000;
                    auVar237 = vmaxps_avx512vl(ZEXT1632(auVar181),auVar237);
                    auVar453 = vpsrld_avx2(auVar237,0x17);
                    auVar239 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar238._8_4_ = 0x3f000000;
                    auVar238._0_8_ = 0x3f0000003f000000;
                    auVar238._12_4_ = 0x3f000000;
                    auVar238._16_4_ = 0x3f000000;
                    auVar238._20_4_ = 0x3f000000;
                    auVar238._24_4_ = 0x3f000000;
                    auVar238._28_4_ = 0x3f000000;
                    auVar237 = vpternlogd_avx512vl(auVar237,auVar239,auVar238,0xea);
                    auVar241._8_4_ = 0x3f3504f3;
                    auVar241._0_8_ = 0x3f3504f33f3504f3;
                    auVar241._12_4_ = 0x3f3504f3;
                    auVar241._16_4_ = 0x3f3504f3;
                    auVar241._20_4_ = 0x3f3504f3;
                    auVar241._24_4_ = 0x3f3504f3;
                    auVar241._28_4_ = 0x3f3504f3;
                    uVar162 = vcmpps_avx512vl(auVar237,auVar241,1);
                    auVar238 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                    in_ZMM20 = ZEXT3264(auVar238);
                    auVar239 = vaddps_avx512vl(auVar237,auVar238);
                    auVar237 = vaddps_avx512vl(auVar239,auVar237);
                    bVar24 = (bool)((byte)uVar162 & 1);
                    auVar252._0_4_ = (uint)bVar24 * auVar237._0_4_ | (uint)!bVar24 * auVar239._0_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                    auVar252._4_4_ = (uint)bVar24 * auVar237._4_4_ | (uint)!bVar24 * auVar239._4_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                    auVar252._8_4_ = (uint)bVar24 * auVar237._8_4_ | (uint)!bVar24 * auVar239._8_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                    auVar252._12_4_ =
                         (uint)bVar24 * auVar237._12_4_ | (uint)!bVar24 * auVar239._12_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                    auVar252._16_4_ =
                         (uint)bVar24 * auVar237._16_4_ | (uint)!bVar24 * auVar239._16_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                    auVar252._20_4_ =
                         (uint)bVar24 * auVar237._20_4_ | (uint)!bVar24 * auVar239._20_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                    auVar252._24_4_ =
                         (uint)bVar24 * auVar237._24_4_ | (uint)!bVar24 * auVar239._24_4_;
                    bVar24 = SUB81(uVar162 >> 7,0);
                    auVar252._28_4_ =
                         (uint)bVar24 * auVar237._28_4_ | (uint)!bVar24 * auVar239._28_4_;
                    auVar239 = vmulps_avx512vl(auVar252,auVar252);
                    auVar237 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                    auVar242._8_4_ = 0xbdebd1b8;
                    auVar242._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar242._12_4_ = 0xbdebd1b8;
                    auVar242._16_4_ = 0xbdebd1b8;
                    auVar242._20_4_ = 0xbdebd1b8;
                    auVar242._24_4_ = 0xbdebd1b8;
                    auVar242._28_4_ = 0xbdebd1b8;
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar252,auVar242);
                    auVar243._8_4_ = 0x3def251a;
                    auVar243._0_8_ = 0x3def251a3def251a;
                    auVar243._12_4_ = 0x3def251a;
                    auVar243._16_4_ = 0x3def251a;
                    auVar243._20_4_ = 0x3def251a;
                    auVar243._24_4_ = 0x3def251a;
                    auVar243._28_4_ = 0x3def251a;
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar252,auVar243);
                    auVar244._8_4_ = 0xbdfe5d4f;
                    auVar244._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar244._12_4_ = 0xbdfe5d4f;
                    auVar244._16_4_ = 0xbdfe5d4f;
                    auVar244._20_4_ = 0xbdfe5d4f;
                    auVar244._24_4_ = 0xbdfe5d4f;
                    auVar244._28_4_ = 0xbdfe5d4f;
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar252,auVar244);
                    auVar245._8_4_ = 0x3e11e9bf;
                    auVar245._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar245._12_4_ = 0x3e11e9bf;
                    auVar245._16_4_ = 0x3e11e9bf;
                    auVar245._20_4_ = 0x3e11e9bf;
                    auVar245._24_4_ = 0x3e11e9bf;
                    auVar245._28_4_ = 0x3e11e9bf;
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar252,auVar245);
                    auVar246._8_4_ = 0xbe2aae50;
                    auVar246._0_8_ = 0xbe2aae50be2aae50;
                    auVar246._12_4_ = 0xbe2aae50;
                    auVar246._16_4_ = 0xbe2aae50;
                    auVar246._20_4_ = 0xbe2aae50;
                    auVar246._24_4_ = 0xbe2aae50;
                    auVar246._28_4_ = 0xbe2aae50;
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar252,auVar246);
                    auVar247._8_4_ = 0x3e4cceac;
                    auVar247._0_8_ = 0x3e4cceac3e4cceac;
                    auVar247._12_4_ = 0x3e4cceac;
                    auVar247._16_4_ = 0x3e4cceac;
                    auVar247._20_4_ = 0x3e4cceac;
                    auVar247._24_4_ = 0x3e4cceac;
                    auVar247._28_4_ = 0x3e4cceac;
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar252,auVar247);
                    auVar248._8_4_ = 0xbe7ffffc;
                    auVar248._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar248._12_4_ = 0xbe7ffffc;
                    auVar248._16_4_ = 0xbe7ffffc;
                    auVar248._20_4_ = 0xbe7ffffc;
                    auVar248._24_4_ = 0xbe7ffffc;
                    auVar248._28_4_ = 0xbe7ffffc;
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar252,auVar248);
                    auVar249._8_4_ = 0x3eaaaaaa;
                    auVar249._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar249._12_4_ = 0x3eaaaaaa;
                    auVar249._16_4_ = 0x3eaaaaaa;
                    auVar249._20_4_ = 0x3eaaaaaa;
                    auVar249._24_4_ = 0x3eaaaaaa;
                    auVar249._28_4_ = 0x3eaaaaaa;
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar252,auVar249);
                    auVar240 = vmulps_avx512vl(auVar239,auVar252);
                    auVar240 = vmulps_avx512vl(auVar240,auVar237);
                    auVar250._8_4_ = 0xffffff82;
                    auVar250._0_8_ = 0xffffff82ffffff82;
                    auVar250._12_4_ = 0xffffff82;
                    auVar250._16_4_ = 0xffffff82;
                    auVar250._20_4_ = 0xffffff82;
                    auVar250._24_4_ = 0xffffff82;
                    auVar250._28_4_ = 0xffffff82;
                    auVar237 = vpaddd_avx512vl(auVar453,auVar250);
                    auVar237 = vcvtdq2ps_avx(auVar237);
                    auVar241 = vsubps_avx512vl(auVar237,auVar261);
                    bVar24 = (bool)((byte)uVar162 & 1);
                    auVar253._0_4_ = (uint)bVar24 * auVar241._0_4_ | (uint)!bVar24 * auVar237._0_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                    auVar253._4_4_ = (uint)bVar24 * auVar241._4_4_ | (uint)!bVar24 * auVar237._4_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                    auVar253._8_4_ = (uint)bVar24 * auVar241._8_4_ | (uint)!bVar24 * auVar237._8_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                    auVar253._12_4_ =
                         (uint)bVar24 * auVar241._12_4_ | (uint)!bVar24 * auVar237._12_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                    auVar253._16_4_ =
                         (uint)bVar24 * auVar241._16_4_ | (uint)!bVar24 * auVar237._16_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                    auVar253._20_4_ =
                         (uint)bVar24 * auVar241._20_4_ | (uint)!bVar24 * auVar237._20_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                    auVar253._24_4_ =
                         (uint)bVar24 * auVar241._24_4_ | (uint)!bVar24 * auVar237._24_4_;
                    bVar24 = SUB81(uVar162 >> 7,0);
                    auVar253._28_4_ =
                         (uint)bVar24 * auVar241._28_4_ | (uint)!bVar24 * auVar237._28_4_;
                    auVar237 = vfmadd231ps_avx512vl(auVar240,auVar253,auVar268);
                    auVar237 = vfmsub231ps_avx512vl(auVar237,auVar259,auVar239);
                    auVar237 = vsubps_avx512vl(auVar237,auVar252);
                    auVar181 = vfmsub231ps_fma(auVar237,auVar262,auVar253);
                    auVar237 = vmulps_avx512vl(ZEXT1632(auVar181),auVar236);
                    auVar239 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar254._0_4_ = (uint)bVar24 * auVar239._0_4_ | (uint)!bVar24 * auVar237._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar254._4_4_ = (uint)bVar24 * auVar239._4_4_ | (uint)!bVar24 * auVar237._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar254._8_4_ = (uint)bVar24 * auVar239._8_4_ | (uint)!bVar24 * auVar237._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar254._12_4_ =
                         (uint)bVar24 * auVar239._12_4_ | (uint)!bVar24 * auVar237._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar254._16_4_ =
                         (uint)bVar24 * auVar239._16_4_ | (uint)!bVar24 * auVar237._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar254._20_4_ =
                         (uint)bVar24 * auVar239._20_4_ | (uint)!bVar24 * auVar237._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar254._24_4_ =
                         (uint)bVar24 * auVar239._24_4_ | (uint)!bVar24 * auVar237._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar254._28_4_ =
                         (uint)bVar24 * auVar239._28_4_ | (uint)!bVar24 * auVar237._28_4_;
                    auVar237 = vminps_avx(auVar254,auVar257);
                    auVar237 = vmaxps_avx(auVar237,auVar258);
                    auVar181 = vfmadd213ps_fma(auVar260,auVar237,auVar259);
                    auVar239 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar239,1);
                    auVar240 = vsubps_avx512vl(auVar239,auVar261);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar255._0_4_ = (uint)bVar24 * auVar240._0_4_ | (uint)!bVar24 * auVar239._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar255._4_4_ = (uint)bVar24 * auVar240._4_4_ | (uint)!bVar24 * auVar239._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar255._8_4_ = (uint)bVar24 * auVar240._8_4_ | (uint)!bVar24 * auVar239._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar255._12_4_ =
                         (uint)bVar24 * auVar240._12_4_ | (uint)!bVar24 * auVar239._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar255._16_4_ =
                         (uint)bVar24 * auVar240._16_4_ | (uint)!bVar24 * auVar239._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar255._20_4_ =
                         (uint)bVar24 * auVar240._20_4_ | (uint)!bVar24 * auVar239._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar255._24_4_ =
                         (uint)bVar24 * auVar240._24_4_ | (uint)!bVar24 * auVar239._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar255._28_4_ =
                         (uint)bVar24 * auVar240._28_4_ | (uint)!bVar24 * auVar239._28_4_;
                    in_ZMM16 = ZEXT3264(auVar255);
                    auVar237 = vfmsub231ps_avx512vl(auVar237,auVar255,auVar262);
                    auVar237 = vfnmsub231ps_avx512vl(auVar237,auVar255,auVar268);
                    auVar454._0_4_ = auVar237._0_4_ * auVar237._0_4_;
                    auVar454._4_4_ = auVar237._4_4_ * auVar237._4_4_;
                    auVar454._8_4_ = auVar237._8_4_ * auVar237._8_4_;
                    auVar454._12_4_ = auVar237._12_4_ * auVar237._12_4_;
                    auVar454._16_4_ = auVar237._16_4_ * auVar237._16_4_;
                    auVar454._20_4_ = auVar237._20_4_ * auVar237._20_4_;
                    auVar454._24_4_ = auVar237._24_4_ * auVar237._24_4_;
                    auVar454._28_4_ = 0;
                    auVar239 = vfmadd213ps_avx512vl(auVar235,auVar237,auVar263);
                    auVar239 = vfmadd213ps_avx512vl(auVar239,auVar237,auVar264);
                    auVar239 = vfmadd213ps_avx512vl(auVar239,auVar237,auVar265);
                    auVar239 = vfmadd213ps_avx512vl(auVar239,auVar237,auVar266);
                    auVar239 = vfmadd213ps_avx512vl(auVar239,auVar237,auVar259);
                    auVar237 = vfmadd213ps_avx512vl(auVar239,auVar454,auVar237);
                    auVar239 = vaddps_avx512vl(auVar237,auVar261);
                    auVar237 = vcvttps2dq_avx512vl(auVar255);
                    auVar237 = vpslld_avx2(auVar237,0x17);
                    auVar237 = vpaddd_avx2(auVar237,auVar267);
                    auVar181 = vfmadd213ps_fma(auVar237,auVar239,auVar261);
                    auVar237 = vrcpps_avx(ZEXT1632(auVar181));
                    auVar181 = vfmsub213ps_fma(ZEXT1632(auVar181),auVar237,auVar261);
                    auVar181 = vfnmadd132ps_fma(ZEXT1632(auVar181),auVar237,auVar237);
                    auVar237 = vfnmadd213ps_avx512vl(ZEXT1632(auVar181),auVar236,auVar238);
                    auVar342._0_4_ = auVar237._0_4_ * auVar341._0_4_;
                    auVar342._4_4_ = auVar237._4_4_ * auVar341._4_4_;
                    auVar342._8_4_ = auVar237._8_4_ * auVar341._8_4_;
                    auVar342._12_4_ = auVar237._12_4_ * auVar341._12_4_;
                    auVar342._16_4_ = auVar237._16_4_ * auVar341._16_4_;
                    auVar342._20_4_ = auVar237._20_4_ * auVar341._20_4_;
                    auVar342._24_4_ = auVar237._24_4_ * auVar341._24_4_;
                    auVar237 = auVar342._0_32_;
                    break;
                  case 6:
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar240._4_4_ = uVar11;
                    auVar240._0_4_ = uVar11;
                    auVar240._8_4_ = uVar11;
                    auVar240._12_4_ = uVar11;
                    auVar240._16_4_ = uVar11;
                    auVar240._20_4_ = uVar11;
                    auVar240._24_4_ = uVar11;
                    auVar240._28_4_ = uVar11;
                    uVar11 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                    auVar239._4_4_ = uVar11;
                    auVar239._0_4_ = uVar11;
                    auVar239._8_4_ = uVar11;
                    auVar239._12_4_ = uVar11;
                    auVar239._16_4_ = uVar11;
                    auVar239._20_4_ = uVar11;
                    auVar239._24_4_ = uVar11;
                    auVar239._28_4_ = uVar11;
                    auVar237 = vfmadd213ps_avx512vl(auVar240,auVar237,auVar239);
                    auVar237 = vmaxps_avx(auVar237,auVar238);
                    auVar237 = vminps_avx(auVar237,auVar261);
                    auVar343._0_4_ = auVar237._0_4_ * auVar341._0_4_;
                    auVar343._4_4_ = auVar237._4_4_ * auVar341._4_4_;
                    auVar343._8_4_ = auVar237._8_4_ * auVar341._8_4_;
                    auVar343._12_4_ = auVar237._12_4_ * auVar341._12_4_;
                    auVar343._16_4_ = auVar237._16_4_ * auVar341._16_4_;
                    auVar343._20_4_ = auVar237._20_4_ * auVar341._20_4_;
                    auVar343._24_4_ = auVar237._24_4_ * auVar341._24_4_;
                    auVar343._28_36_ = auVar342._28_36_;
                    auVar237 = auVar343._0_32_;
                  }
                }
                *(undefined1 (*) [32])pAVar158 = auVar237;
                pAVar158 = pAVar158 + 4;
                uVar163 = uVar163 + 1;
                iVar138 = iVar138 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar174 = iVar174 + 1;
          } while (iVar174 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_228.c);
    }
    afVar333 = _ps512_cephes_log_p8;
    afVar332 = _ps512_cephes_log_p7;
    afVar331 = _ps512_cephes_log_p6;
    afVar330 = _ps512_cephes_log_p5;
    afVar329 = _ps512_cephes_log_p4;
    afVar328 = _ps512_cephes_log_p3;
    afVar487 = _ps512_cephes_log_p2;
    afVar327 = _ps512_cephes_exp_p5;
    afVar326 = _ps512_cephes_exp_p4;
    afVar325 = _ps512_cephes_exp_p3;
    afVar324 = _ps512_cephes_exp_p2;
    afVar323 = _ps512_cephes_exp_p1;
    afVar322 = _ps512_cephes_exp_p0;
    afVar321 = _ps512_cephes_LOG2EF;
    afVar320 = _ps512_exp_lo;
    afVar319 = _ps512_exp_hi;
    afVar318 = _ps512_1;
    if (((iVar173 == 4) && (uVar146 == 0x10)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar8 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      uVar11 = *(undefined4 *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      in_ZMM20 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar341 = vxorps_avx512dq(in_ZMM20,(undefined1  [64])_ps512_cephes_log_q2);
      auVar342 = vxorps_avx512dq(in_ZMM20,(undefined1  [64])_ps512_cephes_log_q1);
      auVar343 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar344 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,in_ZMM20);
      local_2f8 = 0;
      auVar181 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar181);
      auVar345 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar346 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar142 = bottom_blob->w;
          iVar175 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar166 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar174 = (1 - uVar9) * iVar8;
              do {
                if (lVar160 == 0) {
                  auVar287 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar287 = *(undefined1 (*) [64])(lVar160 + local_2f8 * 0x40);
                }
                if (0 < (int)uVar10) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar150 = bottom_blob->data;
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      uVar162 = 0;
                      pvVar168 = (void *)0x0;
                      do {
                        iVar138 = (((int)pvVar168 - uVar157) + 1) * iVar152 + iVar166;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar161, iVar138 % iVar161 == 0)
                            ) && ((0 < (int)uVar9 && (iVar139 < iVar175)))) {
                          lVar159 = (long)iVar139 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                          pvVar151 = (void *)(ulong)uVar9;
                          uVar147 = uVar162;
                          iVar138 = iVar174;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar139 = iVar138 / iVar172, iVar138 % iVar172 == 0)) &&
                               (iVar139 < iVar142)) {
                              lVar143 = (long)(iVar139 << 2);
                              auVar288 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159)));
                              auVar289 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 8)));
                              auVar290 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0xc)));
                              uVar164 = uVar147 & 0xffffffff;
                              auVar287 = vfmadd231ps_avx512f(auVar287,auVar288,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar164 * 4));
                              auVar287 = vfmadd231ps_avx512f(auVar287,auVar289,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar164 * 4 + 0x40))
                              ;
                              auVar287 = vfmadd231ps_avx512f(auVar287,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar164 * 4 + 0x80))
                              ;
                              auVar287 = vfmadd231ps_avx512f(auVar287,auVar290,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar176 + uVar164 * 4 + 0xc0))
                              ;
                            }
                            uVar147 = uVar147 + 0x40;
                            iVar138 = iVar138 + iVar8;
                            pvVar151 = (void *)((long)pvVar151 - 1);
                          } while (pvVar151 != (void *)0x0);
                        }
                        pvVar168 = (void *)((long)pvVar168 + 1);
                        uVar162 = uVar162 + (long)(ulong)uVar9 * 0x40;
                      } while (pvVar168 != (void *)(ulong)uVar157);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar9 * uVar157 * 0x40) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                switch(uVar11) {
                case 1:
                  auVar287 = vmaxps_avx512f(auVar287,in_ZMM29);
                  break;
                case 2:
                  uVar149 = vcmpps_avx512f(auVar287,in_ZMM29,1);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar129._4_4_ = uVar2;
                  auVar129._0_4_ = uVar2;
                  auVar129._8_4_ = uVar2;
                  auVar129._12_4_ = uVar2;
                  auVar129._16_4_ = uVar2;
                  auVar129._20_4_ = uVar2;
                  auVar129._24_4_ = uVar2;
                  auVar129._28_4_ = uVar2;
                  auVar129._32_4_ = uVar2;
                  auVar129._36_4_ = uVar2;
                  auVar129._40_4_ = uVar2;
                  auVar129._44_4_ = uVar2;
                  auVar129._48_4_ = uVar2;
                  auVar129._52_4_ = uVar2;
                  auVar129._56_4_ = uVar2;
                  auVar129._60_4_ = uVar2;
                  auVar288 = vmulps_avx512f(auVar287,auVar129);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar308._0_4_ = (uint)bVar24 * auVar288._0_4_ | (uint)!bVar24 * auVar287._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar308._4_4_ = (uint)bVar24 * auVar288._4_4_ | (uint)!bVar24 * auVar287._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar308._8_4_ = (uint)bVar24 * auVar288._8_4_ | (uint)!bVar24 * auVar287._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar308._12_4_ = (uint)bVar24 * auVar288._12_4_ | (uint)!bVar24 * auVar287._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar308._16_4_ = (uint)bVar24 * auVar288._16_4_ | (uint)!bVar24 * auVar287._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar308._20_4_ = (uint)bVar24 * auVar288._20_4_ | (uint)!bVar24 * auVar287._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar308._24_4_ = (uint)bVar24 * auVar288._24_4_ | (uint)!bVar24 * auVar287._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar308._28_4_ = (uint)bVar24 * auVar288._28_4_ | (uint)!bVar24 * auVar287._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar308._32_4_ = (uint)bVar24 * auVar288._32_4_ | (uint)!bVar24 * auVar287._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar308._36_4_ = (uint)bVar24 * auVar288._36_4_ | (uint)!bVar24 * auVar287._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar308._40_4_ = (uint)bVar24 * auVar288._40_4_ | (uint)!bVar24 * auVar287._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar308._44_4_ = (uint)bVar24 * auVar288._44_4_ | (uint)!bVar24 * auVar287._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar308._48_4_ = (uint)bVar24 * auVar288._48_4_ | (uint)!bVar24 * auVar287._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar308._52_4_ = (uint)bVar24 * auVar288._52_4_ | (uint)!bVar24 * auVar287._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar308._56_4_ = (uint)bVar24 * auVar288._56_4_ | (uint)!bVar24 * auVar287._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar308._60_4_ = (uint)bVar24 * auVar288._60_4_ | (uint)!bVar24 * auVar287._60_4_
                  ;
                  auVar287 = auVar308;
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar127._4_4_ = uVar2;
                  auVar127._0_4_ = uVar2;
                  auVar127._8_4_ = uVar2;
                  auVar127._12_4_ = uVar2;
                  auVar127._16_4_ = uVar2;
                  auVar127._20_4_ = uVar2;
                  auVar127._24_4_ = uVar2;
                  auVar127._28_4_ = uVar2;
                  auVar127._32_4_ = uVar2;
                  auVar127._36_4_ = uVar2;
                  auVar127._40_4_ = uVar2;
                  auVar127._44_4_ = uVar2;
                  auVar127._48_4_ = uVar2;
                  auVar127._52_4_ = uVar2;
                  auVar127._56_4_ = uVar2;
                  auVar127._60_4_ = uVar2;
                  auVar287 = vmaxps_avx512f(auVar287,auVar127);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar128._4_4_ = uVar2;
                  auVar128._0_4_ = uVar2;
                  auVar128._8_4_ = uVar2;
                  auVar128._12_4_ = uVar2;
                  auVar128._16_4_ = uVar2;
                  auVar128._20_4_ = uVar2;
                  auVar128._24_4_ = uVar2;
                  auVar128._28_4_ = uVar2;
                  auVar128._32_4_ = uVar2;
                  auVar128._36_4_ = uVar2;
                  auVar128._40_4_ = uVar2;
                  auVar128._44_4_ = uVar2;
                  auVar128._48_4_ = uVar2;
                  auVar128._52_4_ = uVar2;
                  auVar128._56_4_ = uVar2;
                  auVar128._60_4_ = uVar2;
                  auVar287 = vminps_avx512f(auVar287,auVar128);
                  break;
                case 4:
                  auVar287 = vxorps_avx512dq(auVar287,in_ZMM20);
                  auVar287 = vminps_avx512f(auVar287,(undefined1  [64])afVar319);
                  auVar287 = vmaxps_avx512f(auVar287,(undefined1  [64])afVar320);
                  auVar288 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar287,
                                                 (undefined1  [64])afVar327);
                  auVar289 = vrndscaleps_avx512f(auVar288,1);
                  uVar149 = vcmpps_avx512f(auVar288,auVar289,1);
                  auVar288 = vsubps_avx512f(auVar289,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar307._0_4_ = (uint)bVar24 * auVar288._0_4_ | (uint)!bVar24 * auVar289._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar307._4_4_ = (uint)bVar24 * auVar288._4_4_ | (uint)!bVar24 * auVar289._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar307._8_4_ = (uint)bVar24 * auVar288._8_4_ | (uint)!bVar24 * auVar289._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar307._12_4_ = (uint)bVar24 * auVar288._12_4_ | (uint)!bVar24 * auVar289._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar307._16_4_ = (uint)bVar24 * auVar288._16_4_ | (uint)!bVar24 * auVar289._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar307._20_4_ = (uint)bVar24 * auVar288._20_4_ | (uint)!bVar24 * auVar289._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar307._24_4_ = (uint)bVar24 * auVar288._24_4_ | (uint)!bVar24 * auVar289._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar307._28_4_ = (uint)bVar24 * auVar288._28_4_ | (uint)!bVar24 * auVar289._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar307._32_4_ = (uint)bVar24 * auVar288._32_4_ | (uint)!bVar24 * auVar289._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar307._36_4_ = (uint)bVar24 * auVar288._36_4_ | (uint)!bVar24 * auVar289._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar307._40_4_ = (uint)bVar24 * auVar288._40_4_ | (uint)!bVar24 * auVar289._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar307._44_4_ = (uint)bVar24 * auVar288._44_4_ | (uint)!bVar24 * auVar289._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar307._48_4_ = (uint)bVar24 * auVar288._48_4_ | (uint)!bVar24 * auVar289._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar307._52_4_ = (uint)bVar24 * auVar288._52_4_ | (uint)!bVar24 * auVar289._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar307._56_4_ = (uint)bVar24 * auVar288._56_4_ | (uint)!bVar24 * auVar289._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar307._60_4_ = (uint)bVar24 * auVar288._60_4_ | (uint)!bVar24 * auVar289._60_4_
                  ;
                  auVar287 = vfmadd231ps_avx512f(auVar287,auVar307,auVar341);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar287,auVar307,auVar342);
                  auVar287 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar288 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar288 = vfmadd213ps_avx512f(auVar288,in_ZMM16,(undefined1  [64])afVar324);
                  auVar288 = vfmadd213ps_avx512f(auVar288,in_ZMM16,(undefined1  [64])afVar325);
                  auVar288 = vfmadd213ps_avx512f(auVar288,in_ZMM16,(undefined1  [64])afVar326);
                  auVar288 = vfmadd213ps_avx512f(auVar288,in_ZMM16,(undefined1  [64])afVar327);
                  auVar287 = vfmadd213ps_avx512f(auVar288,auVar287,in_ZMM16);
                  auVar287 = vaddps_avx512f(auVar287,(undefined1  [64])afVar318);
                  auVar288 = vcvttps2dq_avx512f(auVar307);
                  auVar288 = vpaddd_avx512f(auVar288,auVar343);
                  auVar288 = vpslld_avx512f(auVar288,0x17);
                  auVar287 = vfmadd213ps_avx512f(auVar288,auVar287,auVar345);
                  auVar288 = vrcp14ps_avx512f(auVar287);
                  auVar287 = vfmsub213ps_avx512f(auVar287,auVar288,auVar345);
                  auVar287 = vfnmadd132ps_avx512vl(auVar287,auVar288,auVar288);
                  break;
                case 5:
                  auVar288 = vminps_avx512f(auVar287,(undefined1  [64])afVar319);
                  auVar288 = vmaxps_avx512f(auVar288,(undefined1  [64])afVar320);
                  auVar289 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar288,
                                                 (undefined1  [64])afVar327);
                  auVar290 = vrndscaleps_avx512f(auVar289,1);
                  uVar149 = vcmpps_avx512f(auVar289,auVar290,1);
                  auVar289 = vsubps_avx512f(auVar290,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar303._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar290._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar303._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar290._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar303._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar290._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar303._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar290._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar303._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar290._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar303._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar290._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar303._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar290._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar303._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar290._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar303._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar290._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar303._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar290._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar303._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar290._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar303._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar290._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar303._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar290._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar303._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar290._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar303._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar290._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar303._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar290._60_4_
                  ;
                  auVar288 = vfmadd231ps_avx512f(auVar288,auVar303,auVar341);
                  auVar288 = vfmadd231ps_avx512f(auVar288,auVar303,auVar342);
                  auVar289 = vmulps_avx512f(auVar288,auVar288);
                  auVar290 = vfmadd213ps_avx512f(auVar288,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar324);
                  auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar325);
                  auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar326);
                  auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar327);
                  auVar288 = vfmadd213ps_avx512f(auVar290,auVar289,auVar288);
                  auVar288 = vaddps_avx512f(auVar288,(undefined1  [64])afVar318);
                  auVar289 = vcvttps2dq_avx512f(auVar303);
                  auVar289 = vpaddd_avx512f(auVar289,auVar343);
                  auVar289 = vpslld_avx512f(auVar289,0x17);
                  auVar288 = vfmadd213ps_avx512f(auVar289,auVar288,auVar345);
                  auVar289 = vmaxps_avx512f(auVar288,(undefined1  [64])_ps512_min_norm_pos);
                  auVar290 = vpsrld_avx512f(auVar289,0x17);
                  auVar289 = vpternlogd_avx512f(auVar289,(undefined1  [64])afVar327,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar149 = vcmpps_avx512f(auVar289,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar291 = vsubps_avx512f(auVar289,(undefined1  [64])afVar318);
                  auVar289 = vaddps_avx512f(auVar291,auVar289);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar304._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar291._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar304._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar291._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar304._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar291._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar304._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar291._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar304._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar291._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar304._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar291._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar304._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar291._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar304._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar291._28_4_
                  ;
                  bVar32 = (byte)(uVar149 >> 8);
                  bVar24 = (bool)(bVar32 & 1);
                  auVar304._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar291._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar304._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar291._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar304._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar291._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar304._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar291._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar304._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar291._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar304._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar291._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar304._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar291._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar304._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar291._60_4_
                  ;
                  auVar289 = vmulps_avx512f(auVar304,auVar304);
                  auVar291 = vfmadd132ps_avx512f(auVar304,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar304,(undefined1  [64])afVar487);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar304,(undefined1  [64])afVar328);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar304,(undefined1  [64])afVar329);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar304,(undefined1  [64])afVar330);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar304,(undefined1  [64])afVar331);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar304,(undefined1  [64])afVar332);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar304,(undefined1  [64])afVar333);
                  auVar292 = vmulps_avx512f(auVar289,auVar304);
                  auVar291 = vfmadd213ps_avx512f(auVar292,auVar291,auVar304);
                  uVar162 = vcmpps_avx512f(auVar288,in_ZMM29,2);
                  auVar288 = vpsubd_avx512f(auVar290,auVar343);
                  auVar288 = vcvtdq2ps_avx512f(auVar288);
                  auVar290 = vaddps_avx512f(auVar288,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar305._0_4_ = (uint)bVar24 * auVar288._0_4_ | (uint)!bVar24 * auVar290._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar305._4_4_ = (uint)bVar24 * auVar288._4_4_ | (uint)!bVar24 * auVar290._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar305._8_4_ = (uint)bVar24 * auVar288._8_4_ | (uint)!bVar24 * auVar290._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar305._12_4_ = (uint)bVar24 * auVar288._12_4_ | (uint)!bVar24 * auVar290._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar305._16_4_ = (uint)bVar24 * auVar288._16_4_ | (uint)!bVar24 * auVar290._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar305._20_4_ = (uint)bVar24 * auVar288._20_4_ | (uint)!bVar24 * auVar290._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar305._24_4_ = (uint)bVar24 * auVar288._24_4_ | (uint)!bVar24 * auVar290._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar305._28_4_ = (uint)bVar24 * auVar288._28_4_ | (uint)!bVar24 * auVar290._28_4_
                  ;
                  bVar24 = (bool)(bVar32 & 1);
                  auVar305._32_4_ = (uint)bVar24 * auVar288._32_4_ | (uint)!bVar24 * auVar290._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar305._36_4_ = (uint)bVar24 * auVar288._36_4_ | (uint)!bVar24 * auVar290._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar305._40_4_ = (uint)bVar24 * auVar288._40_4_ | (uint)!bVar24 * auVar290._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar305._44_4_ = (uint)bVar24 * auVar288._44_4_ | (uint)!bVar24 * auVar290._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar305._48_4_ = (uint)bVar24 * auVar288._48_4_ | (uint)!bVar24 * auVar290._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar305._52_4_ = (uint)bVar24 * auVar288._52_4_ | (uint)!bVar24 * auVar290._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar305._56_4_ = (uint)bVar24 * auVar288._56_4_ | (uint)!bVar24 * auVar290._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar305._60_4_ = (uint)bVar24 * auVar288._60_4_ | (uint)!bVar24 * auVar290._60_4_
                  ;
                  auVar288 = vfmadd231ps_avx512f(auVar291,auVar305,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar288 = vfmadd231ps_avx512f(auVar288,auVar344,auVar289);
                  auVar288 = vfmadd231ps_avx512f(auVar288,auVar305,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar288 = vmulps_avx512f(auVar288,auVar346);
                  auVar289 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar306._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar288._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar306._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar288._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar306._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar288._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar306._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar288._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                  auVar306._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar288._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                  auVar306._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar288._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                  auVar306._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar288._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 7) & 1);
                  auVar306._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar288._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 8) & 1);
                  auVar306._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar288._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 9) & 1);
                  auVar306._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar288._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 10) & 1);
                  auVar306._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar288._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xb) & 1);
                  auVar306._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar288._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xc) & 1);
                  auVar306._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar288._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xd) & 1);
                  auVar306._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar288._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xe) & 1);
                  auVar306._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar288._56_4_
                  ;
                  bVar24 = SUB81(uVar162 >> 0xf,0);
                  auVar306._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar288._60_4_
                  ;
                  auVar288 = vminps_avx512f(auVar306,(undefined1  [64])afVar319);
                  auVar288 = vmaxps_avx512f(auVar288,(undefined1  [64])afVar320);
                  auVar289 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar288,
                                                 (undefined1  [64])afVar327);
                  auVar290 = vrndscaleps_avx512f(auVar289,1);
                  uVar149 = vcmpps_avx512f(auVar289,auVar290,1);
                  auVar289 = vsubps_avx512f(auVar290,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  in_ZMM16._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar290._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar290._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar290._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar290._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar290._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar290._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar290._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar290._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar290._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar290._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar290._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar290._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar290._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar290._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar290._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar290._60_4_
                  ;
                  auVar288 = vfmadd231ps_avx512f(auVar288,in_ZMM16,auVar341);
                  auVar288 = vfmadd231ps_avx512f(auVar288,in_ZMM16,auVar342);
                  auVar289 = vmulps_avx512f(auVar288,auVar288);
                  auVar290 = vfmadd213ps_avx512f(auVar288,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar324);
                  auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar325);
                  auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar326);
                  auVar290 = vfmadd213ps_avx512f(auVar290,auVar288,(undefined1  [64])afVar327);
                  auVar288 = vfmadd213ps_avx512f(auVar290,auVar289,auVar288);
                  auVar288 = vaddps_avx512f(auVar288,(undefined1  [64])afVar318);
                  auVar289 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar289 = vpaddd_avx512f(auVar289,auVar343);
                  auVar289 = vpslld_avx512f(auVar289,0x17);
                  auVar288 = vfmadd213ps_avx512f(auVar289,auVar288,auVar345);
                  auVar289 = vrcp14ps_avx512f(auVar288);
                  auVar288 = vfmsub213ps_avx512f(auVar288,auVar289,auVar345);
                  auVar288 = vfnmadd132ps_avx512vl(auVar288,auVar289,auVar289);
                  auVar288 = vfnmsub213ps_avx512f(auVar288,auVar346,auVar345);
                  auVar287 = vmulps_avx512f(auVar288,auVar287);
                  break;
                case 6:
                  auVar288 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var13)));
                  uVar12 = (*(uint **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar126._4_4_ = uVar12;
                  auVar126._0_4_ = uVar12;
                  auVar126._8_4_ = uVar12;
                  auVar126._12_4_ = uVar12;
                  auVar126._16_4_ = uVar12;
                  auVar126._20_4_ = uVar12;
                  auVar126._24_4_ = uVar12;
                  auVar126._28_4_ = uVar12;
                  auVar126._32_4_ = uVar12;
                  auVar126._36_4_ = uVar12;
                  auVar126._40_4_ = uVar12;
                  auVar126._44_4_ = uVar12;
                  auVar126._48_4_ = uVar12;
                  auVar126._52_4_ = uVar12;
                  auVar126._56_4_ = uVar12;
                  auVar126._60_4_ = uVar12;
                  auVar288 = vfmadd213ps_avx512f(auVar288,auVar287,auVar126);
                  auVar288 = vmaxps_avx512f(auVar288,in_ZMM29);
                  auVar288 = vminps_avx512f(auVar288,auVar345);
                  auVar287 = vmulps_avx512f(auVar288,auVar287);
                }
                *(undefined1 (*) [64])pAVar158 = auVar287;
                pAVar158 = pAVar158 + 8;
                uVar163 = uVar163 + 1;
                iVar174 = iVar174 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar166 = iVar166 + 1;
          } while (iVar166 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
        in_ZMM13 = afVar325;
        in_ZMM21 = afVar487;
      } while (local_2f8 != local_228.c);
    }
    auVar181 = in_ZMM29._0_16_;
    if (((iVar173 == 0x10) && (uVar146 == 4)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar8 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      uVar11 = *(undefined4 *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      pvVar168 = (void *)(ulong)uVar157;
      local_2f8 = 0;
      auVar204 = ZEXT816(0) << 0x40;
      auVar205._8_4_ = 0x42b0c0a5;
      auVar205._0_8_ = 0x42b0c0a542b0c0a5;
      auVar205._12_4_ = 0x42b0c0a5;
      auVar206._8_4_ = 0xc2b0c0a5;
      auVar206._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar206._12_4_ = 0xc2b0c0a5;
      auVar207._8_4_ = 0x3f000000;
      auVar207._0_8_ = 0x3f0000003f000000;
      auVar207._12_4_ = 0x3f000000;
      auVar208._8_4_ = 0x3fb8aa3b;
      auVar208._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar208._12_4_ = 0x3fb8aa3b;
      auVar209._8_4_ = 0x3f800000;
      auVar209._0_8_ = 0x3f8000003f800000;
      auVar209._12_4_ = 0x3f800000;
      auVar210._8_4_ = 0x3f318000;
      auVar210._0_8_ = 0x3f3180003f318000;
      auVar210._12_4_ = 0x3f318000;
      auVar182 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar222._8_4_ = 0x3ab743ce;
      auVar222._0_8_ = 0x3ab743ce3ab743ce;
      auVar222._12_4_ = 0x3ab743ce;
      auVar215._8_4_ = 0x3c088908;
      auVar215._0_8_ = 0x3c0889083c088908;
      auVar215._12_4_ = 0x3c088908;
      auVar211._8_4_ = 0x3d2aa9c1;
      auVar211._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar211._12_4_ = 0x3d2aa9c1;
      auVar212._8_4_ = 0x3e2aaaaa;
      auVar212._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar212._12_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT1664(auVar212);
      auVar213._8_4_ = 0x3f800000;
      auVar213._0_8_ = 0x3f8000003f800000;
      auVar213._12_4_ = 0x3f800000;
      auVar214._8_4_ = 0xb95e8083;
      auVar214._0_8_ = 0xb95e8083b95e8083;
      auVar214._12_4_ = 0xb95e8083;
      auVar183 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar142 = bottom_blob->w;
          iVar175 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar166 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar174 = (1 - uVar9) * iVar8;
              do {
                if (lVar160 == 0) {
                  auVar181 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar181 = *(undefined1 (*) [16])(lVar160 + local_2f8 * 0x10);
                }
                auVar341 = ZEXT1664(auVar181);
                if (0 < (int)uVar10) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar150 = bottom_blob->data;
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      uVar162 = 0;
                      pvVar151 = (void *)0x0;
                      do {
                        iVar138 = (((int)pvVar151 - uVar157) + 1) * iVar152 + iVar166;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar161, iVar138 % iVar161 == 0)
                            ) && ((0 < (int)uVar9 && (iVar139 < iVar175)))) {
                          lVar159 = (long)iVar139 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                          uVar147 = (ulong)uVar9;
                          uVar164 = uVar162;
                          iVar138 = iVar174;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar139 = iVar138 / iVar172, iVar138 % iVar172 == 0)) &&
                               (iVar139 < iVar142)) {
                              lVar143 = (long)(iVar139 << 4);
                              uVar2 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159);
                              auVar411._4_4_ = uVar2;
                              auVar411._0_4_ = uVar2;
                              auVar411._8_4_ = uVar2;
                              auVar411._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159 + 4);
                              auVar440._4_4_ = uVar2;
                              auVar440._0_4_ = uVar2;
                              auVar440._8_4_ = uVar2;
                              auVar440._12_4_ = uVar2;
                              auVar184 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 8)));
                              in_ZMM16 = ZEXT1664(auVar184);
                              auVar185 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0xc)));
                              auVar186 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x10)))
                              ;
                              auVar187 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x14)))
                              ;
                              in_ZMM20 = ZEXT1664(auVar187);
                              auVar188 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x18)))
                              ;
                              in_ZMM21 = (float  [16])ZEXT1664(auVar188);
                              auVar189 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x1c)))
                              ;
                              auVar190 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x20)))
                              ;
                              auVar191 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x24)))
                              ;
                              auVar192 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x28)))
                              ;
                              auVar193 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x2c)))
                              ;
                              auVar194 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x30)))
                              ;
                              auVar195 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x34)))
                              ;
                              auVar196 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x38)))
                              ;
                              in_ZMM29 = ZEXT1664(auVar196);
                              auVar197 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x3c)))
                              ;
                              uVar155 = uVar164 & 0xffffffff;
                              auVar181 = vfmadd231ps_fma(auVar341._0_16_,auVar411,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar176 + uVar155 * 4));
                              auVar181 = vfmadd231ps_fma(auVar181,auVar440,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar176 + uVar155 * 4 + 0x10));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar184,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0x20));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar185,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0x30));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar186,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0x40));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar187,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0x50));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar188,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0x60));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar189,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0x70));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar190,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0x80));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar191,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0x90));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar192,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0xa0));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar193,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0xb0));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar194,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0xc0));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar195,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0xd0));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar196,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0xe0));
                              auVar181 = vfmadd231ps_avx512vl
                                                   (auVar181,auVar197,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar155 * 4 + 0xf0));
                              auVar341 = ZEXT1664(auVar181);
                            }
                            uVar164 = uVar164 + 0x40;
                            iVar138 = iVar138 + iVar8;
                            uVar147 = uVar147 - 1;
                          } while (uVar147 != 0);
                        }
                        pvVar151 = (void *)((long)pvVar151 + 1);
                        uVar162 = uVar162 + (ulong)uVar9 * 0x40;
                      } while (pvVar151 != pvVar168);
                    }
                    auVar181 = auVar341._0_16_;
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar9 * uVar157 * 0x40) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                switch(uVar11) {
                case 1:
                  auVar181 = vmaxps_avx(auVar181,auVar204);
                  break;
                case 2:
                  auVar184 = vmaxps_avx(auVar181,auVar204);
                  auVar181 = vminps_avx(auVar181,auVar204);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar50._4_4_ = uVar2;
                  auVar50._0_4_ = uVar2;
                  auVar50._8_4_ = uVar2;
                  auVar50._12_4_ = uVar2;
                  auVar181 = vfmadd132ps_avx512vl(auVar181,auVar184,auVar50);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar48._4_4_ = uVar2;
                  auVar48._0_4_ = uVar2;
                  auVar48._8_4_ = uVar2;
                  auVar48._12_4_ = uVar2;
                  auVar181 = vmaxps_avx512vl(auVar181,auVar48);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar49._4_4_ = uVar2;
                  auVar49._0_4_ = uVar2;
                  auVar49._8_4_ = uVar2;
                  auVar49._12_4_ = uVar2;
                  auVar181 = vminps_avx512vl(auVar181,auVar49);
                  break;
                case 4:
                  auVar46._8_4_ = 0x80000000;
                  auVar46._0_8_ = 0x8000000080000000;
                  auVar46._12_4_ = 0x80000000;
                  auVar181 = vxorps_avx512vl(auVar181,auVar46);
                  auVar181 = vminps_avx(auVar181,auVar205);
                  auVar181 = vmaxps_avx(auVar181,auVar206);
                  auVar184 = vfmadd231ps_fma(auVar207,auVar181,auVar208);
                  auVar185 = vcvttps2dq_avx512vl(auVar184);
                  auVar185 = vcvtdq2ps_avx512vl(auVar185);
                  uVar149 = vcmpps_avx512vl(auVar184,auVar185,1);
                  auVar184 = vsubps_avx512vl(auVar185,auVar209);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar203._0_4_ = (uint)bVar24 * auVar184._0_4_ | (uint)!bVar24 * auVar185._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar203._4_4_ = (uint)bVar24 * auVar184._4_4_ | (uint)!bVar24 * auVar185._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar203._8_4_ = (uint)bVar24 * auVar184._8_4_ | (uint)!bVar24 * auVar185._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar203._12_4_ = (uint)bVar24 * auVar184._12_4_ | (uint)!bVar24 * auVar185._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar203);
                  auVar181 = vfmsub231ps_avx512vl(auVar181,auVar203,auVar210);
                  auVar47._8_4_ = 0x395e8083;
                  auVar47._0_8_ = 0x395e8083395e8083;
                  auVar47._12_4_ = 0x395e8083;
                  auVar184 = vfmsub231ps_avx512vl(auVar181,auVar203,auVar47);
                  auVar412._0_4_ = auVar184._0_4_ * auVar184._0_4_;
                  auVar412._4_4_ = auVar184._4_4_ * auVar184._4_4_;
                  auVar412._8_4_ = auVar184._8_4_ * auVar184._8_4_;
                  auVar412._12_4_ = auVar184._12_4_ * auVar184._12_4_;
                  auVar181 = vfmadd213ps_fma(auVar182,auVar184,auVar222);
                  auVar181 = vfmadd213ps_fma(auVar181,auVar184,auVar215);
                  auVar181 = vfmadd213ps_fma(auVar181,auVar184,auVar211);
                  auVar181 = vfmadd213ps_fma(auVar181,auVar184,auVar212);
                  auVar181 = vfmadd213ps_fma(auVar181,auVar184,auVar207);
                  auVar181 = vfmadd213ps_fma(auVar181,auVar412,auVar184);
                  auVar413._0_4_ = auVar181._0_4_ + 1.0;
                  auVar413._4_4_ = auVar181._4_4_ + 1.0;
                  auVar413._8_4_ = auVar181._8_4_ + 1.0;
                  auVar413._12_4_ = auVar181._12_4_ + 1.0;
                  auVar181 = vcvttps2dq_avx512vl(auVar203);
                  auVar181 = vpslld_avx(auVar181,0x17);
                  auVar181 = vpaddd_avx(auVar213,auVar181);
                  auVar184 = vfmadd213ps_fma(auVar181,auVar413,auVar209);
                  auVar181 = vrcpps_avx(auVar184);
                  auVar184 = vfmsub213ps_fma(auVar184,auVar181,auVar209);
                  auVar181 = vfnmadd132ps_fma(auVar184,auVar181,auVar181);
                  break;
                case 5:
                  auVar184 = vminps_avx(auVar181,auVar205);
                  auVar184 = vmaxps_avx(auVar184,auVar206);
                  auVar185 = vfmadd213ps_fma(auVar208,auVar184,auVar207);
                  auVar186 = vcvttps2dq_avx512vl(auVar185);
                  auVar186 = vcvtdq2ps_avx512vl(auVar186);
                  uVar149 = vcmpps_avx512vl(auVar185,auVar186,1);
                  auVar185 = vsubps_avx512vl(auVar186,auVar209);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar198._0_4_ = (uint)bVar24 * auVar185._0_4_ | (uint)!bVar24 * auVar186._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar198._4_4_ = (uint)bVar24 * auVar185._4_4_ | (uint)!bVar24 * auVar186._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar198._8_4_ = (uint)bVar24 * auVar185._8_4_ | (uint)!bVar24 * auVar186._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar198._12_4_ = (uint)bVar24 * auVar185._12_4_ | (uint)!bVar24 * auVar186._12_4_
                  ;
                  auVar184 = vfmsub231ps_avx512vl(auVar184,auVar198,auVar210);
                  auVar184 = vfnmsub231ps_avx512vl(auVar184,auVar198,auVar214);
                  auVar441._0_4_ = auVar184._0_4_ * auVar184._0_4_;
                  auVar441._4_4_ = auVar184._4_4_ * auVar184._4_4_;
                  auVar441._8_4_ = auVar184._8_4_ * auVar184._8_4_;
                  auVar441._12_4_ = auVar184._12_4_ * auVar184._12_4_;
                  auVar185 = vfmadd213ps_avx512vl(auVar182,auVar184,auVar222);
                  auVar185 = vfmadd213ps_avx512vl(auVar185,auVar184,auVar215);
                  auVar185 = vfmadd213ps_avx512vl(auVar185,auVar184,auVar211);
                  auVar185 = vfmadd213ps_avx512vl(auVar185,auVar184,auVar212);
                  auVar185 = vfmadd213ps_avx512vl(auVar185,auVar184,auVar207);
                  auVar184 = vfmadd213ps_avx512vl(auVar185,auVar441,auVar184);
                  auVar185 = vaddps_avx512vl(auVar184,auVar209);
                  auVar184 = vcvttps2dq_avx512vl(auVar198);
                  auVar184 = vpslld_avx(auVar184,0x17);
                  auVar184 = vpaddd_avx(auVar184,auVar213);
                  auVar184 = vfmadd213ps_fma(auVar184,auVar185,auVar209);
                  uVar149 = vcmpps_avx512vl(auVar184,auVar204,2);
                  auVar187._8_4_ = 0x800000;
                  auVar187._0_8_ = 0x80000000800000;
                  auVar187._12_4_ = 0x800000;
                  auVar184 = vmaxps_avx512vl(auVar184,auVar187);
                  auVar187 = vpsrld_avx(auVar184,0x17);
                  auVar185 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar188._8_4_ = 0x3f000000;
                  auVar188._0_8_ = 0x3f0000003f000000;
                  auVar188._12_4_ = 0x3f000000;
                  auVar184 = vpternlogd_avx512vl(auVar184,auVar185,auVar188,0xea);
                  auVar189._8_4_ = 0x3f3504f3;
                  auVar189._0_8_ = 0x3f3504f33f3504f3;
                  auVar189._12_4_ = 0x3f3504f3;
                  uVar162 = vcmpps_avx512vl(auVar184,auVar189,1);
                  auVar190._8_4_ = 0xbf800000;
                  auVar190._0_8_ = 0xbf800000bf800000;
                  auVar190._12_4_ = 0xbf800000;
                  auVar185 = vaddps_avx512vl(auVar184,auVar190);
                  auVar184 = vaddps_avx512vl(auVar185,auVar184);
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar199._0_4_ = (uint)bVar24 * auVar184._0_4_ | (uint)!bVar24 * auVar185._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar199._4_4_ = (uint)bVar24 * auVar184._4_4_ | (uint)!bVar24 * auVar185._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar199._8_4_ = (uint)bVar24 * auVar184._8_4_ | (uint)!bVar24 * auVar185._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar199._12_4_ = (uint)bVar24 * auVar184._12_4_ | (uint)!bVar24 * auVar185._12_4_
                  ;
                  auVar185 = vmulps_avx512vl(auVar199,auVar199);
                  auVar184 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                  auVar191._8_4_ = 0xbdebd1b8;
                  auVar191._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar191._12_4_ = 0xbdebd1b8;
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar199,auVar191);
                  auVar192._8_4_ = 0x3def251a;
                  auVar192._0_8_ = 0x3def251a3def251a;
                  auVar192._12_4_ = 0x3def251a;
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar199,auVar192);
                  auVar193._8_4_ = 0xbdfe5d4f;
                  auVar193._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar193._12_4_ = 0xbdfe5d4f;
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar199,auVar193);
                  auVar194._8_4_ = 0x3e11e9bf;
                  auVar194._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar194._12_4_ = 0x3e11e9bf;
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar199,auVar194);
                  auVar195._8_4_ = 0xbe2aae50;
                  auVar195._0_8_ = 0xbe2aae50be2aae50;
                  auVar195._12_4_ = 0xbe2aae50;
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar199,auVar195);
                  auVar196._8_4_ = 0x3e4cceac;
                  auVar196._0_8_ = 0x3e4cceac3e4cceac;
                  auVar196._12_4_ = 0x3e4cceac;
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar199,auVar196);
                  auVar197._8_4_ = 0xbe7ffffc;
                  auVar197._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar197._12_4_ = 0xbe7ffffc;
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar199,auVar197);
                  auVar44._8_4_ = 0x3eaaaaaa;
                  auVar44._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar44._12_4_ = 0x3eaaaaaa;
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar199,auVar44);
                  auVar186 = vmulps_avx512vl(auVar185,auVar199);
                  auVar186 = vmulps_avx512vl(auVar186,auVar184);
                  auVar45._8_4_ = 0xffffff82;
                  auVar45._0_8_ = 0xffffff82ffffff82;
                  auVar45._12_4_ = 0xffffff82;
                  auVar184 = vpaddd_avx512vl(auVar187,auVar45);
                  auVar184 = vcvtdq2ps_avx(auVar184);
                  auVar187 = vsubps_avx512vl(auVar184,auVar209);
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar200._0_4_ = (uint)bVar24 * auVar187._0_4_ | (uint)!bVar24 * auVar184._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar200._4_4_ = (uint)bVar24 * auVar187._4_4_ | (uint)!bVar24 * auVar184._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar200._8_4_ = (uint)bVar24 * auVar187._8_4_ | (uint)!bVar24 * auVar184._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar200._12_4_ = (uint)bVar24 * auVar187._12_4_ | (uint)!bVar24 * auVar184._12_4_
                  ;
                  auVar184 = vfmadd231ps_avx512vl(auVar186,auVar200,auVar214);
                  auVar184 = vfmsub231ps_avx512vl(auVar184,auVar207,auVar185);
                  auVar184 = vsubps_avx512vl(auVar184,auVar199);
                  auVar184 = vfnmadd231ps_fma(auVar184,auVar210,auVar200);
                  auVar185 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar201._0_4_ =
                       (uint)bVar24 * auVar185._0_4_ |
                       (uint)!bVar24 * (int)(auVar184._0_4_ + auVar184._0_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar201._4_4_ =
                       (uint)bVar24 * auVar185._4_4_ |
                       (uint)!bVar24 * (int)(auVar184._4_4_ + auVar184._4_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar201._8_4_ =
                       (uint)bVar24 * auVar185._8_4_ |
                       (uint)!bVar24 * (int)(auVar184._8_4_ + auVar184._8_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar201._12_4_ =
                       (uint)bVar24 * auVar185._12_4_ |
                       (uint)!bVar24 * (int)(auVar184._12_4_ + auVar184._12_4_);
                  auVar184 = vminps_avx(auVar201,auVar205);
                  auVar184 = vmaxps_avx(auVar184,auVar206);
                  auVar185 = vfmadd213ps_fma(auVar208,auVar184,auVar207);
                  auVar186 = vcvttps2dq_avx512vl(auVar185);
                  auVar186 = vcvtdq2ps_avx512vl(auVar186);
                  uVar149 = vcmpps_avx512vl(auVar185,auVar186,1);
                  auVar185 = vsubps_avx512vl(auVar186,auVar209);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar202._0_4_ = (uint)bVar24 * auVar185._0_4_ | (uint)!bVar24 * auVar186._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar202._4_4_ = (uint)bVar24 * auVar185._4_4_ | (uint)!bVar24 * auVar186._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar202._8_4_ = (uint)bVar24 * auVar185._8_4_ | (uint)!bVar24 * auVar186._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar202._12_4_ = (uint)bVar24 * auVar185._12_4_ | (uint)!bVar24 * auVar186._12_4_
                  ;
                  auVar184 = vfmsub231ps_avx512vl(auVar184,auVar202,auVar210);
                  auVar184 = vfnmsub231ps_avx512vl(auVar184,auVar202,auVar214);
                  auVar442._0_4_ = auVar184._0_4_ * auVar184._0_4_;
                  auVar442._4_4_ = auVar184._4_4_ * auVar184._4_4_;
                  auVar442._8_4_ = auVar184._8_4_ * auVar184._8_4_;
                  auVar442._12_4_ = auVar184._12_4_ * auVar184._12_4_;
                  auVar185 = vfmadd213ps_avx512vl(auVar182,auVar184,auVar222);
                  auVar185 = vfmadd213ps_avx512vl(auVar185,auVar184,auVar215);
                  auVar185 = vfmadd213ps_avx512vl(auVar185,auVar184,auVar211);
                  auVar185 = vfmadd213ps_avx512vl(auVar185,auVar184,auVar212);
                  auVar185 = vfmadd213ps_avx512vl(auVar185,auVar184,auVar207);
                  auVar184 = vfmadd213ps_avx512vl(auVar185,auVar442,auVar184);
                  auVar185 = vaddps_avx512vl(auVar184,auVar209);
                  auVar184 = vcvttps2dq_avx512vl(auVar202);
                  auVar184 = vpslld_avx(auVar184,0x17);
                  auVar184 = vpaddd_avx(auVar184,auVar213);
                  auVar185 = vfmadd213ps_fma(auVar184,auVar185,auVar209);
                  auVar184 = vrcpps_avx(auVar185);
                  auVar186 = vaddps_avx512vl(auVar184,auVar184);
                  in_ZMM16 = ZEXT1664(auVar186);
                  auVar185 = vfmsub213ps_avx512vl(auVar185,auVar186,auVar183);
                  auVar184 = vfnmadd213ps_avx512vl(auVar185,auVar184,auVar186);
                  auVar181 = vfmsub231ps_fma(auVar181,auVar181,auVar184);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar186._4_4_ = uVar2;
                  auVar186._0_4_ = uVar2;
                  auVar186._8_4_ = uVar2;
                  auVar186._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar184._4_4_ = uVar2;
                  auVar184._0_4_ = uVar2;
                  auVar184._8_4_ = uVar2;
                  auVar184._12_4_ = uVar2;
                  auVar184 = vfmadd213ps_avx512vl(auVar186,auVar181,auVar184);
                  auVar184 = vmaxps_avx(auVar184,auVar204);
                  auVar184 = vminps_avx(auVar184,auVar209);
                  auVar185._0_4_ = auVar184._0_4_ * auVar181._0_4_;
                  auVar185._4_4_ = auVar184._4_4_ * auVar181._4_4_;
                  auVar185._8_4_ = auVar184._8_4_ * auVar181._8_4_;
                  auVar185._12_4_ = auVar184._12_4_ * auVar181._12_4_;
                  auVar181 = auVar185;
                }
                *(undefined1 (*) [16])pAVar158 = auVar181;
                pAVar158 = pAVar158 + 2;
                uVar163 = uVar163 + 1;
                iVar174 = iVar174 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar166 = iVar166 + 1;
          } while (iVar166 != local_228.h);
        }
        auVar181 = in_ZMM29._0_16_;
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_228.c);
    }
    afVar333 = _ps512_cephes_log_p8;
    afVar332 = _ps512_cephes_log_p7;
    afVar331 = _ps512_cephes_log_p6;
    afVar330 = _ps512_cephes_log_p5;
    afVar329 = _ps512_cephes_log_p4;
    afVar328 = _ps512_cephes_log_p3;
    afVar487 = _ps512_cephes_log_p2;
    afVar327 = _ps512_cephes_exp_p5;
    afVar326 = _ps512_cephes_exp_p4;
    afVar325 = _ps512_cephes_exp_p3;
    afVar324 = _ps512_cephes_exp_p2;
    afVar323 = _ps512_cephes_exp_p1;
    afVar322 = _ps512_cephes_exp_p0;
    afVar321 = _ps512_cephes_LOG2EF;
    afVar320 = _ps512_exp_lo;
    afVar319 = _ps512_exp_hi;
    afVar318 = _ps512_1;
    if (((iVar173 == 1) && (uVar146 == 0x10)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar8 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      uVar11 = *(undefined4 *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      pvVar176 = (void *)(ulong)uVar9;
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      in_ZMM20 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar341 = vxorps_avx512dq(in_ZMM20,(undefined1  [64])_ps512_cephes_log_q2);
      auVar342 = vxorps_avx512dq(in_ZMM20,(undefined1  [64])_ps512_cephes_log_q1);
      auVar343 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar344 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,in_ZMM20);
      local_2f8 = 0;
      auVar181 = vxorps_avx512vl(auVar181,auVar181);
      auVar287 = ZEXT1664(auVar181);
      auVar345 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar346 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar142 = bottom_blob->w;
          iVar175 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar166 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar174 = (1 - uVar9) * iVar8;
              do {
                if (lVar160 == 0) {
                  auVar288 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar288 = *(undefined1 (*) [64])(lVar160 + local_2f8 * 0x40);
                }
                if (0 < (int)uVar10) {
                  pvVar150 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      pvVar177 = (void *)0x0;
                      uVar162 = 0;
                      do {
                        iVar138 = (((int)uVar162 - uVar157) + 1) * iVar152 + iVar166;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar161, iVar138 % iVar161 == 0)
                            ) && ((iVar139 < iVar175 && (pvVar151 = pvVar176, 0 < (int)uVar9)))) {
                          pvVar168 = pvVar177;
                          iVar138 = iVar174;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar140 = iVar138 / iVar172, iVar138 % iVar172 == 0)) &&
                               (iVar140 < iVar142)) {
                              auVar289 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                     (long)iVar140 * 4 +
                                                                     (long)iVar139 *
                                                                     (long)bottom_blob->w *
                                                                     bottom_blob->elemsize +
                                                                     bottom_blob->cstep *
                                                                     bottom_blob->elemsize * uVar149
                                                                     )));
                              auVar288 = vfmadd231ps_avx512f(auVar288,auVar289,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar150 +
                                                              ((ulong)pvVar168 & 0xffffffff) * 4));
                            }
                            pvVar168 = (void *)((long)pvVar168 + 0x10);
                            iVar138 = iVar138 + iVar8;
                            pvVar151 = (void *)((long)pvVar151 - 1);
                          } while (pvVar151 != (void *)0x0);
                        }
                        uVar162 = uVar162 + 1;
                        pvVar177 = (void *)((long)pvVar177 + (long)pvVar176 * 0x10);
                      } while (uVar162 != uVar157);
                    }
                    pvVar150 = (void *)((long)pvVar150 + (long)(int)(uVar9 * uVar157 * 0x10) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                switch(uVar11) {
                case 1:
                  auVar288 = vmaxps_avx512f(auVar288,auVar287);
                  break;
                case 2:
                  uVar149 = vcmpps_avx512f(auVar288,auVar287,1);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar133._4_4_ = uVar2;
                  auVar133._0_4_ = uVar2;
                  auVar133._8_4_ = uVar2;
                  auVar133._12_4_ = uVar2;
                  auVar133._16_4_ = uVar2;
                  auVar133._20_4_ = uVar2;
                  auVar133._24_4_ = uVar2;
                  auVar133._28_4_ = uVar2;
                  auVar133._32_4_ = uVar2;
                  auVar133._36_4_ = uVar2;
                  auVar133._40_4_ = uVar2;
                  auVar133._44_4_ = uVar2;
                  auVar133._48_4_ = uVar2;
                  auVar133._52_4_ = uVar2;
                  auVar133._56_4_ = uVar2;
                  auVar133._60_4_ = uVar2;
                  auVar289 = vmulps_avx512f(auVar288,auVar133);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar314._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar288._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar314._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar288._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar314._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar288._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar314._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar288._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar314._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar288._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar314._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar288._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar314._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar288._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar314._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar288._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar314._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar288._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar314._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar288._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar314._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar288._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar314._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar288._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar314._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar288._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar314._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar288._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar314._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar288._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar314._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar288._60_4_
                  ;
                  auVar288 = auVar314;
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar131._4_4_ = uVar2;
                  auVar131._0_4_ = uVar2;
                  auVar131._8_4_ = uVar2;
                  auVar131._12_4_ = uVar2;
                  auVar131._16_4_ = uVar2;
                  auVar131._20_4_ = uVar2;
                  auVar131._24_4_ = uVar2;
                  auVar131._28_4_ = uVar2;
                  auVar131._32_4_ = uVar2;
                  auVar131._36_4_ = uVar2;
                  auVar131._40_4_ = uVar2;
                  auVar131._44_4_ = uVar2;
                  auVar131._48_4_ = uVar2;
                  auVar131._52_4_ = uVar2;
                  auVar131._56_4_ = uVar2;
                  auVar131._60_4_ = uVar2;
                  auVar288 = vmaxps_avx512f(auVar288,auVar131);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar132._4_4_ = uVar2;
                  auVar132._0_4_ = uVar2;
                  auVar132._8_4_ = uVar2;
                  auVar132._12_4_ = uVar2;
                  auVar132._16_4_ = uVar2;
                  auVar132._20_4_ = uVar2;
                  auVar132._24_4_ = uVar2;
                  auVar132._28_4_ = uVar2;
                  auVar132._32_4_ = uVar2;
                  auVar132._36_4_ = uVar2;
                  auVar132._40_4_ = uVar2;
                  auVar132._44_4_ = uVar2;
                  auVar132._48_4_ = uVar2;
                  auVar132._52_4_ = uVar2;
                  auVar132._56_4_ = uVar2;
                  auVar132._60_4_ = uVar2;
                  auVar288 = vminps_avx512f(auVar288,auVar132);
                  break;
                case 4:
                  auVar288 = vxorps_avx512dq(auVar288,in_ZMM20);
                  auVar288 = vminps_avx512f(auVar288,(undefined1  [64])afVar319);
                  auVar288 = vmaxps_avx512f(auVar288,(undefined1  [64])afVar320);
                  auVar289 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar288,
                                                 (undefined1  [64])afVar327);
                  auVar290 = vrndscaleps_avx512f(auVar289,1);
                  uVar149 = vcmpps_avx512f(auVar289,auVar290,1);
                  auVar289 = vsubps_avx512f(auVar290,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar313._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar290._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar313._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar290._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar313._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar290._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar313._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar290._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar313._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar290._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar313._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar290._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar313._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar290._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar313._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar290._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar313._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar290._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar313._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar290._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar313._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar290._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar313._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar290._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar313._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar290._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar313._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar290._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar313._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar290._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar313._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar290._60_4_
                  ;
                  auVar288 = vfmadd231ps_avx512f(auVar288,auVar313,auVar341);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar288,auVar313,auVar342);
                  auVar288 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar289 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar289 = vfmadd213ps_avx512f(auVar289,in_ZMM16,(undefined1  [64])afVar324);
                  auVar289 = vfmadd213ps_avx512f(auVar289,in_ZMM16,(undefined1  [64])afVar325);
                  auVar289 = vfmadd213ps_avx512f(auVar289,in_ZMM16,(undefined1  [64])afVar326);
                  auVar289 = vfmadd213ps_avx512f(auVar289,in_ZMM16,(undefined1  [64])afVar327);
                  auVar288 = vfmadd213ps_avx512f(auVar289,auVar288,in_ZMM16);
                  auVar288 = vaddps_avx512f(auVar288,(undefined1  [64])afVar318);
                  auVar289 = vcvttps2dq_avx512f(auVar313);
                  auVar289 = vpaddd_avx512f(auVar289,auVar343);
                  auVar289 = vpslld_avx512f(auVar289,0x17);
                  auVar288 = vfmadd213ps_avx512f(auVar289,auVar288,auVar345);
                  auVar289 = vrcp14ps_avx512f(auVar288);
                  auVar288 = vfmsub213ps_avx512f(auVar288,auVar289,auVar345);
                  auVar288 = vfnmadd132ps_avx512vl(auVar288,auVar289,auVar289);
                  break;
                case 5:
                  auVar289 = vminps_avx512f(auVar288,(undefined1  [64])afVar319);
                  auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar320);
                  auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar289,
                                                 (undefined1  [64])afVar327);
                  auVar291 = vrndscaleps_avx512f(auVar290,1);
                  uVar149 = vcmpps_avx512f(auVar290,auVar291,1);
                  auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar309._0_4_ = (uint)bVar24 * auVar290._0_4_ | (uint)!bVar24 * auVar291._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar309._4_4_ = (uint)bVar24 * auVar290._4_4_ | (uint)!bVar24 * auVar291._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar309._8_4_ = (uint)bVar24 * auVar290._8_4_ | (uint)!bVar24 * auVar291._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar309._12_4_ = (uint)bVar24 * auVar290._12_4_ | (uint)!bVar24 * auVar291._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar309._16_4_ = (uint)bVar24 * auVar290._16_4_ | (uint)!bVar24 * auVar291._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar309._20_4_ = (uint)bVar24 * auVar290._20_4_ | (uint)!bVar24 * auVar291._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar309._24_4_ = (uint)bVar24 * auVar290._24_4_ | (uint)!bVar24 * auVar291._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar309._28_4_ = (uint)bVar24 * auVar290._28_4_ | (uint)!bVar24 * auVar291._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  auVar309._32_4_ = (uint)bVar24 * auVar290._32_4_ | (uint)!bVar24 * auVar291._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar309._36_4_ = (uint)bVar24 * auVar290._36_4_ | (uint)!bVar24 * auVar291._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar309._40_4_ = (uint)bVar24 * auVar290._40_4_ | (uint)!bVar24 * auVar291._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar309._44_4_ = (uint)bVar24 * auVar290._44_4_ | (uint)!bVar24 * auVar291._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar309._48_4_ = (uint)bVar24 * auVar290._48_4_ | (uint)!bVar24 * auVar291._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar309._52_4_ = (uint)bVar24 * auVar290._52_4_ | (uint)!bVar24 * auVar291._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar309._56_4_ = (uint)bVar24 * auVar290._56_4_ | (uint)!bVar24 * auVar291._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar309._60_4_ = (uint)bVar24 * auVar290._60_4_ | (uint)!bVar24 * auVar291._60_4_
                  ;
                  auVar289 = vfmadd231ps_avx512f(auVar289,auVar309,auVar341);
                  auVar289 = vfmadd231ps_avx512f(auVar289,auVar309,auVar342);
                  auVar290 = vmulps_avx512f(auVar289,auVar289);
                  auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar324);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar325);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar326);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar327);
                  auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
                  auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar318);
                  auVar290 = vcvttps2dq_avx512f(auVar309);
                  auVar290 = vpaddd_avx512f(auVar290,auVar343);
                  auVar290 = vpslld_avx512f(auVar290,0x17);
                  auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar345);
                  auVar290 = vmaxps_avx512f(auVar289,(undefined1  [64])_ps512_min_norm_pos);
                  auVar291 = vpsrld_avx512f(auVar290,0x17);
                  auVar290 = vpternlogd_avx512f(auVar290,(undefined1  [64])afVar327,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar149 = vcmpps_avx512f(auVar290,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar292 = vsubps_avx512f(auVar290,(undefined1  [64])afVar318);
                  auVar290 = vaddps_avx512f(auVar292,auVar290);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar310._0_4_ = (uint)bVar24 * auVar290._0_4_ | (uint)!bVar24 * auVar292._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar310._4_4_ = (uint)bVar24 * auVar290._4_4_ | (uint)!bVar24 * auVar292._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar310._8_4_ = (uint)bVar24 * auVar290._8_4_ | (uint)!bVar24 * auVar292._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar310._12_4_ = (uint)bVar24 * auVar290._12_4_ | (uint)!bVar24 * auVar292._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar310._16_4_ = (uint)bVar24 * auVar290._16_4_ | (uint)!bVar24 * auVar292._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar310._20_4_ = (uint)bVar24 * auVar290._20_4_ | (uint)!bVar24 * auVar292._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar310._24_4_ = (uint)bVar24 * auVar290._24_4_ | (uint)!bVar24 * auVar292._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar310._28_4_ = (uint)bVar24 * auVar290._28_4_ | (uint)!bVar24 * auVar292._28_4_
                  ;
                  bVar32 = (byte)(uVar149 >> 8);
                  bVar24 = (bool)(bVar32 & 1);
                  auVar310._32_4_ = (uint)bVar24 * auVar290._32_4_ | (uint)!bVar24 * auVar292._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar310._36_4_ = (uint)bVar24 * auVar290._36_4_ | (uint)!bVar24 * auVar292._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar310._40_4_ = (uint)bVar24 * auVar290._40_4_ | (uint)!bVar24 * auVar292._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar310._44_4_ = (uint)bVar24 * auVar290._44_4_ | (uint)!bVar24 * auVar292._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar310._48_4_ = (uint)bVar24 * auVar290._48_4_ | (uint)!bVar24 * auVar292._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar310._52_4_ = (uint)bVar24 * auVar290._52_4_ | (uint)!bVar24 * auVar292._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar310._56_4_ = (uint)bVar24 * auVar290._56_4_ | (uint)!bVar24 * auVar292._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar310._60_4_ = (uint)bVar24 * auVar290._60_4_ | (uint)!bVar24 * auVar292._60_4_
                  ;
                  auVar290 = vmulps_avx512f(auVar310,auVar310);
                  auVar292 = vfmadd132ps_avx512f(auVar310,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar310,(undefined1  [64])afVar487);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar310,(undefined1  [64])afVar328);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar310,(undefined1  [64])afVar329);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar310,(undefined1  [64])afVar330);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar310,(undefined1  [64])afVar331);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar310,(undefined1  [64])afVar332);
                  auVar292 = vfmadd213ps_avx512f(auVar292,auVar310,(undefined1  [64])afVar333);
                  auVar293 = vmulps_avx512f(auVar290,auVar310);
                  auVar292 = vfmadd213ps_avx512f(auVar293,auVar292,auVar310);
                  uVar162 = vcmpps_avx512f(auVar289,auVar287,2);
                  auVar289 = vpsubd_avx512f(auVar291,auVar343);
                  auVar289 = vcvtdq2ps_avx512f(auVar289);
                  auVar291 = vaddps_avx512f(auVar289,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar311._0_4_ = (uint)bVar24 * auVar289._0_4_ | (uint)!bVar24 * auVar291._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar311._4_4_ = (uint)bVar24 * auVar289._4_4_ | (uint)!bVar24 * auVar291._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar311._8_4_ = (uint)bVar24 * auVar289._8_4_ | (uint)!bVar24 * auVar291._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar311._12_4_ = (uint)bVar24 * auVar289._12_4_ | (uint)!bVar24 * auVar291._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  auVar311._16_4_ = (uint)bVar24 * auVar289._16_4_ | (uint)!bVar24 * auVar291._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  auVar311._20_4_ = (uint)bVar24 * auVar289._20_4_ | (uint)!bVar24 * auVar291._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  auVar311._24_4_ = (uint)bVar24 * auVar289._24_4_ | (uint)!bVar24 * auVar291._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  auVar311._28_4_ = (uint)bVar24 * auVar289._28_4_ | (uint)!bVar24 * auVar291._28_4_
                  ;
                  bVar24 = (bool)(bVar32 & 1);
                  auVar311._32_4_ = (uint)bVar24 * auVar289._32_4_ | (uint)!bVar24 * auVar291._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  auVar311._36_4_ = (uint)bVar24 * auVar289._36_4_ | (uint)!bVar24 * auVar291._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  auVar311._40_4_ = (uint)bVar24 * auVar289._40_4_ | (uint)!bVar24 * auVar291._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  auVar311._44_4_ = (uint)bVar24 * auVar289._44_4_ | (uint)!bVar24 * auVar291._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  auVar311._48_4_ = (uint)bVar24 * auVar289._48_4_ | (uint)!bVar24 * auVar291._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  auVar311._52_4_ = (uint)bVar24 * auVar289._52_4_ | (uint)!bVar24 * auVar291._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  auVar311._56_4_ = (uint)bVar24 * auVar289._56_4_ | (uint)!bVar24 * auVar291._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  auVar311._60_4_ = (uint)bVar24 * auVar289._60_4_ | (uint)!bVar24 * auVar291._60_4_
                  ;
                  auVar289 = vfmadd231ps_avx512f(auVar292,auVar311,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar289 = vfmadd231ps_avx512f(auVar289,auVar344,auVar290);
                  auVar289 = vfmadd231ps_avx512f(auVar289,auVar311,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar289 = vmulps_avx512f(auVar289,auVar346);
                  auVar290 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar312._0_4_ = (uint)bVar24 * auVar290._0_4_ | (uint)!bVar24 * auVar289._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar312._4_4_ = (uint)bVar24 * auVar290._4_4_ | (uint)!bVar24 * auVar289._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar312._8_4_ = (uint)bVar24 * auVar290._8_4_ | (uint)!bVar24 * auVar289._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar312._12_4_ = (uint)bVar24 * auVar290._12_4_ | (uint)!bVar24 * auVar289._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                  auVar312._16_4_ = (uint)bVar24 * auVar290._16_4_ | (uint)!bVar24 * auVar289._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                  auVar312._20_4_ = (uint)bVar24 * auVar290._20_4_ | (uint)!bVar24 * auVar289._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                  auVar312._24_4_ = (uint)bVar24 * auVar290._24_4_ | (uint)!bVar24 * auVar289._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 7) & 1);
                  auVar312._28_4_ = (uint)bVar24 * auVar290._28_4_ | (uint)!bVar24 * auVar289._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 8) & 1);
                  auVar312._32_4_ = (uint)bVar24 * auVar290._32_4_ | (uint)!bVar24 * auVar289._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 9) & 1);
                  auVar312._36_4_ = (uint)bVar24 * auVar290._36_4_ | (uint)!bVar24 * auVar289._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 10) & 1);
                  auVar312._40_4_ = (uint)bVar24 * auVar290._40_4_ | (uint)!bVar24 * auVar289._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xb) & 1);
                  auVar312._44_4_ = (uint)bVar24 * auVar290._44_4_ | (uint)!bVar24 * auVar289._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xc) & 1);
                  auVar312._48_4_ = (uint)bVar24 * auVar290._48_4_ | (uint)!bVar24 * auVar289._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xd) & 1);
                  auVar312._52_4_ = (uint)bVar24 * auVar290._52_4_ | (uint)!bVar24 * auVar289._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar162 >> 0xe) & 1);
                  auVar312._56_4_ = (uint)bVar24 * auVar290._56_4_ | (uint)!bVar24 * auVar289._56_4_
                  ;
                  bVar24 = SUB81(uVar162 >> 0xf,0);
                  auVar312._60_4_ = (uint)bVar24 * auVar290._60_4_ | (uint)!bVar24 * auVar289._60_4_
                  ;
                  auVar289 = vminps_avx512f(auVar312,(undefined1  [64])afVar319);
                  auVar289 = vmaxps_avx512f(auVar289,(undefined1  [64])afVar320);
                  auVar290 = vfmadd213ps_avx512f((undefined1  [64])afVar321,auVar289,
                                                 (undefined1  [64])afVar327);
                  auVar291 = vrndscaleps_avx512f(auVar290,1);
                  uVar149 = vcmpps_avx512f(auVar290,auVar291,1);
                  auVar290 = vsubps_avx512f(auVar291,(undefined1  [64])afVar318);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  in_ZMM16._0_4_ = (uint)bVar24 * auVar290._0_4_ | (uint)!bVar24 * auVar291._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar24 * auVar290._4_4_ | (uint)!bVar24 * auVar291._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar24 * auVar290._8_4_ | (uint)!bVar24 * auVar291._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar24 * auVar290._12_4_ | (uint)!bVar24 * auVar291._12_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar24 * auVar290._16_4_ | (uint)!bVar24 * auVar291._16_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar24 * auVar290._20_4_ | (uint)!bVar24 * auVar291._20_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar24 * auVar290._24_4_ | (uint)!bVar24 * auVar291._24_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar24 * auVar290._28_4_ | (uint)!bVar24 * auVar291._28_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar24 * auVar290._32_4_ | (uint)!bVar24 * auVar291._32_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar24 * auVar290._36_4_ | (uint)!bVar24 * auVar291._36_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar24 * auVar290._40_4_ | (uint)!bVar24 * auVar291._40_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar24 * auVar290._44_4_ | (uint)!bVar24 * auVar291._44_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar24 * auVar290._48_4_ | (uint)!bVar24 * auVar291._48_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar24 * auVar290._52_4_ | (uint)!bVar24 * auVar291._52_4_
                  ;
                  bVar24 = (bool)((byte)(uVar149 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar24 * auVar290._56_4_ | (uint)!bVar24 * auVar291._56_4_
                  ;
                  bVar24 = SUB81(uVar149 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar24 * auVar290._60_4_ | (uint)!bVar24 * auVar291._60_4_
                  ;
                  auVar289 = vfmadd231ps_avx512f(auVar289,in_ZMM16,auVar341);
                  auVar289 = vfmadd231ps_avx512f(auVar289,in_ZMM16,auVar342);
                  auVar290 = vmulps_avx512f(auVar289,auVar289);
                  auVar291 = vfmadd213ps_avx512f(auVar289,(undefined1  [64])afVar322,
                                                 (undefined1  [64])afVar323);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar324);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar325);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar326);
                  auVar291 = vfmadd213ps_avx512f(auVar291,auVar289,(undefined1  [64])afVar327);
                  auVar289 = vfmadd213ps_avx512f(auVar291,auVar290,auVar289);
                  auVar289 = vaddps_avx512f(auVar289,(undefined1  [64])afVar318);
                  auVar290 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar290 = vpaddd_avx512f(auVar290,auVar343);
                  auVar290 = vpslld_avx512f(auVar290,0x17);
                  auVar289 = vfmadd213ps_avx512f(auVar290,auVar289,auVar345);
                  auVar290 = vrcp14ps_avx512f(auVar289);
                  auVar289 = vfmsub213ps_avx512f(auVar289,auVar290,auVar345);
                  auVar289 = vfnmadd132ps_avx512vl(auVar289,auVar290,auVar290);
                  auVar289 = vfnmsub213ps_avx512f(auVar289,auVar346,auVar345);
                  auVar288 = vmulps_avx512f(auVar289,auVar288);
                  break;
                case 6:
                  auVar289 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var13)));
                  uVar12 = (*(uint **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar130._4_4_ = uVar12;
                  auVar130._0_4_ = uVar12;
                  auVar130._8_4_ = uVar12;
                  auVar130._12_4_ = uVar12;
                  auVar130._16_4_ = uVar12;
                  auVar130._20_4_ = uVar12;
                  auVar130._24_4_ = uVar12;
                  auVar130._28_4_ = uVar12;
                  auVar130._32_4_ = uVar12;
                  auVar130._36_4_ = uVar12;
                  auVar130._40_4_ = uVar12;
                  auVar130._44_4_ = uVar12;
                  auVar130._48_4_ = uVar12;
                  auVar130._52_4_ = uVar12;
                  auVar130._56_4_ = uVar12;
                  auVar130._60_4_ = uVar12;
                  auVar289 = vfmadd213ps_avx512f(auVar289,auVar288,auVar130);
                  auVar289 = vmaxps_avx512f(auVar289,auVar287);
                  auVar289 = vminps_avx512f(auVar289,auVar345);
                  auVar288 = vmulps_avx512f(auVar289,auVar288);
                }
                *(undefined1 (*) [64])pAVar158 = auVar288;
                pAVar158 = pAVar158 + 8;
                uVar163 = uVar163 + 1;
                iVar174 = iVar174 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar166 = iVar166 + 1;
          } while (iVar166 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
        in_ZMM13 = afVar325;
        in_ZMM21 = afVar487;
      } while (local_2f8 != local_228.c);
    }
    if (((iVar173 == 0x10) && (uVar146 == 1)) && (local_1d0 = (long)local_228.c, 0 < local_1d0)) {
      p_Var13 = local_1e0[-3];
      uVar9 = *(uint *)(&this->field_0xdc + (long)p_Var13);
      pvVar151 = (void *)(ulong)uVar9;
      iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar8;
      iVar152 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar157 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      local_188 = (Allocator *)
                  (CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize) * local_228.cstep);
      local_180 = (Allocator *)local_228.data;
      uVar163 = bottom_blob->w;
      pvVar168 = (void *)(ulong)uVar163;
      iVar142 = bottom_blob->h;
      uVar12 = bottom_blob->c;
      local_168._0_4_ = local_228.h;
      local_2f8 = 0;
      do {
        if (0 < (int)local_168._0_4_) {
          sVar15 = (this->weight_data_tm).cstep;
          sVar16 = (this->weight_data_tm).elemsize;
          local_2d0 = (Allocator *)((long)&local_180->_vptr_Allocator + (long)local_188 * local_2f8)
          ;
          pvVar176 = (this->weight_data_tm).data;
          iVar175 = 0;
          do {
            if (0 < iVar145) {
              iVar174 = bottom_blob->w;
              pvVar150 = bottom_blob->data;
              sVar17 = bottom_blob->elemsize;
              sVar18 = bottom_blob->cstep;
              local_1c8._0_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var13);
              uVar148 = 0;
              iVar166 = (1 - uVar157) * uVar9;
              do {
                if (lVar160 == 0) {
                  fVar357 = 0.0;
                }
                else {
                  fVar357 = *(float *)(lVar160 + local_2f8 * 4);
                }
                if ((int)uVar12 < 1) {
                  auVar341 = ZEXT864(0);
                }
                else {
                  auVar341 = ZEXT864(0);
                  uVar149 = 0;
                  pvVar177 = (void *)(sVar15 * local_2f8 * sVar16 + (long)pvVar176);
                  do {
                    if (0 < (int)uVar10) {
                      uVar147 = 0;
                      uVar162 = 0;
                      do {
                        iVar138 = (((int)uVar162 - uVar10) + 1) * iVar8 + iVar175;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar172, iVar138 % iVar172 == 0)
                            ) && ((0 < (int)uVar157 && (iVar139 < iVar142)))) {
                          uVar164 = (ulong)uVar157;
                          uVar155 = uVar147;
                          iVar138 = iVar166;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar140 = iVar138 / iVar152, iVar138 % iVar152 == 0)) &&
                               (iVar140 < (int)uVar163)) {
                              auVar341 = vfmadd231ps_avx512f(auVar341,*(undefined1 (*) [64])
                                                                       ((long)pvVar150 +
                                                                       (long)(iVar140 << 4) * 4 +
                                                                       (long)iVar139 *
                                                                       (long)iVar174 * sVar17 +
                                                                       sVar18 * sVar17 * uVar149),
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar177 +
                                                              (uVar155 & 0xffffffff) * 4));
                            }
                            uVar155 = uVar155 + 0x10;
                            iVar138 = iVar138 + uVar9;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar162 = uVar162 + 1;
                        uVar147 = uVar147 + (ulong)uVar157 * 0x10;
                      } while (uVar162 != uVar10);
                    }
                    pvVar177 = (void *)((long)pvVar177 + (long)(int)(uVar157 * uVar10 * 0x10) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar12);
                }
                auVar235 = vextractf64x4_avx512f(auVar341,1);
                fVar372 = auVar341._4_4_ + auVar235._4_4_;
                auVar182._0_4_ = auVar341._0_4_ + auVar235._0_4_ + auVar341._16_4_ + auVar235._16_4_
                ;
                auVar182._4_4_ = fVar372 + fVar372;
                auVar182._8_4_ = auVar341._8_4_ + auVar235._8_4_ + auVar341._24_4_ + auVar235._24_4_
                ;
                auVar182._12_4_ =
                     auVar341._12_4_ + auVar235._12_4_ + auVar341._28_4_ + auVar235._28_4_;
                auVar181 = vshufpd_avx(auVar182,auVar182,1);
                auVar183._0_4_ = auVar181._0_4_ + auVar182._0_4_;
                auVar183._4_4_ = auVar181._4_4_ + auVar182._4_4_;
                auVar183._8_4_ = auVar181._8_4_ + auVar182._8_4_;
                auVar183._12_4_ = auVar181._12_4_ + auVar182._12_4_;
                auVar181 = vmovshdup_avx(auVar183);
                fVar357 = auVar181._0_4_ + fVar357 + auVar183._0_4_;
                auVar181 = ZEXT416((uint)fVar357);
                fVar372 = fVar357;
                if (iVar161 - 1U < 6) {
                  switch(iVar161) {
                  case 1:
                    auVar181 = vmaxss_avx(ZEXT416((uint)fVar357),ZEXT416(0));
                    fVar372 = auVar181._0_4_;
                    break;
                  case 2:
                    uVar42 = vcmpss_avx512f(ZEXT416((uint)fVar357),ZEXT416(0),0xe);
                    bVar24 = (bool)((byte)uVar42 & 1);
                    fVar372 = (float)((uint)bVar24 * 0x3f800000 +
                                     (uint)!bVar24 * (int)*(float *)local_1c8._0_8_) * fVar357;
                    break;
                  case 3:
                    auVar181 = vmaxss_avx(auVar181,ZEXT416((uint)*(float *)local_1c8._0_8_));
                    fVar372 = auVar181._0_4_;
                    if (*(float *)(local_1c8._0_8_ + 4) < auVar181._0_4_) {
                      fVar372 = *(float *)(local_1c8._0_8_ + 4);
                    }
                    break;
                  case 4:
                    auVar181 = vminss_avx(auVar181,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar51._8_4_ = 0x80000000;
                    auVar51._0_8_ = 0x8000000080000000;
                    auVar51._12_4_ = 0x80000000;
                    auVar182 = vxorps_avx512vl(auVar181,auVar51);
                    uVar42 = vcmpss_avx512f(auVar181,ZEXT416(0xc2b0c0a5),1);
                    bVar24 = (bool)((byte)uVar42 & 1);
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar357 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                          (uint)!bVar24 * auVar182._0_4_));
                    fVar372 = 1.0 / (fVar357 + 1.0);
                    break;
                  case 5:
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar372 = expf(fVar357);
                    fVar372 = logf(fVar372 + 1.0);
                    fVar372 = tanhf(fVar372);
                    fVar372 = fVar372 * fVar357;
                    break;
                  case 6:
                    fVar3 = *(float *)local_1c8._0_8_;
                    auVar204._8_4_ = 0x80000000;
                    auVar204._0_8_ = 0x8000000080000000;
                    auVar204._12_4_ = 0x80000000;
                    auVar182 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)),
                                               auVar204);
                    fVar379 = auVar182._0_4_ / fVar3;
                    fVar372 = 0.0;
                    if ((fVar379 <= fVar357) &&
                       (fVar372 = fVar357, fVar357 <= fVar379 + 1.0 / fVar3)) {
                      auVar181 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar181,
                                                 ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)));
                      fVar372 = auVar181._0_4_ * fVar357;
                    }
                  }
                }
                *(float *)&local_2d0->_vptr_Allocator = fVar372;
                local_2d0 = (Allocator *)((long)&local_2d0->_vptr_Allocator + 4);
                uVar148 = uVar148 + 1;
                iVar166 = iVar166 + 1;
              } while (uVar148 != iVar145);
            }
            iVar175 = iVar175 + 1;
          } while (iVar175 != local_168._0_4_);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_1d0);
    }
    iVar8 = local_228.w;
    if (((iVar173 == 8) && (uVar146 == 8)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar145 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      iVar142 = *(int *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      local_2f8 = 0;
      auVar376._8_4_ = 0x42b0c0a5;
      auVar376._0_8_ = 0x42b0c0a542b0c0a5;
      auVar376._12_4_ = 0x42b0c0a5;
      auVar376._16_4_ = 0x42b0c0a5;
      auVar376._20_4_ = 0x42b0c0a5;
      auVar376._24_4_ = 0x42b0c0a5;
      auVar376._28_4_ = 0x42b0c0a5;
      auVar383._8_4_ = 0xc2b0c0a5;
      auVar383._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar383._12_4_ = 0xc2b0c0a5;
      auVar383._16_4_ = 0xc2b0c0a5;
      auVar383._20_4_ = 0xc2b0c0a5;
      auVar383._24_4_ = 0xc2b0c0a5;
      auVar383._28_4_ = 0xc2b0c0a5;
      auVar389._8_4_ = 0x3f000000;
      auVar389._0_8_ = 0x3f0000003f000000;
      auVar389._12_4_ = 0x3f000000;
      auVar389._16_4_ = 0x3f000000;
      auVar389._20_4_ = 0x3f000000;
      auVar389._24_4_ = 0x3f000000;
      auVar389._28_4_ = 0x3f000000;
      auVar395._8_4_ = 0x3fb8aa3b;
      auVar395._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar395._12_4_ = 0x3fb8aa3b;
      auVar395._16_4_ = 0x3fb8aa3b;
      auVar395._20_4_ = 0x3fb8aa3b;
      auVar395._24_4_ = 0x3fb8aa3b;
      auVar395._28_4_ = 0x3fb8aa3b;
      auVar401._8_4_ = 0x3f800000;
      auVar401._0_8_ = 0x3f8000003f800000;
      auVar401._12_4_ = 0x3f800000;
      auVar401._16_4_ = 0x3f800000;
      auVar401._20_4_ = 0x3f800000;
      auVar401._24_4_ = 0x3f800000;
      auVar401._28_4_ = 0x3f800000;
      auVar407._8_4_ = 0x3f318000;
      auVar407._0_8_ = 0x3f3180003f318000;
      auVar407._12_4_ = 0x3f318000;
      auVar407._16_4_ = 0x3f318000;
      auVar407._20_4_ = 0x3f318000;
      auVar407._24_4_ = 0x3f318000;
      auVar407._28_4_ = 0x3f318000;
      auVar235 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar466._8_4_ = 0x3ab743ce;
      auVar466._0_8_ = 0x3ab743ce3ab743ce;
      auVar466._12_4_ = 0x3ab743ce;
      auVar466._16_4_ = 0x3ab743ce;
      auVar466._20_4_ = 0x3ab743ce;
      auVar466._24_4_ = 0x3ab743ce;
      auVar466._28_4_ = 0x3ab743ce;
      auVar472._8_4_ = 0x3c088908;
      auVar472._0_8_ = 0x3c0889083c088908;
      auVar472._12_4_ = 0x3c088908;
      auVar472._16_4_ = 0x3c088908;
      auVar472._20_4_ = 0x3c088908;
      auVar472._24_4_ = 0x3c088908;
      auVar472._28_4_ = 0x3c088908;
      auVar478._8_4_ = 0x3d2aa9c1;
      auVar478._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar478._12_4_ = 0x3d2aa9c1;
      auVar478._16_4_ = 0x3d2aa9c1;
      auVar478._20_4_ = 0x3d2aa9c1;
      auVar478._24_4_ = 0x3d2aa9c1;
      auVar478._28_4_ = 0x3d2aa9c1;
      auVar484._8_4_ = 0x3e2aaaaa;
      auVar484._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar484._12_4_ = 0x3e2aaaaa;
      auVar484._16_4_ = 0x3e2aaaaa;
      auVar484._20_4_ = 0x3e2aaaaa;
      auVar484._24_4_ = 0x3e2aaaaa;
      auVar484._28_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT3264(auVar484);
      auVar491._8_4_ = 0x3f800000;
      auVar491._0_8_ = 0x3f8000003f800000;
      auVar491._12_4_ = 0x3f800000;
      auVar491._16_4_ = 0x3f800000;
      auVar491._20_4_ = 0x3f800000;
      auVar491._24_4_ = 0x3f800000;
      auVar491._28_4_ = 0x3f800000;
      auVar497._8_4_ = 0xb95e8083;
      auVar497._0_8_ = 0xb95e8083b95e8083;
      auVar497._12_4_ = 0xb95e8083;
      auVar497._16_4_ = 0xb95e8083;
      auVar497._20_4_ = 0xb95e8083;
      auVar497._24_4_ = 0xb95e8083;
      auVar497._28_4_ = 0xb95e8083;
      auVar236 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT3264(auVar236);
      auVar257 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar258 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar259 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar260 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar261 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar262 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar263 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar264 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar175 = bottom_blob->w;
          iVar166 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar174 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar138 = (1 - uVar9) * iVar145;
              do {
                if (lVar160 == 0) {
                  auVar341 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar341 = ZEXT3264(*(undefined1 (*) [32])(lVar160 + local_2f8 * 0x20));
                }
                if (0 < (int)uVar10) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar150 = bottom_blob->data;
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      uVar162 = 0;
                      pvVar168 = (void *)0x0;
                      do {
                        iVar139 = (((int)pvVar168 - uVar157) + 1) * iVar152 + iVar174;
                        if (((-1 < iVar139) && (iVar140 = iVar139 / iVar161, iVar139 % iVar161 == 0)
                            ) && ((0 < (int)uVar9 && (iVar140 < iVar166)))) {
                          lVar159 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                          pvVar151 = (void *)(ulong)uVar9;
                          uVar147 = uVar162;
                          iVar139 = iVar138;
                          do {
                            if (((-1 < iVar139) &&
                                (iVar140 = iVar139 / iVar172, iVar139 % iVar172 == 0)) &&
                               (iVar140 < iVar175)) {
                              lVar143 = (long)(iVar140 << 3);
                              uVar11 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159);
                              auVar428._4_4_ = uVar11;
                              auVar428._0_4_ = uVar11;
                              auVar428._8_4_ = uVar11;
                              auVar428._12_4_ = uVar11;
                              auVar428._16_4_ = uVar11;
                              auVar428._20_4_ = uVar11;
                              auVar428._24_4_ = uVar11;
                              auVar428._28_4_ = uVar11;
                              uVar11 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159 + 4);
                              auVar455._4_4_ = uVar11;
                              auVar455._0_4_ = uVar11;
                              auVar455._8_4_ = uVar11;
                              auVar455._12_4_ = uVar11;
                              auVar455._16_4_ = uVar11;
                              auVar455._20_4_ = uVar11;
                              auVar455._24_4_ = uVar11;
                              auVar455._28_4_ = uVar11;
                              auVar265 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 8)));
                              in_ZMM16 = ZEXT3264(auVar265);
                              auVar266 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0xc)));
                              auVar267 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x10)))
                              ;
                              auVar268 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x14)))
                              ;
                              in_ZMM20 = ZEXT3264(auVar268);
                              auVar237 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x18)))
                              ;
                              auVar238 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x1c)))
                              ;
                              uVar164 = uVar147 & 0xffffffff;
                              auVar181 = vfmadd231ps_fma(auVar341._0_32_,auVar428,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar176 + uVar164 * 4));
                              auVar181 = vfmadd231ps_fma(ZEXT1632(auVar181),auVar455,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar176 + uVar164 * 4 + 0x20));
                              auVar265 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar181),auVar265,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x40));
                              auVar265 = vfmadd231ps_avx512vl
                                                   (auVar265,auVar266,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x60));
                              auVar265 = vfmadd231ps_avx512vl
                                                   (auVar265,auVar267,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x80));
                              auVar265 = vfmadd231ps_avx512vl
                                                   (auVar265,auVar268,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar164 * 4 + 0xa0));
                              auVar265 = vfmadd231ps_avx512vl
                                                   (auVar265,auVar237,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar164 * 4 + 0xc0));
                              auVar265 = vfmadd231ps_avx512vl
                                                   (auVar265,auVar238,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar164 * 4 + 0xe0));
                              auVar341 = ZEXT3264(auVar265);
                            }
                            uVar147 = uVar147 + 0x40;
                            iVar139 = iVar139 + iVar145;
                            pvVar151 = (void *)((long)pvVar151 - 1);
                          } while (pvVar151 != (void *)0x0);
                        }
                        pvVar168 = (void *)((long)pvVar168 + 1);
                        uVar162 = uVar162 + (long)(ulong)uVar9 * 0x40;
                      } while (pvVar168 != (void *)(ulong)uVar157);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar9 * uVar157 * 0x40) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                auVar265 = auVar341._0_32_;
                if (iVar142 - 1U < 6) {
                  auVar266 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar344._28_36_ = auVar341._28_36_;
                  switch(iVar142) {
                  case 1:
                    auVar265 = vmaxps_avx(auVar265,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar267 = vmaxps_avx(auVar265,auVar266);
                    auVar265 = vminps_avx(auVar265,auVar266);
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar104._4_4_ = uVar11;
                    auVar104._0_4_ = uVar11;
                    auVar104._8_4_ = uVar11;
                    auVar104._12_4_ = uVar11;
                    auVar104._16_4_ = uVar11;
                    auVar104._20_4_ = uVar11;
                    auVar104._24_4_ = uVar11;
                    auVar104._28_4_ = uVar11;
                    auVar265 = vfmadd132ps_avx512vl(auVar265,auVar267,auVar104);
                    break;
                  case 3:
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar102._4_4_ = uVar11;
                    auVar102._0_4_ = uVar11;
                    auVar102._8_4_ = uVar11;
                    auVar102._12_4_ = uVar11;
                    auVar102._16_4_ = uVar11;
                    auVar102._20_4_ = uVar11;
                    auVar102._24_4_ = uVar11;
                    auVar102._28_4_ = uVar11;
                    auVar265 = vmaxps_avx512vl(auVar265,auVar102);
                    uVar11 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                    auVar103._4_4_ = uVar11;
                    auVar103._0_4_ = uVar11;
                    auVar103._8_4_ = uVar11;
                    auVar103._12_4_ = uVar11;
                    auVar103._16_4_ = uVar11;
                    auVar103._20_4_ = uVar11;
                    auVar103._24_4_ = uVar11;
                    auVar103._28_4_ = uVar11;
                    auVar265 = vminps_avx512vl(auVar265,auVar103);
                    break;
                  case 4:
                    auVar100._8_4_ = 0x80000000;
                    auVar100._0_8_ = 0x8000000080000000;
                    auVar100._12_4_ = 0x80000000;
                    auVar100._16_4_ = 0x80000000;
                    auVar100._20_4_ = 0x80000000;
                    auVar100._24_4_ = 0x80000000;
                    auVar100._28_4_ = 0x80000000;
                    auVar265 = vxorps_avx512vl(auVar265,auVar100);
                    auVar265 = vminps_avx(auVar265,auVar376);
                    auVar265 = vmaxps_avx(auVar265,auVar383);
                    auVar181 = vfmadd231ps_fma(auVar389,auVar265,auVar395);
                    auVar266 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar266,1);
                    auVar267 = vsubps_avx512vl(auVar266,auVar401);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar274._0_4_ = (uint)bVar24 * auVar267._0_4_ | (uint)!bVar24 * auVar266._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar274._4_4_ = (uint)bVar24 * auVar267._4_4_ | (uint)!bVar24 * auVar266._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar274._8_4_ = (uint)bVar24 * auVar267._8_4_ | (uint)!bVar24 * auVar266._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar274._12_4_ =
                         (uint)bVar24 * auVar267._12_4_ | (uint)!bVar24 * auVar266._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar274._16_4_ =
                         (uint)bVar24 * auVar267._16_4_ | (uint)!bVar24 * auVar266._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar274._20_4_ =
                         (uint)bVar24 * auVar267._20_4_ | (uint)!bVar24 * auVar266._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar274._24_4_ =
                         (uint)bVar24 * auVar267._24_4_ | (uint)!bVar24 * auVar266._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar274._28_4_ =
                         (uint)bVar24 * auVar267._28_4_ | (uint)!bVar24 * auVar266._28_4_;
                    in_ZMM16 = ZEXT3264(auVar274);
                    auVar265 = vfmsub231ps_avx512vl(auVar265,auVar274,auVar407);
                    auVar101._8_4_ = 0x395e8083;
                    auVar101._0_8_ = 0x395e8083395e8083;
                    auVar101._12_4_ = 0x395e8083;
                    auVar101._16_4_ = 0x395e8083;
                    auVar101._20_4_ = 0x395e8083;
                    auVar101._24_4_ = 0x395e8083;
                    auVar101._28_4_ = 0x395e8083;
                    auVar265 = vfmsub231ps_avx512vl(auVar265,auVar274,auVar101);
                    auVar429._0_4_ = auVar265._0_4_ * auVar265._0_4_;
                    auVar429._4_4_ = auVar265._4_4_ * auVar265._4_4_;
                    auVar429._8_4_ = auVar265._8_4_ * auVar265._8_4_;
                    auVar429._12_4_ = auVar265._12_4_ * auVar265._12_4_;
                    auVar429._16_4_ = auVar265._16_4_ * auVar265._16_4_;
                    auVar429._20_4_ = auVar265._20_4_ * auVar265._20_4_;
                    auVar429._24_4_ = auVar265._24_4_ * auVar265._24_4_;
                    auVar429._28_4_ = 0;
                    auVar181 = vfmadd213ps_fma(auVar235,auVar265,auVar466);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar265,auVar472);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar265,auVar478);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar265,auVar484);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar265,auVar389);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar429,auVar265);
                    auVar430._0_4_ = auVar181._0_4_ + 1.0;
                    auVar430._4_4_ = auVar181._4_4_ + 1.0;
                    auVar430._8_4_ = auVar181._8_4_ + 1.0;
                    auVar430._12_4_ = auVar181._12_4_ + 1.0;
                    auVar430._16_4_ = 0x3f800000;
                    auVar430._20_4_ = 0x3f800000;
                    auVar430._24_4_ = 0x3f800000;
                    auVar430._28_4_ = 0x3f800000;
                    auVar265 = vcvttps2dq_avx512vl(auVar274);
                    auVar265 = vpslld_avx2(auVar265,0x17);
                    auVar265 = vpaddd_avx2(auVar491,auVar265);
                    auVar181 = vfmadd213ps_fma(auVar265,auVar430,auVar401);
                    auVar265 = vrcpps_avx(ZEXT1632(auVar181));
                    auVar181 = vfmsub213ps_fma(ZEXT1632(auVar181),auVar265,auVar401);
                    auVar181 = vfnmadd132ps_fma(ZEXT1632(auVar181),auVar265,auVar265);
                    auVar265 = ZEXT1632(auVar181);
                    break;
                  case 5:
                    auVar265 = vminps_avx(auVar265,auVar376);
                    auVar265 = vmaxps_avx(auVar265,auVar383);
                    auVar181 = vfmadd213ps_fma(auVar395,auVar265,auVar389);
                    auVar267 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar267,1);
                    auVar268 = vsubps_avx512vl(auVar267,auVar401);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar269._0_4_ = (uint)bVar24 * auVar268._0_4_ | (uint)!bVar24 * auVar267._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar269._4_4_ = (uint)bVar24 * auVar268._4_4_ | (uint)!bVar24 * auVar267._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar269._8_4_ = (uint)bVar24 * auVar268._8_4_ | (uint)!bVar24 * auVar267._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar269._12_4_ =
                         (uint)bVar24 * auVar268._12_4_ | (uint)!bVar24 * auVar267._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar269._16_4_ =
                         (uint)bVar24 * auVar268._16_4_ | (uint)!bVar24 * auVar267._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar269._20_4_ =
                         (uint)bVar24 * auVar268._20_4_ | (uint)!bVar24 * auVar267._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar269._24_4_ =
                         (uint)bVar24 * auVar268._24_4_ | (uint)!bVar24 * auVar267._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar269._28_4_ =
                         (uint)bVar24 * auVar268._28_4_ | (uint)!bVar24 * auVar267._28_4_;
                    auVar265 = vfmsub231ps_avx512vl(auVar265,auVar269,auVar407);
                    auVar265 = vfnmsub231ps_avx512vl(auVar265,auVar269,auVar497);
                    auVar456._0_4_ = auVar265._0_4_ * auVar265._0_4_;
                    auVar456._4_4_ = auVar265._4_4_ * auVar265._4_4_;
                    auVar456._8_4_ = auVar265._8_4_ * auVar265._8_4_;
                    auVar456._12_4_ = auVar265._12_4_ * auVar265._12_4_;
                    auVar456._16_4_ = auVar265._16_4_ * auVar265._16_4_;
                    auVar456._20_4_ = auVar265._20_4_ * auVar265._20_4_;
                    auVar456._24_4_ = auVar265._24_4_ * auVar265._24_4_;
                    auVar456._28_4_ = 0;
                    auVar267 = vfmadd213ps_avx512vl(auVar235,auVar265,auVar466);
                    auVar267 = vfmadd213ps_avx512vl(auVar267,auVar265,auVar472);
                    auVar267 = vfmadd213ps_avx512vl(auVar267,auVar265,auVar478);
                    auVar267 = vfmadd213ps_avx512vl(auVar267,auVar265,auVar484);
                    auVar267 = vfmadd213ps_avx512vl(auVar267,auVar265,auVar389);
                    auVar265 = vfmadd213ps_avx512vl(auVar267,auVar456,auVar265);
                    auVar267 = vaddps_avx512vl(auVar265,auVar401);
                    auVar265 = vcvttps2dq_avx512vl(auVar269);
                    auVar265 = vpslld_avx2(auVar265,0x17);
                    auVar265 = vpaddd_avx2(auVar265,auVar491);
                    auVar181 = vfmadd213ps_fma(auVar265,auVar267,auVar401);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar266,2);
                    auVar94._8_4_ = 0x800000;
                    auVar94._0_8_ = 0x80000000800000;
                    auVar94._12_4_ = 0x800000;
                    auVar94._16_4_ = 0x800000;
                    auVar94._20_4_ = 0x800000;
                    auVar94._24_4_ = 0x800000;
                    auVar94._28_4_ = 0x800000;
                    auVar265 = vmaxps_avx512vl(ZEXT1632(auVar181),auVar94);
                    auVar268 = vpsrld_avx2(auVar265,0x17);
                    auVar266 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar95._8_4_ = 0x3f000000;
                    auVar95._0_8_ = 0x3f0000003f000000;
                    auVar95._12_4_ = 0x3f000000;
                    auVar95._16_4_ = 0x3f000000;
                    auVar95._20_4_ = 0x3f000000;
                    auVar95._24_4_ = 0x3f000000;
                    auVar95._28_4_ = 0x3f000000;
                    auVar265 = vpternlogd_avx512vl(auVar265,auVar266,auVar95,0xea);
                    auVar96._8_4_ = 0x3f3504f3;
                    auVar96._0_8_ = 0x3f3504f33f3504f3;
                    auVar96._12_4_ = 0x3f3504f3;
                    auVar96._16_4_ = 0x3f3504f3;
                    auVar96._20_4_ = 0x3f3504f3;
                    auVar96._24_4_ = 0x3f3504f3;
                    auVar96._28_4_ = 0x3f3504f3;
                    uVar162 = vcmpps_avx512vl(auVar265,auVar96,1);
                    auVar266 = vaddps_avx512vl(auVar265,auVar236);
                    auVar265 = vaddps_avx512vl(auVar266,auVar265);
                    bVar24 = (bool)((byte)uVar162 & 1);
                    auVar270._0_4_ = (uint)bVar24 * auVar265._0_4_ | (uint)!bVar24 * auVar266._0_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                    auVar270._4_4_ = (uint)bVar24 * auVar265._4_4_ | (uint)!bVar24 * auVar266._4_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                    auVar270._8_4_ = (uint)bVar24 * auVar265._8_4_ | (uint)!bVar24 * auVar266._8_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                    auVar270._12_4_ =
                         (uint)bVar24 * auVar265._12_4_ | (uint)!bVar24 * auVar266._12_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                    auVar270._16_4_ =
                         (uint)bVar24 * auVar265._16_4_ | (uint)!bVar24 * auVar266._16_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                    auVar270._20_4_ =
                         (uint)bVar24 * auVar265._20_4_ | (uint)!bVar24 * auVar266._20_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                    auVar270._24_4_ =
                         (uint)bVar24 * auVar265._24_4_ | (uint)!bVar24 * auVar266._24_4_;
                    bVar24 = SUB81(uVar162 >> 7,0);
                    auVar270._28_4_ =
                         (uint)bVar24 * auVar265._28_4_ | (uint)!bVar24 * auVar266._28_4_;
                    auVar266 = vmulps_avx512vl(auVar270,auVar270);
                    auVar97._8_4_ = 0xbdebd1b8;
                    auVar97._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar97._12_4_ = 0xbdebd1b8;
                    auVar97._16_4_ = 0xbdebd1b8;
                    auVar97._20_4_ = 0xbdebd1b8;
                    auVar97._24_4_ = 0xbdebd1b8;
                    auVar97._28_4_ = 0xbdebd1b8;
                    auVar265 = vfmadd213ps_avx512vl(auVar257,auVar270,auVar97);
                    auVar98._8_4_ = 0x3def251a;
                    auVar98._0_8_ = 0x3def251a3def251a;
                    auVar98._12_4_ = 0x3def251a;
                    auVar98._16_4_ = 0x3def251a;
                    auVar98._20_4_ = 0x3def251a;
                    auVar98._24_4_ = 0x3def251a;
                    auVar98._28_4_ = 0x3def251a;
                    auVar265 = vfmadd213ps_avx512vl(auVar265,auVar270,auVar98);
                    auVar265 = vfmadd213ps_avx512vl(auVar265,auVar270,auVar258);
                    auVar265 = vfmadd213ps_avx512vl(auVar265,auVar270,auVar259);
                    auVar265 = vfmadd213ps_avx512vl(auVar265,auVar270,auVar260);
                    auVar265 = vfmadd213ps_avx512vl(auVar265,auVar270,auVar261);
                    auVar265 = vfmadd213ps_avx512vl(auVar265,auVar270,auVar262);
                    auVar265 = vfmadd213ps_avx512vl(auVar265,auVar270,auVar263);
                    auVar267 = vmulps_avx512vl(auVar266,auVar270);
                    auVar267 = vmulps_avx512vl(auVar267,auVar265);
                    auVar99._8_4_ = 0xffffff82;
                    auVar99._0_8_ = 0xffffff82ffffff82;
                    auVar99._12_4_ = 0xffffff82;
                    auVar99._16_4_ = 0xffffff82;
                    auVar99._20_4_ = 0xffffff82;
                    auVar99._24_4_ = 0xffffff82;
                    auVar99._28_4_ = 0xffffff82;
                    auVar265 = vpaddd_avx512vl(auVar268,auVar99);
                    auVar265 = vcvtdq2ps_avx(auVar265);
                    auVar268 = vsubps_avx512vl(auVar265,auVar401);
                    bVar24 = (bool)((byte)uVar162 & 1);
                    auVar271._0_4_ = (uint)bVar24 * auVar268._0_4_ | (uint)!bVar24 * auVar265._0_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                    auVar271._4_4_ = (uint)bVar24 * auVar268._4_4_ | (uint)!bVar24 * auVar265._4_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                    auVar271._8_4_ = (uint)bVar24 * auVar268._8_4_ | (uint)!bVar24 * auVar265._8_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                    auVar271._12_4_ =
                         (uint)bVar24 * auVar268._12_4_ | (uint)!bVar24 * auVar265._12_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                    auVar271._16_4_ =
                         (uint)bVar24 * auVar268._16_4_ | (uint)!bVar24 * auVar265._16_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                    auVar271._20_4_ =
                         (uint)bVar24 * auVar268._20_4_ | (uint)!bVar24 * auVar265._20_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                    auVar271._24_4_ =
                         (uint)bVar24 * auVar268._24_4_ | (uint)!bVar24 * auVar265._24_4_;
                    bVar24 = SUB81(uVar162 >> 7,0);
                    auVar271._28_4_ =
                         (uint)bVar24 * auVar268._28_4_ | (uint)!bVar24 * auVar265._28_4_;
                    auVar265 = vfmadd231ps_avx512vl(auVar267,auVar271,auVar497);
                    auVar265 = vfmsub231ps_avx512vl(auVar265,auVar389,auVar266);
                    auVar265 = vsubps_avx512vl(auVar265,auVar270);
                    auVar181 = vfmsub231ps_fma(auVar265,auVar407,auVar271);
                    auVar265 = vmulps_avx512vl(ZEXT1632(auVar181),auVar264);
                    auVar266 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar272._0_4_ = (uint)bVar24 * auVar266._0_4_ | (uint)!bVar24 * auVar265._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar272._4_4_ = (uint)bVar24 * auVar266._4_4_ | (uint)!bVar24 * auVar265._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar272._8_4_ = (uint)bVar24 * auVar266._8_4_ | (uint)!bVar24 * auVar265._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar272._12_4_ =
                         (uint)bVar24 * auVar266._12_4_ | (uint)!bVar24 * auVar265._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar272._16_4_ =
                         (uint)bVar24 * auVar266._16_4_ | (uint)!bVar24 * auVar265._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar272._20_4_ =
                         (uint)bVar24 * auVar266._20_4_ | (uint)!bVar24 * auVar265._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar272._24_4_ =
                         (uint)bVar24 * auVar266._24_4_ | (uint)!bVar24 * auVar265._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar272._28_4_ =
                         (uint)bVar24 * auVar266._28_4_ | (uint)!bVar24 * auVar265._28_4_;
                    auVar265 = vminps_avx(auVar272,auVar376);
                    auVar265 = vmaxps_avx(auVar265,auVar383);
                    auVar181 = vfmadd213ps_fma(auVar395,auVar265,auVar389);
                    auVar266 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar266,1);
                    auVar267 = vsubps_avx512vl(auVar266,auVar401);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar273._0_4_ = (uint)bVar24 * auVar267._0_4_ | (uint)!bVar24 * auVar266._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar273._4_4_ = (uint)bVar24 * auVar267._4_4_ | (uint)!bVar24 * auVar266._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar273._8_4_ = (uint)bVar24 * auVar267._8_4_ | (uint)!bVar24 * auVar266._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar273._12_4_ =
                         (uint)bVar24 * auVar267._12_4_ | (uint)!bVar24 * auVar266._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar273._16_4_ =
                         (uint)bVar24 * auVar267._16_4_ | (uint)!bVar24 * auVar266._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar273._20_4_ =
                         (uint)bVar24 * auVar267._20_4_ | (uint)!bVar24 * auVar266._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar273._24_4_ =
                         (uint)bVar24 * auVar267._24_4_ | (uint)!bVar24 * auVar266._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar273._28_4_ =
                         (uint)bVar24 * auVar267._28_4_ | (uint)!bVar24 * auVar266._28_4_;
                    in_ZMM16 = ZEXT3264(auVar273);
                    auVar265 = vfmsub231ps_avx512vl(auVar265,auVar273,auVar407);
                    auVar265 = vfnmsub231ps_avx512vl(auVar265,auVar273,auVar497);
                    auVar457._0_4_ = auVar265._0_4_ * auVar265._0_4_;
                    auVar457._4_4_ = auVar265._4_4_ * auVar265._4_4_;
                    auVar457._8_4_ = auVar265._8_4_ * auVar265._8_4_;
                    auVar457._12_4_ = auVar265._12_4_ * auVar265._12_4_;
                    auVar457._16_4_ = auVar265._16_4_ * auVar265._16_4_;
                    auVar457._20_4_ = auVar265._20_4_ * auVar265._20_4_;
                    auVar457._24_4_ = auVar265._24_4_ * auVar265._24_4_;
                    auVar457._28_4_ = 0;
                    auVar266 = vfmadd213ps_avx512vl(auVar235,auVar265,auVar466);
                    auVar266 = vfmadd213ps_avx512vl(auVar266,auVar265,auVar472);
                    auVar266 = vfmadd213ps_avx512vl(auVar266,auVar265,auVar478);
                    auVar266 = vfmadd213ps_avx512vl(auVar266,auVar265,auVar484);
                    auVar266 = vfmadd213ps_avx512vl(auVar266,auVar265,auVar389);
                    auVar265 = vfmadd213ps_avx512vl(auVar266,auVar457,auVar265);
                    auVar266 = vaddps_avx512vl(auVar265,auVar401);
                    auVar265 = vcvttps2dq_avx512vl(auVar273);
                    auVar265 = vpslld_avx2(auVar265,0x17);
                    auVar265 = vpaddd_avx2(auVar265,auVar491);
                    auVar181 = vfmadd213ps_fma(auVar265,auVar266,auVar401);
                    auVar265 = vrcpps_avx(ZEXT1632(auVar181));
                    auVar181 = vfmsub213ps_fma(ZEXT1632(auVar181),auVar265,auVar401);
                    auVar181 = vfnmadd132ps_fma(ZEXT1632(auVar181),auVar265,auVar265);
                    auVar265 = vfnmadd213ps_avx512vl(ZEXT1632(auVar181),auVar264,auVar236);
                    auVar344._0_4_ = auVar265._0_4_ * auVar341._0_4_;
                    auVar344._4_4_ = auVar265._4_4_ * auVar341._4_4_;
                    auVar344._8_4_ = auVar265._8_4_ * auVar341._8_4_;
                    auVar344._12_4_ = auVar265._12_4_ * auVar341._12_4_;
                    auVar344._16_4_ = auVar265._16_4_ * auVar341._16_4_;
                    auVar344._20_4_ = auVar265._20_4_ * auVar341._20_4_;
                    auVar344._24_4_ = auVar265._24_4_ * auVar341._24_4_;
                    auVar265 = auVar344._0_32_;
                    break;
                  case 6:
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar431._4_4_ = uVar11;
                    auVar431._0_4_ = uVar11;
                    auVar431._8_4_ = uVar11;
                    auVar431._12_4_ = uVar11;
                    auVar431._16_4_ = uVar11;
                    auVar431._20_4_ = uVar11;
                    auVar431._24_4_ = uVar11;
                    auVar431._28_4_ = uVar11;
                    uVar11 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                    auVar93._4_4_ = uVar11;
                    auVar93._0_4_ = uVar11;
                    auVar93._8_4_ = uVar11;
                    auVar93._12_4_ = uVar11;
                    auVar93._16_4_ = uVar11;
                    auVar93._20_4_ = uVar11;
                    auVar93._24_4_ = uVar11;
                    auVar93._28_4_ = uVar11;
                    auVar265 = vfmadd213ps_avx512vl(auVar431,auVar265,auVar93);
                    auVar265 = vmaxps_avx(auVar265,auVar266);
                    auVar265 = vminps_avx(auVar265,auVar401);
                    auVar367._0_4_ = auVar265._0_4_ * auVar341._0_4_;
                    auVar367._4_4_ = auVar265._4_4_ * auVar341._4_4_;
                    auVar367._8_4_ = auVar265._8_4_ * auVar341._8_4_;
                    auVar367._12_4_ = auVar265._12_4_ * auVar341._12_4_;
                    auVar367._16_4_ = auVar265._16_4_ * auVar341._16_4_;
                    auVar367._20_4_ = auVar265._20_4_ * auVar341._20_4_;
                    auVar367._24_4_ = auVar265._24_4_ * auVar341._24_4_;
                    auVar367._28_36_ = auVar344._28_36_;
                    auVar265 = auVar367._0_32_;
                  }
                }
                *(undefined1 (*) [32])pAVar158 = auVar265;
                pAVar158 = pAVar158 + 4;
                uVar163 = uVar163 + 1;
                iVar138 = iVar138 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar174 = iVar174 + 1;
          } while (iVar174 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_228.c);
    }
    if (((iVar173 == 4) && (uVar146 == 8)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar145 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      iVar142 = *(int *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      local_2f8 = 0;
      auVar377._8_4_ = 0x42b0c0a5;
      auVar377._0_8_ = 0x42b0c0a542b0c0a5;
      auVar377._12_4_ = 0x42b0c0a5;
      auVar377._16_4_ = 0x42b0c0a5;
      auVar377._20_4_ = 0x42b0c0a5;
      auVar377._24_4_ = 0x42b0c0a5;
      auVar377._28_4_ = 0x42b0c0a5;
      auVar384._8_4_ = 0xc2b0c0a5;
      auVar384._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar384._12_4_ = 0xc2b0c0a5;
      auVar384._16_4_ = 0xc2b0c0a5;
      auVar384._20_4_ = 0xc2b0c0a5;
      auVar384._24_4_ = 0xc2b0c0a5;
      auVar384._28_4_ = 0xc2b0c0a5;
      auVar390._8_4_ = 0x3f000000;
      auVar390._0_8_ = 0x3f0000003f000000;
      auVar390._12_4_ = 0x3f000000;
      auVar390._16_4_ = 0x3f000000;
      auVar390._20_4_ = 0x3f000000;
      auVar390._24_4_ = 0x3f000000;
      auVar390._28_4_ = 0x3f000000;
      auVar396._8_4_ = 0x3fb8aa3b;
      auVar396._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar396._12_4_ = 0x3fb8aa3b;
      auVar396._16_4_ = 0x3fb8aa3b;
      auVar396._20_4_ = 0x3fb8aa3b;
      auVar396._24_4_ = 0x3fb8aa3b;
      auVar396._28_4_ = 0x3fb8aa3b;
      auVar402._8_4_ = 0x3f800000;
      auVar402._0_8_ = 0x3f8000003f800000;
      auVar402._12_4_ = 0x3f800000;
      auVar402._16_4_ = 0x3f800000;
      auVar402._20_4_ = 0x3f800000;
      auVar402._24_4_ = 0x3f800000;
      auVar402._28_4_ = 0x3f800000;
      auVar408._8_4_ = 0x3f318000;
      auVar408._0_8_ = 0x3f3180003f318000;
      auVar408._12_4_ = 0x3f318000;
      auVar408._16_4_ = 0x3f318000;
      auVar408._20_4_ = 0x3f318000;
      auVar408._24_4_ = 0x3f318000;
      auVar408._28_4_ = 0x3f318000;
      auVar235 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar467._8_4_ = 0x3ab743ce;
      auVar467._0_8_ = 0x3ab743ce3ab743ce;
      auVar467._12_4_ = 0x3ab743ce;
      auVar467._16_4_ = 0x3ab743ce;
      auVar467._20_4_ = 0x3ab743ce;
      auVar467._24_4_ = 0x3ab743ce;
      auVar467._28_4_ = 0x3ab743ce;
      auVar473._8_4_ = 0x3c088908;
      auVar473._0_8_ = 0x3c0889083c088908;
      auVar473._12_4_ = 0x3c088908;
      auVar473._16_4_ = 0x3c088908;
      auVar473._20_4_ = 0x3c088908;
      auVar473._24_4_ = 0x3c088908;
      auVar473._28_4_ = 0x3c088908;
      auVar479._8_4_ = 0x3d2aa9c1;
      auVar479._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar479._12_4_ = 0x3d2aa9c1;
      auVar479._16_4_ = 0x3d2aa9c1;
      auVar479._20_4_ = 0x3d2aa9c1;
      auVar479._24_4_ = 0x3d2aa9c1;
      auVar479._28_4_ = 0x3d2aa9c1;
      auVar485._8_4_ = 0x3e2aaaaa;
      auVar485._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar485._12_4_ = 0x3e2aaaaa;
      auVar485._16_4_ = 0x3e2aaaaa;
      auVar485._20_4_ = 0x3e2aaaaa;
      auVar485._24_4_ = 0x3e2aaaaa;
      auVar485._28_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT3264(auVar485);
      auVar492._8_4_ = 0x3f800000;
      auVar492._0_8_ = 0x3f8000003f800000;
      auVar492._12_4_ = 0x3f800000;
      auVar492._16_4_ = 0x3f800000;
      auVar492._20_4_ = 0x3f800000;
      auVar492._24_4_ = 0x3f800000;
      auVar492._28_4_ = 0x3f800000;
      auVar498._8_4_ = 0xb95e8083;
      auVar498._0_8_ = 0xb95e8083b95e8083;
      auVar498._12_4_ = 0xb95e8083;
      auVar498._16_4_ = 0xb95e8083;
      auVar498._20_4_ = 0xb95e8083;
      auVar498._24_4_ = 0xb95e8083;
      auVar498._28_4_ = 0xb95e8083;
      auVar236 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      in_ZMM20 = ZEXT3264(auVar236);
      auVar257 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT3264(auVar257);
      auVar258 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar259 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar260 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar261 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar262 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar263 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar264 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar265 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar266 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar267 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar175 = bottom_blob->w;
          iVar166 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar174 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar138 = (1 - uVar9) * iVar145;
              do {
                if (lVar160 == 0) {
                  auVar341 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar341 = ZEXT3264(*(undefined1 (*) [32])(lVar160 + local_2f8 * 0x20));
                }
                if (0 < (int)uVar10) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar150 = bottom_blob->data;
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      uVar162 = 0;
                      pvVar168 = (void *)0x0;
                      do {
                        iVar139 = (((int)pvVar168 - uVar157) + 1) * iVar152 + iVar174;
                        if (((-1 < iVar139) && (iVar140 = iVar139 / iVar161, iVar139 % iVar161 == 0)
                            ) && ((0 < (int)uVar9 && (iVar140 < iVar166)))) {
                          lVar159 = (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                          pvVar151 = (void *)(ulong)uVar9;
                          uVar147 = uVar162;
                          iVar139 = iVar138;
                          do {
                            if (((-1 < iVar139) &&
                                (iVar140 = iVar139 / iVar172, iVar139 % iVar172 == 0)) &&
                               (iVar140 < iVar175)) {
                              lVar143 = (long)(iVar140 << 2);
                              uVar11 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159);
                              auVar432._4_4_ = uVar11;
                              auVar432._0_4_ = uVar11;
                              auVar432._8_4_ = uVar11;
                              auVar432._12_4_ = uVar11;
                              auVar432._16_4_ = uVar11;
                              auVar432._20_4_ = uVar11;
                              auVar432._24_4_ = uVar11;
                              auVar432._28_4_ = uVar11;
                              uVar11 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159 + 4);
                              auVar458._4_4_ = uVar11;
                              auVar458._0_4_ = uVar11;
                              auVar458._8_4_ = uVar11;
                              auVar458._12_4_ = uVar11;
                              auVar458._16_4_ = uVar11;
                              auVar458._20_4_ = uVar11;
                              auVar458._24_4_ = uVar11;
                              auVar458._28_4_ = uVar11;
                              auVar268 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 8)));
                              in_ZMM16 = ZEXT3264(auVar268);
                              auVar237 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0xc)));
                              uVar164 = uVar147 & 0xffffffff;
                              auVar181 = vfmadd231ps_fma(auVar341._0_32_,auVar432,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar176 + uVar164 * 4));
                              auVar181 = vfmadd231ps_fma(ZEXT1632(auVar181),auVar458,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar176 + uVar164 * 4 + 0x20));
                              auVar268 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar181),auVar268,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x40));
                              auVar268 = vfmadd231ps_avx512vl
                                                   (auVar268,auVar237,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x60));
                              auVar341 = ZEXT3264(auVar268);
                            }
                            uVar147 = uVar147 + 0x20;
                            iVar139 = iVar139 + iVar145;
                            pvVar151 = (void *)((long)pvVar151 - 1);
                          } while (pvVar151 != (void *)0x0);
                        }
                        pvVar168 = (void *)((long)pvVar168 + 1);
                        uVar162 = uVar162 + (long)(ulong)uVar9 * 0x20;
                      } while (pvVar168 != (void *)(ulong)uVar157);
                    }
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar9 * uVar157 * 0x20) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                auVar268 = auVar341._0_32_;
                if (iVar142 - 1U < 6) {
                  auVar237 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar368._28_36_ = auVar341._28_36_;
                  switch(iVar142) {
                  case 1:
                    auVar268 = vmaxps_avx(auVar268,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar238 = vmaxps_avx(auVar268,auVar237);
                    auVar268 = vminps_avx(auVar268,auVar237);
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar113._4_4_ = uVar11;
                    auVar113._0_4_ = uVar11;
                    auVar113._8_4_ = uVar11;
                    auVar113._12_4_ = uVar11;
                    auVar113._16_4_ = uVar11;
                    auVar113._20_4_ = uVar11;
                    auVar113._24_4_ = uVar11;
                    auVar113._28_4_ = uVar11;
                    auVar268 = vfmadd132ps_avx512vl(auVar268,auVar238,auVar113);
                    break;
                  case 3:
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar111._4_4_ = uVar11;
                    auVar111._0_4_ = uVar11;
                    auVar111._8_4_ = uVar11;
                    auVar111._12_4_ = uVar11;
                    auVar111._16_4_ = uVar11;
                    auVar111._20_4_ = uVar11;
                    auVar111._24_4_ = uVar11;
                    auVar111._28_4_ = uVar11;
                    auVar268 = vmaxps_avx512vl(auVar268,auVar111);
                    uVar11 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                    auVar112._4_4_ = uVar11;
                    auVar112._0_4_ = uVar11;
                    auVar112._8_4_ = uVar11;
                    auVar112._12_4_ = uVar11;
                    auVar112._16_4_ = uVar11;
                    auVar112._20_4_ = uVar11;
                    auVar112._24_4_ = uVar11;
                    auVar112._28_4_ = uVar11;
                    auVar268 = vminps_avx512vl(auVar268,auVar112);
                    break;
                  case 4:
                    auVar109._8_4_ = 0x80000000;
                    auVar109._0_8_ = 0x8000000080000000;
                    auVar109._12_4_ = 0x80000000;
                    auVar109._16_4_ = 0x80000000;
                    auVar109._20_4_ = 0x80000000;
                    auVar109._24_4_ = 0x80000000;
                    auVar109._28_4_ = 0x80000000;
                    auVar268 = vxorps_avx512vl(auVar268,auVar109);
                    auVar268 = vminps_avx(auVar268,auVar377);
                    auVar268 = vmaxps_avx(auVar268,auVar384);
                    auVar181 = vfmadd231ps_fma(auVar390,auVar268,auVar396);
                    auVar237 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar237,1);
                    auVar238 = vsubps_avx512vl(auVar237,auVar402);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar280._0_4_ = (uint)bVar24 * auVar238._0_4_ | (uint)!bVar24 * auVar237._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar280._4_4_ = (uint)bVar24 * auVar238._4_4_ | (uint)!bVar24 * auVar237._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar280._8_4_ = (uint)bVar24 * auVar238._8_4_ | (uint)!bVar24 * auVar237._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar280._12_4_ =
                         (uint)bVar24 * auVar238._12_4_ | (uint)!bVar24 * auVar237._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar280._16_4_ =
                         (uint)bVar24 * auVar238._16_4_ | (uint)!bVar24 * auVar237._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar280._20_4_ =
                         (uint)bVar24 * auVar238._20_4_ | (uint)!bVar24 * auVar237._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar280._24_4_ =
                         (uint)bVar24 * auVar238._24_4_ | (uint)!bVar24 * auVar237._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar280._28_4_ =
                         (uint)bVar24 * auVar238._28_4_ | (uint)!bVar24 * auVar237._28_4_;
                    in_ZMM16 = ZEXT3264(auVar280);
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar280,auVar408);
                    auVar110._8_4_ = 0x395e8083;
                    auVar110._0_8_ = 0x395e8083395e8083;
                    auVar110._12_4_ = 0x395e8083;
                    auVar110._16_4_ = 0x395e8083;
                    auVar110._20_4_ = 0x395e8083;
                    auVar110._24_4_ = 0x395e8083;
                    auVar110._28_4_ = 0x395e8083;
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar280,auVar110);
                    auVar433._0_4_ = auVar268._0_4_ * auVar268._0_4_;
                    auVar433._4_4_ = auVar268._4_4_ * auVar268._4_4_;
                    auVar433._8_4_ = auVar268._8_4_ * auVar268._8_4_;
                    auVar433._12_4_ = auVar268._12_4_ * auVar268._12_4_;
                    auVar433._16_4_ = auVar268._16_4_ * auVar268._16_4_;
                    auVar433._20_4_ = auVar268._20_4_ * auVar268._20_4_;
                    auVar433._24_4_ = auVar268._24_4_ * auVar268._24_4_;
                    auVar433._28_4_ = 0;
                    auVar181 = vfmadd213ps_fma(auVar235,auVar268,auVar467);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar268,auVar473);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar268,auVar479);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar268,auVar485);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar268,auVar390);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar433,auVar268);
                    auVar434._0_4_ = auVar181._0_4_ + 1.0;
                    auVar434._4_4_ = auVar181._4_4_ + 1.0;
                    auVar434._8_4_ = auVar181._8_4_ + 1.0;
                    auVar434._12_4_ = auVar181._12_4_ + 1.0;
                    auVar434._16_4_ = 0x3f800000;
                    auVar434._20_4_ = 0x3f800000;
                    auVar434._24_4_ = 0x3f800000;
                    auVar434._28_4_ = 0x3f800000;
                    auVar268 = vcvttps2dq_avx512vl(auVar280);
                    auVar268 = vpslld_avx2(auVar268,0x17);
                    auVar268 = vpaddd_avx2(auVar492,auVar268);
                    auVar181 = vfmadd213ps_fma(auVar268,auVar434,auVar402);
                    auVar268 = vrcpps_avx(ZEXT1632(auVar181));
                    auVar181 = vfmsub213ps_fma(ZEXT1632(auVar181),auVar268,auVar402);
                    auVar181 = vfnmadd132ps_fma(ZEXT1632(auVar181),auVar268,auVar268);
                    auVar268 = ZEXT1632(auVar181);
                    break;
                  case 5:
                    auVar268 = vminps_avx(auVar268,auVar377);
                    auVar268 = vmaxps_avx(auVar268,auVar384);
                    auVar181 = vfmadd213ps_fma(auVar396,auVar268,auVar390);
                    auVar238 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar238,1);
                    auVar239 = vsubps_avx512vl(auVar238,auVar402);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar275._0_4_ = (uint)bVar24 * auVar239._0_4_ | (uint)!bVar24 * auVar238._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar275._4_4_ = (uint)bVar24 * auVar239._4_4_ | (uint)!bVar24 * auVar238._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar275._8_4_ = (uint)bVar24 * auVar239._8_4_ | (uint)!bVar24 * auVar238._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar275._12_4_ =
                         (uint)bVar24 * auVar239._12_4_ | (uint)!bVar24 * auVar238._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar275._16_4_ =
                         (uint)bVar24 * auVar239._16_4_ | (uint)!bVar24 * auVar238._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar275._20_4_ =
                         (uint)bVar24 * auVar239._20_4_ | (uint)!bVar24 * auVar238._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar275._24_4_ =
                         (uint)bVar24 * auVar239._24_4_ | (uint)!bVar24 * auVar238._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar275._28_4_ =
                         (uint)bVar24 * auVar239._28_4_ | (uint)!bVar24 * auVar238._28_4_;
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar275,auVar408);
                    auVar268 = vfnmsub231ps_avx512vl(auVar268,auVar275,auVar498);
                    auVar459._0_4_ = auVar268._0_4_ * auVar268._0_4_;
                    auVar459._4_4_ = auVar268._4_4_ * auVar268._4_4_;
                    auVar459._8_4_ = auVar268._8_4_ * auVar268._8_4_;
                    auVar459._12_4_ = auVar268._12_4_ * auVar268._12_4_;
                    auVar459._16_4_ = auVar268._16_4_ * auVar268._16_4_;
                    auVar459._20_4_ = auVar268._20_4_ * auVar268._20_4_;
                    auVar459._24_4_ = auVar268._24_4_ * auVar268._24_4_;
                    auVar459._28_4_ = 0;
                    auVar238 = vfmadd213ps_avx512vl(auVar235,auVar268,auVar467);
                    auVar238 = vfmadd213ps_avx512vl(auVar238,auVar268,auVar473);
                    auVar238 = vfmadd213ps_avx512vl(auVar238,auVar268,auVar479);
                    auVar238 = vfmadd213ps_avx512vl(auVar238,auVar268,auVar485);
                    auVar238 = vfmadd213ps_avx512vl(auVar238,auVar268,auVar390);
                    auVar268 = vfmadd213ps_avx512vl(auVar238,auVar459,auVar268);
                    auVar238 = vaddps_avx512vl(auVar268,auVar402);
                    auVar268 = vcvttps2dq_avx512vl(auVar275);
                    auVar268 = vpslld_avx2(auVar268,0x17);
                    auVar268 = vpaddd_avx2(auVar268,auVar492);
                    auVar181 = vfmadd213ps_fma(auVar268,auVar238,auVar402);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar237,2);
                    auVar106._8_4_ = 0x800000;
                    auVar106._0_8_ = 0x80000000800000;
                    auVar106._12_4_ = 0x800000;
                    auVar106._16_4_ = 0x800000;
                    auVar106._20_4_ = 0x800000;
                    auVar106._24_4_ = 0x800000;
                    auVar106._28_4_ = 0x800000;
                    auVar268 = vmaxps_avx512vl(ZEXT1632(auVar181),auVar106);
                    auVar239 = vpsrld_avx2(auVar268,0x17);
                    auVar237 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar107._8_4_ = 0x3f000000;
                    auVar107._0_8_ = 0x3f0000003f000000;
                    auVar107._12_4_ = 0x3f000000;
                    auVar107._16_4_ = 0x3f000000;
                    auVar107._20_4_ = 0x3f000000;
                    auVar107._24_4_ = 0x3f000000;
                    auVar107._28_4_ = 0x3f000000;
                    auVar268 = vpternlogd_avx512vl(auVar268,auVar237,auVar107,0xea);
                    uVar162 = vcmpps_avx512vl(auVar268,auVar236,1);
                    auVar237 = vaddps_avx512vl(auVar268,auVar257);
                    auVar268 = vaddps_avx512vl(auVar237,auVar268);
                    bVar24 = (bool)((byte)uVar162 & 1);
                    auVar276._0_4_ = (uint)bVar24 * auVar268._0_4_ | (uint)!bVar24 * auVar237._0_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                    auVar276._4_4_ = (uint)bVar24 * auVar268._4_4_ | (uint)!bVar24 * auVar237._4_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                    auVar276._8_4_ = (uint)bVar24 * auVar268._8_4_ | (uint)!bVar24 * auVar237._8_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                    auVar276._12_4_ =
                         (uint)bVar24 * auVar268._12_4_ | (uint)!bVar24 * auVar237._12_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                    auVar276._16_4_ =
                         (uint)bVar24 * auVar268._16_4_ | (uint)!bVar24 * auVar237._16_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                    auVar276._20_4_ =
                         (uint)bVar24 * auVar268._20_4_ | (uint)!bVar24 * auVar237._20_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                    auVar276._24_4_ =
                         (uint)bVar24 * auVar268._24_4_ | (uint)!bVar24 * auVar237._24_4_;
                    bVar24 = SUB81(uVar162 >> 7,0);
                    auVar276._28_4_ =
                         (uint)bVar24 * auVar268._28_4_ | (uint)!bVar24 * auVar237._28_4_;
                    auVar237 = vmulps_avx512vl(auVar276,auVar276);
                    auVar268 = vfmadd213ps_avx512vl(auVar258,auVar276,auVar259);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar276,auVar260);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar276,auVar261);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar276,auVar262);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar276,auVar263);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar276,auVar264);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar276,auVar265);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar276,auVar266);
                    auVar238 = vmulps_avx512vl(auVar237,auVar276);
                    auVar238 = vmulps_avx512vl(auVar238,auVar268);
                    auVar108._8_4_ = 0xffffff82;
                    auVar108._0_8_ = 0xffffff82ffffff82;
                    auVar108._12_4_ = 0xffffff82;
                    auVar108._16_4_ = 0xffffff82;
                    auVar108._20_4_ = 0xffffff82;
                    auVar108._24_4_ = 0xffffff82;
                    auVar108._28_4_ = 0xffffff82;
                    auVar268 = vpaddd_avx512vl(auVar239,auVar108);
                    auVar268 = vcvtdq2ps_avx(auVar268);
                    auVar239 = vsubps_avx512vl(auVar268,auVar402);
                    bVar24 = (bool)((byte)uVar162 & 1);
                    auVar277._0_4_ = (uint)bVar24 * auVar239._0_4_ | (uint)!bVar24 * auVar268._0_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                    auVar277._4_4_ = (uint)bVar24 * auVar239._4_4_ | (uint)!bVar24 * auVar268._4_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                    auVar277._8_4_ = (uint)bVar24 * auVar239._8_4_ | (uint)!bVar24 * auVar268._8_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                    auVar277._12_4_ =
                         (uint)bVar24 * auVar239._12_4_ | (uint)!bVar24 * auVar268._12_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                    auVar277._16_4_ =
                         (uint)bVar24 * auVar239._16_4_ | (uint)!bVar24 * auVar268._16_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                    auVar277._20_4_ =
                         (uint)bVar24 * auVar239._20_4_ | (uint)!bVar24 * auVar268._20_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                    auVar277._24_4_ =
                         (uint)bVar24 * auVar239._24_4_ | (uint)!bVar24 * auVar268._24_4_;
                    bVar24 = SUB81(uVar162 >> 7,0);
                    auVar277._28_4_ =
                         (uint)bVar24 * auVar239._28_4_ | (uint)!bVar24 * auVar268._28_4_;
                    auVar268 = vfmadd231ps_avx512vl(auVar238,auVar277,auVar498);
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar390,auVar237);
                    auVar268 = vsubps_avx512vl(auVar268,auVar276);
                    auVar181 = vfmsub231ps_fma(auVar268,auVar408,auVar277);
                    auVar268 = vmulps_avx512vl(ZEXT1632(auVar181),auVar267);
                    auVar237 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar278._0_4_ = (uint)bVar24 * auVar237._0_4_ | (uint)!bVar24 * auVar268._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar278._4_4_ = (uint)bVar24 * auVar237._4_4_ | (uint)!bVar24 * auVar268._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar278._8_4_ = (uint)bVar24 * auVar237._8_4_ | (uint)!bVar24 * auVar268._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar278._12_4_ =
                         (uint)bVar24 * auVar237._12_4_ | (uint)!bVar24 * auVar268._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar278._16_4_ =
                         (uint)bVar24 * auVar237._16_4_ | (uint)!bVar24 * auVar268._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar278._20_4_ =
                         (uint)bVar24 * auVar237._20_4_ | (uint)!bVar24 * auVar268._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar278._24_4_ =
                         (uint)bVar24 * auVar237._24_4_ | (uint)!bVar24 * auVar268._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar278._28_4_ =
                         (uint)bVar24 * auVar237._28_4_ | (uint)!bVar24 * auVar268._28_4_;
                    auVar268 = vminps_avx(auVar278,auVar377);
                    auVar268 = vmaxps_avx(auVar268,auVar384);
                    auVar181 = vfmadd213ps_fma(auVar396,auVar268,auVar390);
                    auVar237 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar237,1);
                    auVar238 = vsubps_avx512vl(auVar237,auVar402);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar279._0_4_ = (uint)bVar24 * auVar238._0_4_ | (uint)!bVar24 * auVar237._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar279._4_4_ = (uint)bVar24 * auVar238._4_4_ | (uint)!bVar24 * auVar237._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar279._8_4_ = (uint)bVar24 * auVar238._8_4_ | (uint)!bVar24 * auVar237._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar279._12_4_ =
                         (uint)bVar24 * auVar238._12_4_ | (uint)!bVar24 * auVar237._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar279._16_4_ =
                         (uint)bVar24 * auVar238._16_4_ | (uint)!bVar24 * auVar237._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar279._20_4_ =
                         (uint)bVar24 * auVar238._20_4_ | (uint)!bVar24 * auVar237._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar279._24_4_ =
                         (uint)bVar24 * auVar238._24_4_ | (uint)!bVar24 * auVar237._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar279._28_4_ =
                         (uint)bVar24 * auVar238._28_4_ | (uint)!bVar24 * auVar237._28_4_;
                    in_ZMM16 = ZEXT3264(auVar279);
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar279,auVar408);
                    auVar268 = vfnmsub231ps_avx512vl(auVar268,auVar279,auVar498);
                    auVar460._0_4_ = auVar268._0_4_ * auVar268._0_4_;
                    auVar460._4_4_ = auVar268._4_4_ * auVar268._4_4_;
                    auVar460._8_4_ = auVar268._8_4_ * auVar268._8_4_;
                    auVar460._12_4_ = auVar268._12_4_ * auVar268._12_4_;
                    auVar460._16_4_ = auVar268._16_4_ * auVar268._16_4_;
                    auVar460._20_4_ = auVar268._20_4_ * auVar268._20_4_;
                    auVar460._24_4_ = auVar268._24_4_ * auVar268._24_4_;
                    auVar460._28_4_ = 0;
                    auVar237 = vfmadd213ps_avx512vl(auVar235,auVar268,auVar467);
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar268,auVar473);
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar268,auVar479);
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar268,auVar485);
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar268,auVar390);
                    auVar268 = vfmadd213ps_avx512vl(auVar237,auVar460,auVar268);
                    auVar237 = vaddps_avx512vl(auVar268,auVar402);
                    auVar268 = vcvttps2dq_avx512vl(auVar279);
                    auVar268 = vpslld_avx2(auVar268,0x17);
                    auVar268 = vpaddd_avx2(auVar268,auVar492);
                    auVar181 = vfmadd213ps_fma(auVar268,auVar237,auVar402);
                    auVar268 = vrcpps_avx(ZEXT1632(auVar181));
                    auVar181 = vfmsub213ps_fma(ZEXT1632(auVar181),auVar268,auVar402);
                    auVar181 = vfnmadd132ps_fma(ZEXT1632(auVar181),auVar268,auVar268);
                    auVar268 = vfnmadd213ps_avx512vl(ZEXT1632(auVar181),auVar267,auVar257);
                    auVar368._0_4_ = auVar268._0_4_ * auVar341._0_4_;
                    auVar368._4_4_ = auVar268._4_4_ * auVar341._4_4_;
                    auVar368._8_4_ = auVar268._8_4_ * auVar341._8_4_;
                    auVar368._12_4_ = auVar268._12_4_ * auVar341._12_4_;
                    auVar368._16_4_ = auVar268._16_4_ * auVar341._16_4_;
                    auVar368._20_4_ = auVar268._20_4_ * auVar341._20_4_;
                    auVar368._24_4_ = auVar268._24_4_ * auVar341._24_4_;
                    auVar268 = auVar368._0_32_;
                    break;
                  case 6:
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar435._4_4_ = uVar11;
                    auVar435._0_4_ = uVar11;
                    auVar435._8_4_ = uVar11;
                    auVar435._12_4_ = uVar11;
                    auVar435._16_4_ = uVar11;
                    auVar435._20_4_ = uVar11;
                    auVar435._24_4_ = uVar11;
                    auVar435._28_4_ = uVar11;
                    uVar11 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                    auVar105._4_4_ = uVar11;
                    auVar105._0_4_ = uVar11;
                    auVar105._8_4_ = uVar11;
                    auVar105._12_4_ = uVar11;
                    auVar105._16_4_ = uVar11;
                    auVar105._20_4_ = uVar11;
                    auVar105._24_4_ = uVar11;
                    auVar105._28_4_ = uVar11;
                    auVar268 = vfmadd213ps_avx512vl(auVar435,auVar268,auVar105);
                    auVar268 = vmaxps_avx(auVar268,auVar237);
                    auVar268 = vminps_avx(auVar268,auVar402);
                    auVar369._0_4_ = auVar268._0_4_ * auVar341._0_4_;
                    auVar369._4_4_ = auVar268._4_4_ * auVar341._4_4_;
                    auVar369._8_4_ = auVar268._8_4_ * auVar341._8_4_;
                    auVar369._12_4_ = auVar268._12_4_ * auVar341._12_4_;
                    auVar369._16_4_ = auVar268._16_4_ * auVar341._16_4_;
                    auVar369._20_4_ = auVar268._20_4_ * auVar341._20_4_;
                    auVar369._24_4_ = auVar268._24_4_ * auVar341._24_4_;
                    auVar369._28_36_ = auVar368._28_36_;
                    auVar268 = auVar369._0_32_;
                  }
                }
                *(undefined1 (*) [32])pAVar158 = auVar268;
                pAVar158 = pAVar158 + 4;
                uVar163 = uVar163 + 1;
                iVar138 = iVar138 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar174 = iVar174 + 1;
          } while (iVar174 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_228.c);
    }
    if (((iVar173 == 8) && (uVar146 == 4)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar145 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      uVar11 = *(undefined4 *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      local_2f8 = 0;
      auVar222 = ZEXT816(0) << 0x40;
      auVar373._8_4_ = 0x42b0c0a5;
      auVar373._0_8_ = 0x42b0c0a542b0c0a5;
      auVar373._12_4_ = 0x42b0c0a5;
      auVar380._8_4_ = 0xc2b0c0a5;
      auVar380._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar380._12_4_ = 0xc2b0c0a5;
      auVar386._8_4_ = 0x3f000000;
      auVar386._0_8_ = 0x3f0000003f000000;
      auVar386._12_4_ = 0x3f000000;
      auVar392._8_4_ = 0x3fb8aa3b;
      auVar392._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar392._12_4_ = 0x3fb8aa3b;
      auVar398._8_4_ = 0x3f800000;
      auVar398._0_8_ = 0x3f8000003f800000;
      auVar398._12_4_ = 0x3f800000;
      auVar404._8_4_ = 0x3f318000;
      auVar404._0_8_ = 0x3f3180003f318000;
      auVar404._12_4_ = 0x3f318000;
      auVar181 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar463._8_4_ = 0x3ab743ce;
      auVar463._0_8_ = 0x3ab743ce3ab743ce;
      auVar463._12_4_ = 0x3ab743ce;
      auVar469._8_4_ = 0x3c088908;
      auVar469._0_8_ = 0x3c0889083c088908;
      auVar469._12_4_ = 0x3c088908;
      auVar475._8_4_ = 0x3d2aa9c1;
      auVar475._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar475._12_4_ = 0x3d2aa9c1;
      auVar481._8_4_ = 0x3e2aaaaa;
      auVar481._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar481._12_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT1664(auVar481);
      auVar488._8_4_ = 0x3f800000;
      auVar488._0_8_ = 0x3f8000003f800000;
      auVar488._12_4_ = 0x3f800000;
      auVar494._8_4_ = 0xb95e8083;
      auVar494._0_8_ = 0xb95e8083b95e8083;
      auVar494._12_4_ = 0xb95e8083;
      auVar182 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar183 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar204 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar205 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar206 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar207 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar208 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar209 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar210 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar142 = bottom_blob->w;
          iVar175 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar166 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar174 = (1 - uVar9) * iVar145;
              do {
                if (lVar160 == 0) {
                  auVar215 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar215 = *(undefined1 (*) [16])(lVar160 + local_2f8 * 0x10);
                }
                auVar341 = ZEXT1664(auVar215);
                if (0 < (int)uVar10) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar150 = bottom_blob->data;
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      uVar162 = 0;
                      pvVar168 = (void *)0x0;
                      do {
                        iVar138 = (((int)pvVar168 - uVar157) + 1) * iVar152 + iVar166;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar161, iVar138 % iVar161 == 0)
                            ) && ((0 < (int)uVar9 && (iVar139 < iVar175)))) {
                          lVar159 = (long)iVar139 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                          pvVar151 = (void *)(ulong)uVar9;
                          uVar147 = uVar162;
                          iVar138 = iVar174;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar139 = iVar138 / iVar172, iVar138 % iVar172 == 0)) &&
                               (iVar139 < iVar142)) {
                              lVar143 = (long)(iVar139 << 3);
                              uVar2 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159);
                              auVar414._4_4_ = uVar2;
                              auVar414._0_4_ = uVar2;
                              auVar414._8_4_ = uVar2;
                              auVar414._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159 + 4);
                              auVar443._4_4_ = uVar2;
                              auVar443._0_4_ = uVar2;
                              auVar443._8_4_ = uVar2;
                              auVar443._12_4_ = uVar2;
                              auVar211 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 8)));
                              in_ZMM16 = ZEXT1664(auVar211);
                              auVar212 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0xc)));
                              auVar213 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x10)))
                              ;
                              auVar214 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x14)))
                              ;
                              in_ZMM20 = ZEXT1664(auVar214);
                              auVar184 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x18)))
                              ;
                              in_ZMM21 = (float  [16])ZEXT1664(auVar184);
                              auVar185 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0x1c)))
                              ;
                              uVar164 = uVar147 & 0xffffffff;
                              auVar215 = vfmadd231ps_fma(auVar341._0_16_,auVar414,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar176 + uVar164 * 4));
                              auVar215 = vfmadd231ps_fma(auVar215,auVar443,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar176 + uVar164 * 4 + 0x10));
                              auVar215 = vfmadd231ps_avx512vl
                                                   (auVar215,auVar211,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x20));
                              auVar215 = vfmadd231ps_avx512vl
                                                   (auVar215,auVar212,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x30));
                              auVar215 = vfmadd231ps_avx512vl
                                                   (auVar215,auVar213,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x40));
                              auVar215 = vfmadd231ps_avx512vl
                                                   (auVar215,auVar214,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x50));
                              auVar215 = vfmadd231ps_avx512vl
                                                   (auVar215,auVar184,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x60));
                              auVar215 = vfmadd231ps_avx512vl
                                                   (auVar215,auVar185,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x70));
                              auVar341 = ZEXT1664(auVar215);
                            }
                            uVar147 = uVar147 + 0x20;
                            iVar138 = iVar138 + iVar145;
                            pvVar151 = (void *)((long)pvVar151 - 1);
                          } while (pvVar151 != (void *)0x0);
                        }
                        pvVar168 = (void *)((long)pvVar168 + 1);
                        uVar162 = uVar162 + (long)(ulong)uVar9 * 0x20;
                      } while (pvVar168 != (void *)(ulong)uVar157);
                    }
                    auVar215 = auVar341._0_16_;
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar9 * uVar157 * 0x20) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                switch(uVar11) {
                case 1:
                  auVar215 = vmaxps_avx(auVar215,auVar222);
                  break;
                case 2:
                  auVar211 = vmaxps_avx(auVar215,auVar222);
                  auVar215 = vminps_avx(auVar215,auVar222);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar63._4_4_ = uVar2;
                  auVar63._0_4_ = uVar2;
                  auVar63._8_4_ = uVar2;
                  auVar63._12_4_ = uVar2;
                  auVar215 = vfmadd132ps_avx512vl(auVar215,auVar211,auVar63);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar61._4_4_ = uVar2;
                  auVar61._0_4_ = uVar2;
                  auVar61._8_4_ = uVar2;
                  auVar61._12_4_ = uVar2;
                  auVar215 = vmaxps_avx512vl(auVar215,auVar61);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar62._4_4_ = uVar2;
                  auVar62._0_4_ = uVar2;
                  auVar62._8_4_ = uVar2;
                  auVar62._12_4_ = uVar2;
                  auVar215 = vminps_avx512vl(auVar215,auVar62);
                  break;
                case 4:
                  auVar59._8_4_ = 0x80000000;
                  auVar59._0_8_ = 0x8000000080000000;
                  auVar59._12_4_ = 0x80000000;
                  auVar215 = vxorps_avx512vl(auVar215,auVar59);
                  auVar215 = vminps_avx(auVar215,auVar373);
                  auVar215 = vmaxps_avx(auVar215,auVar380);
                  auVar211 = vfmadd231ps_fma(auVar386,auVar215,auVar392);
                  auVar212 = vcvttps2dq_avx512vl(auVar211);
                  auVar212 = vcvtdq2ps_avx512vl(auVar212);
                  uVar149 = vcmpps_avx512vl(auVar211,auVar212,1);
                  auVar211 = vsubps_avx512vl(auVar212,auVar398);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar221._0_4_ = (uint)bVar24 * auVar211._0_4_ | (uint)!bVar24 * auVar212._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar221._4_4_ = (uint)bVar24 * auVar211._4_4_ | (uint)!bVar24 * auVar212._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar221._8_4_ = (uint)bVar24 * auVar211._8_4_ | (uint)!bVar24 * auVar212._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar221._12_4_ = (uint)bVar24 * auVar211._12_4_ | (uint)!bVar24 * auVar212._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar221);
                  auVar215 = vfmsub231ps_avx512vl(auVar215,auVar221,auVar404);
                  auVar60._8_4_ = 0x395e8083;
                  auVar60._0_8_ = 0x395e8083395e8083;
                  auVar60._12_4_ = 0x395e8083;
                  auVar211 = vfmsub231ps_avx512vl(auVar215,auVar221,auVar60);
                  auVar415._0_4_ = auVar211._0_4_ * auVar211._0_4_;
                  auVar415._4_4_ = auVar211._4_4_ * auVar211._4_4_;
                  auVar415._8_4_ = auVar211._8_4_ * auVar211._8_4_;
                  auVar415._12_4_ = auVar211._12_4_ * auVar211._12_4_;
                  auVar215 = vfmadd213ps_fma(auVar181,auVar211,auVar463);
                  auVar215 = vfmadd213ps_fma(auVar215,auVar211,auVar469);
                  auVar215 = vfmadd213ps_fma(auVar215,auVar211,auVar475);
                  auVar215 = vfmadd213ps_fma(auVar215,auVar211,auVar481);
                  auVar215 = vfmadd213ps_fma(auVar215,auVar211,auVar386);
                  auVar215 = vfmadd213ps_fma(auVar215,auVar415,auVar211);
                  auVar416._0_4_ = auVar215._0_4_ + 1.0;
                  auVar416._4_4_ = auVar215._4_4_ + 1.0;
                  auVar416._8_4_ = auVar215._8_4_ + 1.0;
                  auVar416._12_4_ = auVar215._12_4_ + 1.0;
                  auVar215 = vcvttps2dq_avx512vl(auVar221);
                  auVar215 = vpslld_avx(auVar215,0x17);
                  auVar215 = vpaddd_avx(auVar488,auVar215);
                  auVar211 = vfmadd213ps_fma(auVar215,auVar416,auVar398);
                  auVar215 = vrcpps_avx(auVar211);
                  auVar211 = vfmsub213ps_fma(auVar211,auVar215,auVar398);
                  auVar215 = vfnmadd132ps_fma(auVar211,auVar215,auVar215);
                  break;
                case 5:
                  auVar211 = vminps_avx(auVar215,auVar373);
                  auVar211 = vmaxps_avx(auVar211,auVar380);
                  auVar212 = vfmadd213ps_fma(auVar392,auVar211,auVar386);
                  auVar213 = vcvttps2dq_avx512vl(auVar212);
                  auVar213 = vcvtdq2ps_avx512vl(auVar213);
                  uVar149 = vcmpps_avx512vl(auVar212,auVar213,1);
                  auVar212 = vsubps_avx512vl(auVar213,auVar398);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar216._0_4_ = (uint)bVar24 * auVar212._0_4_ | (uint)!bVar24 * auVar213._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar216._4_4_ = (uint)bVar24 * auVar212._4_4_ | (uint)!bVar24 * auVar213._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar216._8_4_ = (uint)bVar24 * auVar212._8_4_ | (uint)!bVar24 * auVar213._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar216._12_4_ = (uint)bVar24 * auVar212._12_4_ | (uint)!bVar24 * auVar213._12_4_
                  ;
                  auVar211 = vfmsub231ps_avx512vl(auVar211,auVar216,auVar404);
                  auVar211 = vfnmsub231ps_avx512vl(auVar211,auVar216,auVar494);
                  auVar444._0_4_ = auVar211._0_4_ * auVar211._0_4_;
                  auVar444._4_4_ = auVar211._4_4_ * auVar211._4_4_;
                  auVar444._8_4_ = auVar211._8_4_ * auVar211._8_4_;
                  auVar444._12_4_ = auVar211._12_4_ * auVar211._12_4_;
                  auVar212 = vfmadd213ps_avx512vl(auVar181,auVar211,auVar463);
                  auVar212 = vfmadd213ps_avx512vl(auVar212,auVar211,auVar469);
                  auVar212 = vfmadd213ps_avx512vl(auVar212,auVar211,auVar475);
                  auVar212 = vfmadd213ps_avx512vl(auVar212,auVar211,auVar481);
                  auVar212 = vfmadd213ps_avx512vl(auVar212,auVar211,auVar386);
                  auVar211 = vfmadd213ps_avx512vl(auVar212,auVar444,auVar211);
                  auVar212 = vaddps_avx512vl(auVar211,auVar398);
                  auVar211 = vcvttps2dq_avx512vl(auVar216);
                  auVar211 = vpslld_avx(auVar211,0x17);
                  auVar211 = vpaddd_avx(auVar211,auVar488);
                  auVar211 = vfmadd213ps_fma(auVar211,auVar212,auVar398);
                  uVar149 = vcmpps_avx512vl(auVar211,auVar222,2);
                  auVar53._8_4_ = 0x800000;
                  auVar53._0_8_ = 0x80000000800000;
                  auVar53._12_4_ = 0x800000;
                  auVar211 = vmaxps_avx512vl(auVar211,auVar53);
                  auVar214 = vpsrld_avx(auVar211,0x17);
                  auVar212 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar54._8_4_ = 0x3f000000;
                  auVar54._0_8_ = 0x3f0000003f000000;
                  auVar54._12_4_ = 0x3f000000;
                  auVar211 = vpternlogd_avx512vl(auVar211,auVar212,auVar54,0xea);
                  auVar55._8_4_ = 0x3f3504f3;
                  auVar55._0_8_ = 0x3f3504f33f3504f3;
                  auVar55._12_4_ = 0x3f3504f3;
                  uVar162 = vcmpps_avx512vl(auVar211,auVar55,1);
                  auVar56._8_4_ = 0xbf800000;
                  auVar56._0_8_ = 0xbf800000bf800000;
                  auVar56._12_4_ = 0xbf800000;
                  auVar212 = vaddps_avx512vl(auVar211,auVar56);
                  auVar211 = vaddps_avx512vl(auVar212,auVar211);
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar217._0_4_ = (uint)bVar24 * auVar211._0_4_ | (uint)!bVar24 * auVar212._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar217._4_4_ = (uint)bVar24 * auVar211._4_4_ | (uint)!bVar24 * auVar212._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar217._8_4_ = (uint)bVar24 * auVar211._8_4_ | (uint)!bVar24 * auVar212._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar217._12_4_ = (uint)bVar24 * auVar211._12_4_ | (uint)!bVar24 * auVar212._12_4_
                  ;
                  auVar212 = vmulps_avx512vl(auVar217,auVar217);
                  auVar57._8_4_ = 0xbdebd1b8;
                  auVar57._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar57._12_4_ = 0xbdebd1b8;
                  auVar211 = vfmadd213ps_avx512vl(auVar182,auVar217,auVar57);
                  auVar211 = vfmadd213ps_avx512vl(auVar211,auVar217,auVar183);
                  auVar211 = vfmadd213ps_avx512vl(auVar211,auVar217,auVar204);
                  auVar211 = vfmadd213ps_avx512vl(auVar211,auVar217,auVar205);
                  auVar211 = vfmadd213ps_avx512vl(auVar211,auVar217,auVar206);
                  auVar211 = vfmadd213ps_avx512vl(auVar211,auVar217,auVar207);
                  auVar211 = vfmadd213ps_avx512vl(auVar211,auVar217,auVar208);
                  auVar211 = vfmadd213ps_avx512vl(auVar211,auVar217,auVar209);
                  auVar213 = vmulps_avx512vl(auVar212,auVar217);
                  auVar213 = vmulps_avx512vl(auVar213,auVar211);
                  auVar58._8_4_ = 0xffffff82;
                  auVar58._0_8_ = 0xffffff82ffffff82;
                  auVar58._12_4_ = 0xffffff82;
                  auVar211 = vpaddd_avx512vl(auVar214,auVar58);
                  auVar211 = vcvtdq2ps_avx(auVar211);
                  auVar214 = vsubps_avx512vl(auVar211,auVar398);
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar218._0_4_ = (uint)bVar24 * auVar214._0_4_ | (uint)!bVar24 * auVar211._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar218._4_4_ = (uint)bVar24 * auVar214._4_4_ | (uint)!bVar24 * auVar211._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar218._8_4_ = (uint)bVar24 * auVar214._8_4_ | (uint)!bVar24 * auVar211._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar218._12_4_ = (uint)bVar24 * auVar214._12_4_ | (uint)!bVar24 * auVar211._12_4_
                  ;
                  auVar211 = vfmadd231ps_avx512vl(auVar213,auVar218,auVar494);
                  auVar211 = vfmsub231ps_avx512vl(auVar211,auVar386,auVar212);
                  auVar211 = vsubps_avx512vl(auVar211,auVar217);
                  auVar211 = vfnmadd231ps_fma(auVar211,auVar404,auVar218);
                  auVar212 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar219._0_4_ =
                       (uint)bVar24 * auVar212._0_4_ |
                       (uint)!bVar24 * (int)(auVar211._0_4_ + auVar211._0_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar219._4_4_ =
                       (uint)bVar24 * auVar212._4_4_ |
                       (uint)!bVar24 * (int)(auVar211._4_4_ + auVar211._4_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar219._8_4_ =
                       (uint)bVar24 * auVar212._8_4_ |
                       (uint)!bVar24 * (int)(auVar211._8_4_ + auVar211._8_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar219._12_4_ =
                       (uint)bVar24 * auVar212._12_4_ |
                       (uint)!bVar24 * (int)(auVar211._12_4_ + auVar211._12_4_);
                  auVar211 = vminps_avx(auVar219,auVar373);
                  auVar211 = vmaxps_avx(auVar211,auVar380);
                  auVar212 = vfmadd213ps_fma(auVar392,auVar211,auVar386);
                  auVar213 = vcvttps2dq_avx512vl(auVar212);
                  auVar213 = vcvtdq2ps_avx512vl(auVar213);
                  uVar149 = vcmpps_avx512vl(auVar212,auVar213,1);
                  auVar212 = vsubps_avx512vl(auVar213,auVar398);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar220._0_4_ = (uint)bVar24 * auVar212._0_4_ | (uint)!bVar24 * auVar213._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar220._4_4_ = (uint)bVar24 * auVar212._4_4_ | (uint)!bVar24 * auVar213._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar220._8_4_ = (uint)bVar24 * auVar212._8_4_ | (uint)!bVar24 * auVar213._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar220._12_4_ = (uint)bVar24 * auVar212._12_4_ | (uint)!bVar24 * auVar213._12_4_
                  ;
                  auVar211 = vfmsub231ps_avx512vl(auVar211,auVar220,auVar404);
                  auVar211 = vfnmsub231ps_avx512vl(auVar211,auVar220,auVar494);
                  auVar445._0_4_ = auVar211._0_4_ * auVar211._0_4_;
                  auVar445._4_4_ = auVar211._4_4_ * auVar211._4_4_;
                  auVar445._8_4_ = auVar211._8_4_ * auVar211._8_4_;
                  auVar445._12_4_ = auVar211._12_4_ * auVar211._12_4_;
                  auVar212 = vfmadd213ps_avx512vl(auVar181,auVar211,auVar463);
                  auVar212 = vfmadd213ps_avx512vl(auVar212,auVar211,auVar469);
                  auVar212 = vfmadd213ps_avx512vl(auVar212,auVar211,auVar475);
                  auVar212 = vfmadd213ps_avx512vl(auVar212,auVar211,auVar481);
                  auVar212 = vfmadd213ps_avx512vl(auVar212,auVar211,auVar386);
                  auVar211 = vfmadd213ps_avx512vl(auVar212,auVar445,auVar211);
                  auVar212 = vaddps_avx512vl(auVar211,auVar398);
                  auVar211 = vcvttps2dq_avx512vl(auVar220);
                  auVar211 = vpslld_avx(auVar211,0x17);
                  auVar211 = vpaddd_avx(auVar211,auVar488);
                  auVar212 = vfmadd213ps_fma(auVar211,auVar212,auVar398);
                  auVar211 = vrcpps_avx(auVar212);
                  auVar213 = vaddps_avx512vl(auVar211,auVar211);
                  in_ZMM16 = ZEXT1664(auVar213);
                  auVar212 = vfmsub213ps_avx512vl(auVar212,auVar213,auVar210);
                  auVar211 = vfnmadd213ps_avx512vl(auVar212,auVar211,auVar213);
                  auVar215 = vfmsub231ps_fma(auVar215,auVar215,auVar211);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar417._4_4_ = uVar2;
                  auVar417._0_4_ = uVar2;
                  auVar417._8_4_ = uVar2;
                  auVar417._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar52._4_4_ = uVar2;
                  auVar52._0_4_ = uVar2;
                  auVar52._8_4_ = uVar2;
                  auVar52._12_4_ = uVar2;
                  auVar211 = vfmadd213ps_avx512vl(auVar417,auVar215,auVar52);
                  auVar211 = vmaxps_avx(auVar211,auVar222);
                  auVar211 = vminps_avx(auVar211,auVar398);
                  auVar359._0_4_ = auVar211._0_4_ * auVar215._0_4_;
                  auVar359._4_4_ = auVar211._4_4_ * auVar215._4_4_;
                  auVar359._8_4_ = auVar211._8_4_ * auVar215._8_4_;
                  auVar359._12_4_ = auVar211._12_4_ * auVar215._12_4_;
                  auVar215 = auVar359;
                }
                *(undefined1 (*) [16])pAVar158 = auVar215;
                pAVar158 = pAVar158 + 2;
                uVar163 = uVar163 + 1;
                iVar174 = iVar174 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar166 = iVar166 + 1;
          } while (iVar166 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_228.c);
    }
    if (((iVar173 == 1) && (uVar146 == 8)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar145 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      iVar142 = *(int *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      pvVar176 = (void *)(ulong)uVar9;
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      local_2f8 = 0;
      auVar378._8_4_ = 0x42b0c0a5;
      auVar378._0_8_ = 0x42b0c0a542b0c0a5;
      auVar378._12_4_ = 0x42b0c0a5;
      auVar378._16_4_ = 0x42b0c0a5;
      auVar378._20_4_ = 0x42b0c0a5;
      auVar378._24_4_ = 0x42b0c0a5;
      auVar378._28_4_ = 0x42b0c0a5;
      auVar385._8_4_ = 0xc2b0c0a5;
      auVar385._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar385._12_4_ = 0xc2b0c0a5;
      auVar385._16_4_ = 0xc2b0c0a5;
      auVar385._20_4_ = 0xc2b0c0a5;
      auVar385._24_4_ = 0xc2b0c0a5;
      auVar385._28_4_ = 0xc2b0c0a5;
      auVar391._8_4_ = 0x3f000000;
      auVar391._0_8_ = 0x3f0000003f000000;
      auVar391._12_4_ = 0x3f000000;
      auVar391._16_4_ = 0x3f000000;
      auVar391._20_4_ = 0x3f000000;
      auVar391._24_4_ = 0x3f000000;
      auVar391._28_4_ = 0x3f000000;
      auVar397._8_4_ = 0x3fb8aa3b;
      auVar397._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar397._12_4_ = 0x3fb8aa3b;
      auVar397._16_4_ = 0x3fb8aa3b;
      auVar397._20_4_ = 0x3fb8aa3b;
      auVar397._24_4_ = 0x3fb8aa3b;
      auVar397._28_4_ = 0x3fb8aa3b;
      auVar403._8_4_ = 0x3f800000;
      auVar403._0_8_ = 0x3f8000003f800000;
      auVar403._12_4_ = 0x3f800000;
      auVar403._16_4_ = 0x3f800000;
      auVar403._20_4_ = 0x3f800000;
      auVar403._24_4_ = 0x3f800000;
      auVar403._28_4_ = 0x3f800000;
      auVar409._8_4_ = 0x3f318000;
      auVar409._0_8_ = 0x3f3180003f318000;
      auVar409._12_4_ = 0x3f318000;
      auVar409._16_4_ = 0x3f318000;
      auVar409._20_4_ = 0x3f318000;
      auVar409._24_4_ = 0x3f318000;
      auVar409._28_4_ = 0x3f318000;
      auVar235 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar468._8_4_ = 0x3ab743ce;
      auVar468._0_8_ = 0x3ab743ce3ab743ce;
      auVar468._12_4_ = 0x3ab743ce;
      auVar468._16_4_ = 0x3ab743ce;
      auVar468._20_4_ = 0x3ab743ce;
      auVar468._24_4_ = 0x3ab743ce;
      auVar468._28_4_ = 0x3ab743ce;
      auVar474._8_4_ = 0x3c088908;
      auVar474._0_8_ = 0x3c0889083c088908;
      auVar474._12_4_ = 0x3c088908;
      auVar474._16_4_ = 0x3c088908;
      auVar474._20_4_ = 0x3c088908;
      auVar474._24_4_ = 0x3c088908;
      auVar474._28_4_ = 0x3c088908;
      auVar480._8_4_ = 0x3d2aa9c1;
      auVar480._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar480._12_4_ = 0x3d2aa9c1;
      auVar480._16_4_ = 0x3d2aa9c1;
      auVar480._20_4_ = 0x3d2aa9c1;
      auVar480._24_4_ = 0x3d2aa9c1;
      auVar480._28_4_ = 0x3d2aa9c1;
      auVar486._8_4_ = 0x3e2aaaaa;
      auVar486._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar486._12_4_ = 0x3e2aaaaa;
      auVar486._16_4_ = 0x3e2aaaaa;
      auVar486._20_4_ = 0x3e2aaaaa;
      auVar486._24_4_ = 0x3e2aaaaa;
      auVar486._28_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT3264(auVar486);
      auVar493._8_4_ = 0x3f800000;
      auVar493._0_8_ = 0x3f8000003f800000;
      auVar493._12_4_ = 0x3f800000;
      auVar493._16_4_ = 0x3f800000;
      auVar493._20_4_ = 0x3f800000;
      auVar493._24_4_ = 0x3f800000;
      auVar493._28_4_ = 0x3f800000;
      auVar499._8_4_ = 0xb95e8083;
      auVar499._0_8_ = 0xb95e8083b95e8083;
      auVar499._12_4_ = 0xb95e8083;
      auVar499._16_4_ = 0xb95e8083;
      auVar499._20_4_ = 0xb95e8083;
      auVar499._24_4_ = 0xb95e8083;
      auVar499._28_4_ = 0xb95e8083;
      auVar236 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      in_ZMM20 = ZEXT3264(auVar236);
      auVar257 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT3264(auVar257);
      auVar258 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar259 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar260 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar261 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar262 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar263 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar264 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar265 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar266 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar267 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar175 = bottom_blob->w;
          iVar166 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar174 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar138 = (1 - uVar9) * iVar145;
              do {
                if (lVar160 == 0) {
                  auVar341 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar341 = ZEXT3264(*(undefined1 (*) [32])(lVar160 + local_2f8 * 0x20));
                }
                if (0 < (int)uVar10) {
                  pvVar150 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      pvVar177 = (void *)0x0;
                      uVar162 = 0;
                      do {
                        iVar139 = (((int)uVar162 - uVar157) + 1) * iVar152 + iVar174;
                        if (((-1 < iVar139) && (iVar140 = iVar139 / iVar161, iVar139 % iVar161 == 0)
                            ) && ((iVar140 < iVar166 && (pvVar151 = pvVar176, 0 < (int)uVar9)))) {
                          pvVar168 = pvVar177;
                          iVar139 = iVar138;
                          do {
                            if (((-1 < iVar139) &&
                                (iVar141 = iVar139 / iVar172, iVar139 % iVar172 == 0)) &&
                               (iVar141 < iVar175)) {
                              uVar11 = *(undefined4 *)
                                        ((long)bottom_blob->data +
                                        (long)iVar141 * 4 +
                                        (long)iVar140 * (long)bottom_blob->w * bottom_blob->elemsize
                                        + bottom_blob->cstep * bottom_blob->elemsize * uVar149);
                              auVar436._4_4_ = uVar11;
                              auVar436._0_4_ = uVar11;
                              auVar436._8_4_ = uVar11;
                              auVar436._12_4_ = uVar11;
                              auVar436._16_4_ = uVar11;
                              auVar436._20_4_ = uVar11;
                              auVar436._24_4_ = uVar11;
                              auVar436._28_4_ = uVar11;
                              auVar181 = vfmadd231ps_fma(auVar341._0_32_,auVar436,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar150 +
                                                          ((ulong)pvVar168 & 0xffffffff) * 4));
                              auVar341 = ZEXT1664(auVar181);
                            }
                            pvVar168 = (void *)((long)pvVar168 + 8);
                            iVar139 = iVar139 + iVar145;
                            pvVar151 = (void *)((long)pvVar151 - 1);
                          } while (pvVar151 != (void *)0x0);
                        }
                        uVar162 = uVar162 + 1;
                        pvVar177 = (void *)((long)pvVar177 + (long)pvVar176 * 8);
                      } while (uVar162 != uVar157);
                    }
                    pvVar150 = (void *)((long)pvVar150 + (long)(int)(uVar9 * uVar157 * 8) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                auVar268 = auVar341._0_32_;
                if (iVar142 - 1U < 6) {
                  auVar237 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar370._28_36_ = auVar341._28_36_;
                  switch(iVar142) {
                  case 1:
                    auVar268 = vmaxps_avx(auVar268,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar238 = vmaxps_avx(auVar268,auVar237);
                    auVar268 = vminps_avx(auVar268,auVar237);
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar122._4_4_ = uVar11;
                    auVar122._0_4_ = uVar11;
                    auVar122._8_4_ = uVar11;
                    auVar122._12_4_ = uVar11;
                    auVar122._16_4_ = uVar11;
                    auVar122._20_4_ = uVar11;
                    auVar122._24_4_ = uVar11;
                    auVar122._28_4_ = uVar11;
                    auVar268 = vfmadd132ps_avx512vl(auVar268,auVar238,auVar122);
                    break;
                  case 3:
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar120._4_4_ = uVar11;
                    auVar120._0_4_ = uVar11;
                    auVar120._8_4_ = uVar11;
                    auVar120._12_4_ = uVar11;
                    auVar120._16_4_ = uVar11;
                    auVar120._20_4_ = uVar11;
                    auVar120._24_4_ = uVar11;
                    auVar120._28_4_ = uVar11;
                    auVar268 = vmaxps_avx512vl(auVar268,auVar120);
                    uVar11 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                    auVar121._4_4_ = uVar11;
                    auVar121._0_4_ = uVar11;
                    auVar121._8_4_ = uVar11;
                    auVar121._12_4_ = uVar11;
                    auVar121._16_4_ = uVar11;
                    auVar121._20_4_ = uVar11;
                    auVar121._24_4_ = uVar11;
                    auVar121._28_4_ = uVar11;
                    auVar268 = vminps_avx512vl(auVar268,auVar121);
                    break;
                  case 4:
                    auVar118._8_4_ = 0x80000000;
                    auVar118._0_8_ = 0x8000000080000000;
                    auVar118._12_4_ = 0x80000000;
                    auVar118._16_4_ = 0x80000000;
                    auVar118._20_4_ = 0x80000000;
                    auVar118._24_4_ = 0x80000000;
                    auVar118._28_4_ = 0x80000000;
                    auVar268 = vxorps_avx512vl(auVar268,auVar118);
                    auVar268 = vminps_avx(auVar268,auVar378);
                    auVar268 = vmaxps_avx(auVar268,auVar385);
                    auVar181 = vfmadd231ps_fma(auVar391,auVar268,auVar397);
                    auVar237 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar237,1);
                    auVar238 = vsubps_avx512vl(auVar237,auVar403);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar286._0_4_ = (uint)bVar24 * auVar238._0_4_ | (uint)!bVar24 * auVar237._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar286._4_4_ = (uint)bVar24 * auVar238._4_4_ | (uint)!bVar24 * auVar237._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar286._8_4_ = (uint)bVar24 * auVar238._8_4_ | (uint)!bVar24 * auVar237._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar286._12_4_ =
                         (uint)bVar24 * auVar238._12_4_ | (uint)!bVar24 * auVar237._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar286._16_4_ =
                         (uint)bVar24 * auVar238._16_4_ | (uint)!bVar24 * auVar237._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar286._20_4_ =
                         (uint)bVar24 * auVar238._20_4_ | (uint)!bVar24 * auVar237._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar286._24_4_ =
                         (uint)bVar24 * auVar238._24_4_ | (uint)!bVar24 * auVar237._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar286._28_4_ =
                         (uint)bVar24 * auVar238._28_4_ | (uint)!bVar24 * auVar237._28_4_;
                    in_ZMM16 = ZEXT3264(auVar286);
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar286,auVar409);
                    auVar119._8_4_ = 0x395e8083;
                    auVar119._0_8_ = 0x395e8083395e8083;
                    auVar119._12_4_ = 0x395e8083;
                    auVar119._16_4_ = 0x395e8083;
                    auVar119._20_4_ = 0x395e8083;
                    auVar119._24_4_ = 0x395e8083;
                    auVar119._28_4_ = 0x395e8083;
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar286,auVar119);
                    auVar437._0_4_ = auVar268._0_4_ * auVar268._0_4_;
                    auVar437._4_4_ = auVar268._4_4_ * auVar268._4_4_;
                    auVar437._8_4_ = auVar268._8_4_ * auVar268._8_4_;
                    auVar437._12_4_ = auVar268._12_4_ * auVar268._12_4_;
                    auVar437._16_4_ = auVar268._16_4_ * auVar268._16_4_;
                    auVar437._20_4_ = auVar268._20_4_ * auVar268._20_4_;
                    auVar437._24_4_ = auVar268._24_4_ * auVar268._24_4_;
                    auVar437._28_4_ = 0;
                    auVar181 = vfmadd213ps_fma(auVar235,auVar268,auVar468);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar268,auVar474);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar268,auVar480);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar268,auVar486);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar268,auVar391);
                    auVar181 = vfmadd213ps_fma(ZEXT1632(auVar181),auVar437,auVar268);
                    auVar438._0_4_ = auVar181._0_4_ + 1.0;
                    auVar438._4_4_ = auVar181._4_4_ + 1.0;
                    auVar438._8_4_ = auVar181._8_4_ + 1.0;
                    auVar438._12_4_ = auVar181._12_4_ + 1.0;
                    auVar438._16_4_ = 0x3f800000;
                    auVar438._20_4_ = 0x3f800000;
                    auVar438._24_4_ = 0x3f800000;
                    auVar438._28_4_ = 0x3f800000;
                    auVar268 = vcvttps2dq_avx512vl(auVar286);
                    auVar268 = vpslld_avx2(auVar268,0x17);
                    auVar268 = vpaddd_avx2(auVar493,auVar268);
                    auVar181 = vfmadd213ps_fma(auVar268,auVar438,auVar403);
                    auVar268 = vrcpps_avx(ZEXT1632(auVar181));
                    auVar181 = vfmsub213ps_fma(ZEXT1632(auVar181),auVar268,auVar403);
                    auVar181 = vfnmadd132ps_fma(ZEXT1632(auVar181),auVar268,auVar268);
                    auVar268 = ZEXT1632(auVar181);
                    break;
                  case 5:
                    auVar268 = vminps_avx(auVar268,auVar378);
                    auVar268 = vmaxps_avx(auVar268,auVar385);
                    auVar181 = vfmadd213ps_fma(auVar397,auVar268,auVar391);
                    auVar238 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar238,1);
                    auVar239 = vsubps_avx512vl(auVar238,auVar403);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar281._0_4_ = (uint)bVar24 * auVar239._0_4_ | (uint)!bVar24 * auVar238._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar281._4_4_ = (uint)bVar24 * auVar239._4_4_ | (uint)!bVar24 * auVar238._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar281._8_4_ = (uint)bVar24 * auVar239._8_4_ | (uint)!bVar24 * auVar238._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar281._12_4_ =
                         (uint)bVar24 * auVar239._12_4_ | (uint)!bVar24 * auVar238._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar281._16_4_ =
                         (uint)bVar24 * auVar239._16_4_ | (uint)!bVar24 * auVar238._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar281._20_4_ =
                         (uint)bVar24 * auVar239._20_4_ | (uint)!bVar24 * auVar238._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar281._24_4_ =
                         (uint)bVar24 * auVar239._24_4_ | (uint)!bVar24 * auVar238._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar281._28_4_ =
                         (uint)bVar24 * auVar239._28_4_ | (uint)!bVar24 * auVar238._28_4_;
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar281,auVar409);
                    auVar268 = vfnmsub231ps_avx512vl(auVar268,auVar281,auVar499);
                    auVar461._0_4_ = auVar268._0_4_ * auVar268._0_4_;
                    auVar461._4_4_ = auVar268._4_4_ * auVar268._4_4_;
                    auVar461._8_4_ = auVar268._8_4_ * auVar268._8_4_;
                    auVar461._12_4_ = auVar268._12_4_ * auVar268._12_4_;
                    auVar461._16_4_ = auVar268._16_4_ * auVar268._16_4_;
                    auVar461._20_4_ = auVar268._20_4_ * auVar268._20_4_;
                    auVar461._24_4_ = auVar268._24_4_ * auVar268._24_4_;
                    auVar461._28_4_ = 0;
                    auVar238 = vfmadd213ps_avx512vl(auVar235,auVar268,auVar468);
                    auVar238 = vfmadd213ps_avx512vl(auVar238,auVar268,auVar474);
                    auVar238 = vfmadd213ps_avx512vl(auVar238,auVar268,auVar480);
                    auVar238 = vfmadd213ps_avx512vl(auVar238,auVar268,auVar486);
                    auVar238 = vfmadd213ps_avx512vl(auVar238,auVar268,auVar391);
                    auVar268 = vfmadd213ps_avx512vl(auVar238,auVar461,auVar268);
                    auVar238 = vaddps_avx512vl(auVar268,auVar403);
                    auVar268 = vcvttps2dq_avx512vl(auVar281);
                    auVar268 = vpslld_avx2(auVar268,0x17);
                    auVar268 = vpaddd_avx2(auVar268,auVar493);
                    auVar181 = vfmadd213ps_fma(auVar268,auVar238,auVar403);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar237,2);
                    auVar115._8_4_ = 0x800000;
                    auVar115._0_8_ = 0x80000000800000;
                    auVar115._12_4_ = 0x800000;
                    auVar115._16_4_ = 0x800000;
                    auVar115._20_4_ = 0x800000;
                    auVar115._24_4_ = 0x800000;
                    auVar115._28_4_ = 0x800000;
                    auVar268 = vmaxps_avx512vl(ZEXT1632(auVar181),auVar115);
                    auVar239 = vpsrld_avx2(auVar268,0x17);
                    auVar237 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar116._8_4_ = 0x3f000000;
                    auVar116._0_8_ = 0x3f0000003f000000;
                    auVar116._12_4_ = 0x3f000000;
                    auVar116._16_4_ = 0x3f000000;
                    auVar116._20_4_ = 0x3f000000;
                    auVar116._24_4_ = 0x3f000000;
                    auVar116._28_4_ = 0x3f000000;
                    auVar268 = vpternlogd_avx512vl(auVar268,auVar237,auVar116,0xea);
                    uVar162 = vcmpps_avx512vl(auVar268,auVar236,1);
                    auVar237 = vaddps_avx512vl(auVar268,auVar257);
                    auVar268 = vaddps_avx512vl(auVar237,auVar268);
                    bVar24 = (bool)((byte)uVar162 & 1);
                    auVar282._0_4_ = (uint)bVar24 * auVar268._0_4_ | (uint)!bVar24 * auVar237._0_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                    auVar282._4_4_ = (uint)bVar24 * auVar268._4_4_ | (uint)!bVar24 * auVar237._4_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                    auVar282._8_4_ = (uint)bVar24 * auVar268._8_4_ | (uint)!bVar24 * auVar237._8_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                    auVar282._12_4_ =
                         (uint)bVar24 * auVar268._12_4_ | (uint)!bVar24 * auVar237._12_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                    auVar282._16_4_ =
                         (uint)bVar24 * auVar268._16_4_ | (uint)!bVar24 * auVar237._16_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                    auVar282._20_4_ =
                         (uint)bVar24 * auVar268._20_4_ | (uint)!bVar24 * auVar237._20_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                    auVar282._24_4_ =
                         (uint)bVar24 * auVar268._24_4_ | (uint)!bVar24 * auVar237._24_4_;
                    bVar24 = SUB81(uVar162 >> 7,0);
                    auVar282._28_4_ =
                         (uint)bVar24 * auVar268._28_4_ | (uint)!bVar24 * auVar237._28_4_;
                    auVar237 = vmulps_avx512vl(auVar282,auVar282);
                    auVar268 = vfmadd213ps_avx512vl(auVar258,auVar282,auVar259);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar282,auVar260);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar282,auVar261);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar282,auVar262);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar282,auVar263);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar282,auVar264);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar282,auVar265);
                    auVar268 = vfmadd213ps_avx512vl(auVar268,auVar282,auVar266);
                    auVar238 = vmulps_avx512vl(auVar237,auVar282);
                    auVar238 = vmulps_avx512vl(auVar238,auVar268);
                    auVar117._8_4_ = 0xffffff82;
                    auVar117._0_8_ = 0xffffff82ffffff82;
                    auVar117._12_4_ = 0xffffff82;
                    auVar117._16_4_ = 0xffffff82;
                    auVar117._20_4_ = 0xffffff82;
                    auVar117._24_4_ = 0xffffff82;
                    auVar117._28_4_ = 0xffffff82;
                    auVar268 = vpaddd_avx512vl(auVar239,auVar117);
                    auVar268 = vcvtdq2ps_avx(auVar268);
                    auVar239 = vsubps_avx512vl(auVar268,auVar403);
                    bVar24 = (bool)((byte)uVar162 & 1);
                    auVar283._0_4_ = (uint)bVar24 * auVar239._0_4_ | (uint)!bVar24 * auVar268._0_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                    auVar283._4_4_ = (uint)bVar24 * auVar239._4_4_ | (uint)!bVar24 * auVar268._4_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                    auVar283._8_4_ = (uint)bVar24 * auVar239._8_4_ | (uint)!bVar24 * auVar268._8_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                    auVar283._12_4_ =
                         (uint)bVar24 * auVar239._12_4_ | (uint)!bVar24 * auVar268._12_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 4) & 1);
                    auVar283._16_4_ =
                         (uint)bVar24 * auVar239._16_4_ | (uint)!bVar24 * auVar268._16_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 5) & 1);
                    auVar283._20_4_ =
                         (uint)bVar24 * auVar239._20_4_ | (uint)!bVar24 * auVar268._20_4_;
                    bVar24 = (bool)((byte)(uVar162 >> 6) & 1);
                    auVar283._24_4_ =
                         (uint)bVar24 * auVar239._24_4_ | (uint)!bVar24 * auVar268._24_4_;
                    bVar24 = SUB81(uVar162 >> 7,0);
                    auVar283._28_4_ =
                         (uint)bVar24 * auVar239._28_4_ | (uint)!bVar24 * auVar268._28_4_;
                    auVar268 = vfmadd231ps_avx512vl(auVar238,auVar283,auVar499);
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar391,auVar237);
                    auVar268 = vsubps_avx512vl(auVar268,auVar282);
                    auVar181 = vfmsub231ps_fma(auVar268,auVar409,auVar283);
                    auVar268 = vmulps_avx512vl(ZEXT1632(auVar181),auVar267);
                    auVar237 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar284._0_4_ = (uint)bVar24 * auVar237._0_4_ | (uint)!bVar24 * auVar268._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar284._4_4_ = (uint)bVar24 * auVar237._4_4_ | (uint)!bVar24 * auVar268._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar284._8_4_ = (uint)bVar24 * auVar237._8_4_ | (uint)!bVar24 * auVar268._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar284._12_4_ =
                         (uint)bVar24 * auVar237._12_4_ | (uint)!bVar24 * auVar268._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar284._16_4_ =
                         (uint)bVar24 * auVar237._16_4_ | (uint)!bVar24 * auVar268._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar284._20_4_ =
                         (uint)bVar24 * auVar237._20_4_ | (uint)!bVar24 * auVar268._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar284._24_4_ =
                         (uint)bVar24 * auVar237._24_4_ | (uint)!bVar24 * auVar268._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar284._28_4_ =
                         (uint)bVar24 * auVar237._28_4_ | (uint)!bVar24 * auVar268._28_4_;
                    auVar268 = vminps_avx(auVar284,auVar378);
                    auVar268 = vmaxps_avx(auVar268,auVar385);
                    auVar181 = vfmadd213ps_fma(auVar397,auVar268,auVar391);
                    auVar237 = vrndscaleps_avx512vl(ZEXT1632(auVar181),1);
                    uVar149 = vcmpps_avx512vl(ZEXT1632(auVar181),auVar237,1);
                    auVar238 = vsubps_avx512vl(auVar237,auVar403);
                    bVar24 = (bool)((byte)uVar149 & 1);
                    auVar285._0_4_ = (uint)bVar24 * auVar238._0_4_ | (uint)!bVar24 * auVar237._0_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                    auVar285._4_4_ = (uint)bVar24 * auVar238._4_4_ | (uint)!bVar24 * auVar237._4_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                    auVar285._8_4_ = (uint)bVar24 * auVar238._8_4_ | (uint)!bVar24 * auVar237._8_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                    auVar285._12_4_ =
                         (uint)bVar24 * auVar238._12_4_ | (uint)!bVar24 * auVar237._12_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 4) & 1);
                    auVar285._16_4_ =
                         (uint)bVar24 * auVar238._16_4_ | (uint)!bVar24 * auVar237._16_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 5) & 1);
                    auVar285._20_4_ =
                         (uint)bVar24 * auVar238._20_4_ | (uint)!bVar24 * auVar237._20_4_;
                    bVar24 = (bool)((byte)(uVar149 >> 6) & 1);
                    auVar285._24_4_ =
                         (uint)bVar24 * auVar238._24_4_ | (uint)!bVar24 * auVar237._24_4_;
                    bVar24 = SUB81(uVar149 >> 7,0);
                    auVar285._28_4_ =
                         (uint)bVar24 * auVar238._28_4_ | (uint)!bVar24 * auVar237._28_4_;
                    in_ZMM16 = ZEXT3264(auVar285);
                    auVar268 = vfmsub231ps_avx512vl(auVar268,auVar285,auVar409);
                    auVar268 = vfnmsub231ps_avx512vl(auVar268,auVar285,auVar499);
                    auVar462._0_4_ = auVar268._0_4_ * auVar268._0_4_;
                    auVar462._4_4_ = auVar268._4_4_ * auVar268._4_4_;
                    auVar462._8_4_ = auVar268._8_4_ * auVar268._8_4_;
                    auVar462._12_4_ = auVar268._12_4_ * auVar268._12_4_;
                    auVar462._16_4_ = auVar268._16_4_ * auVar268._16_4_;
                    auVar462._20_4_ = auVar268._20_4_ * auVar268._20_4_;
                    auVar462._24_4_ = auVar268._24_4_ * auVar268._24_4_;
                    auVar462._28_4_ = 0;
                    auVar237 = vfmadd213ps_avx512vl(auVar235,auVar268,auVar468);
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar268,auVar474);
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar268,auVar480);
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar268,auVar486);
                    auVar237 = vfmadd213ps_avx512vl(auVar237,auVar268,auVar391);
                    auVar268 = vfmadd213ps_avx512vl(auVar237,auVar462,auVar268);
                    auVar237 = vaddps_avx512vl(auVar268,auVar403);
                    auVar268 = vcvttps2dq_avx512vl(auVar285);
                    auVar268 = vpslld_avx2(auVar268,0x17);
                    auVar268 = vpaddd_avx2(auVar268,auVar493);
                    auVar181 = vfmadd213ps_fma(auVar268,auVar237,auVar403);
                    auVar268 = vrcpps_avx(ZEXT1632(auVar181));
                    auVar181 = vfmsub213ps_fma(ZEXT1632(auVar181),auVar268,auVar403);
                    auVar181 = vfnmadd132ps_fma(ZEXT1632(auVar181),auVar268,auVar268);
                    auVar268 = vfnmadd213ps_avx512vl(ZEXT1632(auVar181),auVar267,auVar257);
                    auVar370._0_4_ = auVar268._0_4_ * auVar341._0_4_;
                    auVar370._4_4_ = auVar268._4_4_ * auVar341._4_4_;
                    auVar370._8_4_ = auVar268._8_4_ * auVar341._8_4_;
                    auVar370._12_4_ = auVar268._12_4_ * auVar341._12_4_;
                    auVar370._16_4_ = auVar268._16_4_ * auVar341._16_4_;
                    auVar370._20_4_ = auVar268._20_4_ * auVar341._20_4_;
                    auVar370._24_4_ = auVar268._24_4_ * auVar341._24_4_;
                    auVar268 = auVar370._0_32_;
                    break;
                  case 6:
                    uVar11 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                    auVar439._4_4_ = uVar11;
                    auVar439._0_4_ = uVar11;
                    auVar439._8_4_ = uVar11;
                    auVar439._12_4_ = uVar11;
                    auVar439._16_4_ = uVar11;
                    auVar439._20_4_ = uVar11;
                    auVar439._24_4_ = uVar11;
                    auVar439._28_4_ = uVar11;
                    uVar11 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                    auVar114._4_4_ = uVar11;
                    auVar114._0_4_ = uVar11;
                    auVar114._8_4_ = uVar11;
                    auVar114._12_4_ = uVar11;
                    auVar114._16_4_ = uVar11;
                    auVar114._20_4_ = uVar11;
                    auVar114._24_4_ = uVar11;
                    auVar114._28_4_ = uVar11;
                    auVar268 = vfmadd213ps_avx512vl(auVar439,auVar268,auVar114);
                    auVar268 = vmaxps_avx(auVar268,auVar237);
                    auVar268 = vminps_avx(auVar268,auVar403);
                    auVar371._0_4_ = auVar268._0_4_ * auVar341._0_4_;
                    auVar371._4_4_ = auVar268._4_4_ * auVar341._4_4_;
                    auVar371._8_4_ = auVar268._8_4_ * auVar341._8_4_;
                    auVar371._12_4_ = auVar268._12_4_ * auVar341._12_4_;
                    auVar371._16_4_ = auVar268._16_4_ * auVar341._16_4_;
                    auVar371._20_4_ = auVar268._20_4_ * auVar341._20_4_;
                    auVar371._24_4_ = auVar268._24_4_ * auVar341._24_4_;
                    auVar371._28_36_ = auVar370._28_36_;
                    auVar268 = auVar371._0_32_;
                  }
                }
                *(undefined1 (*) [32])pAVar158 = auVar268;
                pAVar158 = pAVar158 + 4;
                uVar163 = uVar163 + 1;
                iVar138 = iVar138 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar174 = iVar174 + 1;
          } while (iVar174 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_228.c);
    }
    if (((iVar173 == 8) && (uVar146 == 1)) && (local_1d0 = (long)local_228.c, 0 < local_1d0)) {
      p_Var13 = local_1e0[-3];
      uVar9 = *(uint *)(&this->field_0xdc + (long)p_Var13);
      pvVar151 = (void *)(ulong)uVar9;
      iVar145 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar145;
      iVar152 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar157 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      local_188 = (Allocator *)local_228.data;
      local_180 = (Allocator *)
                  (CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize) * local_228.cstep);
      uVar163 = bottom_blob->w;
      pvVar168 = (void *)(ulong)uVar163;
      iVar142 = bottom_blob->h;
      uVar12 = bottom_blob->c;
      local_168._0_4_ = local_228.h;
      local_2f8 = 0;
      do {
        if (0 < (int)local_168._0_4_) {
          sVar15 = (this->weight_data_tm).cstep;
          sVar16 = (this->weight_data_tm).elemsize;
          local_2d0 = (Allocator *)((long)&local_188->_vptr_Allocator + (long)local_180 * local_2f8)
          ;
          pvVar176 = (this->weight_data_tm).data;
          iVar175 = 0;
          do {
            if (0 < iVar8) {
              iVar174 = bottom_blob->w;
              pvVar150 = bottom_blob->data;
              sVar17 = bottom_blob->elemsize;
              sVar18 = bottom_blob->cstep;
              local_1c8._0_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var13);
              uVar148 = 0;
              iVar166 = (1 - uVar157) * uVar9;
              do {
                if (lVar160 == 0) {
                  fVar357 = 0.0;
                }
                else {
                  fVar357 = *(float *)(lVar160 + local_2f8 * 4);
                }
                if ((int)uVar12 < 1) {
                  auVar235 = SUB6432(ZEXT864(0),0);
                }
                else {
                  auVar341 = ZEXT864(0);
                  uVar149 = 0;
                  pvVar177 = (void *)(sVar15 * local_2f8 * sVar16 + (long)pvVar176);
                  do {
                    if (0 < (int)uVar10) {
                      uVar147 = 0;
                      uVar162 = 0;
                      do {
                        iVar138 = (((int)uVar162 - uVar10) + 1) * iVar145 + iVar175;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar172, iVar138 % iVar172 == 0)
                            ) && ((0 < (int)uVar157 && (iVar139 < iVar142)))) {
                          uVar164 = (ulong)uVar157;
                          uVar155 = uVar147;
                          iVar138 = iVar166;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar140 = iVar138 / iVar152, iVar138 % iVar152 == 0)) &&
                               (iVar140 < (int)uVar163)) {
                              auVar181 = vfmadd231ps_fma(auVar341._0_32_,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar150 +
                                                          (long)(iVar140 << 3) * 4 +
                                                          (long)iVar139 * (long)iVar174 * sVar17 +
                                                          sVar18 * sVar17 * uVar149),
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar177 +
                                                          (uVar155 & 0xffffffff) * 4));
                              auVar341 = ZEXT1664(auVar181);
                            }
                            uVar155 = uVar155 + 8;
                            iVar138 = iVar138 + uVar9;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar162 = uVar162 + 1;
                        uVar147 = uVar147 + (ulong)uVar157 * 8;
                      } while (uVar162 != uVar10);
                    }
                    auVar235 = auVar341._0_32_;
                    pvVar177 = (void *)((long)pvVar177 + (long)(int)(uVar157 * uVar10 * 8) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar12);
                }
                auVar360._0_4_ = auVar235._16_4_ + auVar235._0_4_;
                auVar360._4_4_ = auVar235._20_4_ + auVar235._4_4_;
                auVar360._8_4_ = auVar235._24_4_ + auVar235._8_4_;
                auVar360._12_4_ = auVar235._28_4_ + auVar235._12_4_;
                auVar181 = vshufpd_avx(auVar360,auVar360,1);
                auVar361._0_4_ = auVar181._0_4_ + auVar360._0_4_;
                auVar361._4_4_ = auVar181._4_4_ + auVar360._4_4_;
                auVar361._8_4_ = auVar181._8_4_ + auVar360._8_4_;
                auVar361._12_4_ = auVar181._12_4_ + auVar360._12_4_;
                auVar181 = vmovshdup_avx(auVar361);
                fVar357 = auVar181._0_4_ + fVar357 + auVar361._0_4_;
                auVar181 = ZEXT416((uint)fVar357);
                fVar372 = fVar357;
                if (iVar161 - 1U < 6) {
                  switch(iVar161) {
                  case 1:
                    auVar181 = vmaxss_avx(ZEXT416((uint)fVar357),ZEXT416(0));
                    fVar372 = auVar181._0_4_;
                    break;
                  case 2:
                    uVar42 = vcmpss_avx512f(ZEXT416((uint)fVar357),ZEXT416(0),0xe);
                    bVar24 = (bool)((byte)uVar42 & 1);
                    fVar372 = (float)((uint)bVar24 * 0x3f800000 +
                                     (uint)!bVar24 * (int)*(float *)local_1c8._0_8_) * fVar357;
                    break;
                  case 3:
                    auVar181 = vmaxss_avx(auVar181,ZEXT416((uint)*(float *)local_1c8._0_8_));
                    fVar372 = auVar181._0_4_;
                    if (*(float *)(local_1c8._0_8_ + 4) < auVar181._0_4_) {
                      fVar372 = *(float *)(local_1c8._0_8_ + 4);
                    }
                    break;
                  case 4:
                    auVar181 = vminss_avx(auVar181,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar65._8_4_ = 0x80000000;
                    auVar65._0_8_ = 0x8000000080000000;
                    auVar65._12_4_ = 0x80000000;
                    auVar182 = vxorps_avx512vl(auVar181,auVar65);
                    uVar42 = vcmpss_avx512f(auVar181,ZEXT416(0xc2b0c0a5),1);
                    bVar24 = (bool)((byte)uVar42 & 1);
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar357 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                          (uint)!bVar24 * auVar182._0_4_));
                    fVar372 = 1.0 / (fVar357 + 1.0);
                    break;
                  case 5:
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar372 = expf(fVar357);
                    fVar372 = logf(fVar372 + 1.0);
                    fVar372 = tanhf(fVar372);
                    fVar372 = fVar372 * fVar357;
                    break;
                  case 6:
                    fVar3 = *(float *)local_1c8._0_8_;
                    auVar64._8_4_ = 0x80000000;
                    auVar64._0_8_ = 0x8000000080000000;
                    auVar64._12_4_ = 0x80000000;
                    auVar182 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)),
                                               auVar64);
                    fVar379 = auVar182._0_4_ / fVar3;
                    fVar372 = 0.0;
                    if ((fVar379 <= fVar357) &&
                       (fVar372 = fVar357, fVar357 <= fVar379 + 1.0 / fVar3)) {
                      auVar181 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar181,
                                                 ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)));
                      fVar372 = auVar181._0_4_ * fVar357;
                    }
                  }
                }
                *(float *)&local_2d0->_vptr_Allocator = fVar372;
                local_2d0 = (Allocator *)((long)&local_2d0->_vptr_Allocator + 4);
                uVar148 = uVar148 + 1;
                iVar166 = iVar166 + 1;
              } while (uVar148 != iVar8);
            }
            iVar175 = iVar175 + 1;
          } while (iVar175 != local_168._0_4_);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_1d0);
    }
    iVar8 = local_228.w;
    if (((iVar173 == 4) && (uVar146 == 4)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar145 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      uVar11 = *(undefined4 *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      local_2f8 = 0;
      auVar212 = ZEXT816(0) << 0x40;
      auVar374._8_4_ = 0x42b0c0a5;
      auVar374._0_8_ = 0x42b0c0a542b0c0a5;
      auVar374._12_4_ = 0x42b0c0a5;
      auVar381._8_4_ = 0xc2b0c0a5;
      auVar381._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar381._12_4_ = 0xc2b0c0a5;
      auVar387._8_4_ = 0x3f000000;
      auVar387._0_8_ = 0x3f0000003f000000;
      auVar387._12_4_ = 0x3f000000;
      auVar393._8_4_ = 0x3fb8aa3b;
      auVar393._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar393._12_4_ = 0x3fb8aa3b;
      auVar399._8_4_ = 0x3f800000;
      auVar399._0_8_ = 0x3f8000003f800000;
      auVar399._12_4_ = 0x3f800000;
      auVar405._8_4_ = 0x3f318000;
      auVar405._0_8_ = 0x3f3180003f318000;
      auVar405._12_4_ = 0x3f318000;
      auVar181 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar464._8_4_ = 0x3ab743ce;
      auVar464._0_8_ = 0x3ab743ce3ab743ce;
      auVar464._12_4_ = 0x3ab743ce;
      auVar470._8_4_ = 0x3c088908;
      auVar470._0_8_ = 0x3c0889083c088908;
      auVar470._12_4_ = 0x3c088908;
      auVar476._8_4_ = 0x3d2aa9c1;
      auVar476._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar476._12_4_ = 0x3d2aa9c1;
      auVar482._8_4_ = 0x3e2aaaaa;
      auVar482._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar482._12_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT1664(auVar482);
      auVar489._8_4_ = 0x3f800000;
      auVar489._0_8_ = 0x3f8000003f800000;
      auVar489._12_4_ = 0x3f800000;
      auVar495._8_4_ = 0xb95e8083;
      auVar495._0_8_ = 0xb95e8083b95e8083;
      auVar495._12_4_ = 0xb95e8083;
      auVar182 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      in_ZMM20 = ZEXT1664(auVar182);
      auVar183 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT1664(auVar183);
      auVar204 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar205 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar206 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar207 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar208 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar209 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar210 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar222 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar215 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar211 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar142 = bottom_blob->w;
          iVar175 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar166 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar174 = (1 - uVar9) * iVar145;
              do {
                if (lVar160 == 0) {
                  auVar213 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar213 = *(undefined1 (*) [16])(lVar160 + local_2f8 * 0x10);
                }
                auVar341 = ZEXT1664(auVar213);
                if (0 < (int)uVar10) {
                  pvVar176 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar150 = bottom_blob->data;
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      uVar162 = 0;
                      pvVar168 = (void *)0x0;
                      do {
                        iVar138 = (((int)pvVar168 - uVar157) + 1) * iVar152 + iVar166;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar161, iVar138 % iVar161 == 0)
                            ) && ((0 < (int)uVar9 && (iVar139 < iVar175)))) {
                          lVar159 = (long)iVar139 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar149;
                          pvVar151 = (void *)(ulong)uVar9;
                          uVar147 = uVar162;
                          iVar138 = iVar174;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar139 = iVar138 / iVar172, iVar138 % iVar172 == 0)) &&
                               (iVar139 < iVar142)) {
                              lVar143 = (long)(iVar139 << 2);
                              uVar2 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159);
                              auVar418._4_4_ = uVar2;
                              auVar418._0_4_ = uVar2;
                              auVar418._8_4_ = uVar2;
                              auVar418._12_4_ = uVar2;
                              uVar2 = *(undefined4 *)((long)pvVar150 + lVar143 * 4 + lVar159 + 4);
                              auVar446._4_4_ = uVar2;
                              auVar446._0_4_ = uVar2;
                              auVar446._8_4_ = uVar2;
                              auVar446._12_4_ = uVar2;
                              auVar214 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 8)));
                              in_ZMM16 = ZEXT1664(auVar214);
                              auVar184 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar150 +
                                                                     lVar143 * 4 + lVar159 + 0xc)));
                              uVar164 = uVar147 & 0xffffffff;
                              auVar213 = vfmadd231ps_fma(auVar341._0_16_,auVar418,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar176 + uVar164 * 4));
                              auVar213 = vfmadd231ps_fma(auVar213,auVar446,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar176 + uVar164 * 4 + 0x10));
                              auVar213 = vfmadd231ps_avx512vl
                                                   (auVar213,auVar214,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x20));
                              auVar213 = vfmadd231ps_avx512vl
                                                   (auVar213,auVar184,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar176 + uVar164 * 4 + 0x30));
                              auVar341 = ZEXT1664(auVar213);
                            }
                            uVar147 = uVar147 + 0x10;
                            iVar138 = iVar138 + iVar145;
                            pvVar151 = (void *)((long)pvVar151 - 1);
                          } while (pvVar151 != (void *)0x0);
                        }
                        pvVar168 = (void *)((long)pvVar168 + 1);
                        uVar162 = uVar162 + (long)(ulong)uVar9 * 0x10;
                      } while (pvVar168 != (void *)(ulong)uVar157);
                    }
                    auVar213 = auVar341._0_16_;
                    pvVar176 = (void *)((long)pvVar176 + (long)(int)(uVar9 * uVar157 * 0x10) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                switch(uVar11) {
                case 1:
                  auVar213 = vmaxps_avx(auVar213,auVar212);
                  break;
                case 2:
                  auVar214 = vmaxps_avx(auVar213,auVar212);
                  auVar213 = vminps_avx(auVar213,auVar212);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar74._4_4_ = uVar2;
                  auVar74._0_4_ = uVar2;
                  auVar74._8_4_ = uVar2;
                  auVar74._12_4_ = uVar2;
                  auVar213 = vfmadd132ps_avx512vl(auVar213,auVar214,auVar74);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar72._4_4_ = uVar2;
                  auVar72._0_4_ = uVar2;
                  auVar72._8_4_ = uVar2;
                  auVar72._12_4_ = uVar2;
                  auVar213 = vmaxps_avx512vl(auVar213,auVar72);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar73._4_4_ = uVar2;
                  auVar73._0_4_ = uVar2;
                  auVar73._8_4_ = uVar2;
                  auVar73._12_4_ = uVar2;
                  auVar213 = vminps_avx512vl(auVar213,auVar73);
                  break;
                case 4:
                  auVar70._8_4_ = 0x80000000;
                  auVar70._0_8_ = 0x8000000080000000;
                  auVar70._12_4_ = 0x80000000;
                  auVar213 = vxorps_avx512vl(auVar213,auVar70);
                  auVar213 = vminps_avx(auVar213,auVar374);
                  auVar213 = vmaxps_avx(auVar213,auVar381);
                  auVar214 = vfmadd231ps_fma(auVar387,auVar213,auVar393);
                  auVar184 = vcvttps2dq_avx512vl(auVar214);
                  auVar184 = vcvtdq2ps_avx512vl(auVar184);
                  uVar149 = vcmpps_avx512vl(auVar214,auVar184,1);
                  auVar214 = vsubps_avx512vl(auVar184,auVar399);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar228._0_4_ = (uint)bVar24 * auVar214._0_4_ | (uint)!bVar24 * auVar184._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar228._4_4_ = (uint)bVar24 * auVar214._4_4_ | (uint)!bVar24 * auVar184._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar228._8_4_ = (uint)bVar24 * auVar214._8_4_ | (uint)!bVar24 * auVar184._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar228._12_4_ = (uint)bVar24 * auVar214._12_4_ | (uint)!bVar24 * auVar184._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar228);
                  auVar213 = vfmsub231ps_avx512vl(auVar213,auVar228,auVar405);
                  auVar71._8_4_ = 0x395e8083;
                  auVar71._0_8_ = 0x395e8083395e8083;
                  auVar71._12_4_ = 0x395e8083;
                  auVar214 = vfmsub231ps_avx512vl(auVar213,auVar228,auVar71);
                  auVar419._0_4_ = auVar214._0_4_ * auVar214._0_4_;
                  auVar419._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                  auVar419._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                  auVar419._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                  auVar213 = vfmadd213ps_fma(auVar181,auVar214,auVar464);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar214,auVar470);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar214,auVar476);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar214,auVar482);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar214,auVar387);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar419,auVar214);
                  auVar420._0_4_ = auVar213._0_4_ + 1.0;
                  auVar420._4_4_ = auVar213._4_4_ + 1.0;
                  auVar420._8_4_ = auVar213._8_4_ + 1.0;
                  auVar420._12_4_ = auVar213._12_4_ + 1.0;
                  auVar213 = vcvttps2dq_avx512vl(auVar228);
                  auVar213 = vpslld_avx(auVar213,0x17);
                  auVar213 = vpaddd_avx(auVar489,auVar213);
                  auVar214 = vfmadd213ps_fma(auVar213,auVar420,auVar399);
                  auVar213 = vrcpps_avx(auVar214);
                  auVar214 = vfmsub213ps_fma(auVar214,auVar213,auVar399);
                  auVar213 = vfnmadd132ps_fma(auVar214,auVar213,auVar213);
                  break;
                case 5:
                  auVar214 = vminps_avx(auVar213,auVar374);
                  auVar214 = vmaxps_avx(auVar214,auVar381);
                  auVar184 = vfmadd213ps_fma(auVar393,auVar214,auVar387);
                  auVar185 = vcvttps2dq_avx512vl(auVar184);
                  auVar185 = vcvtdq2ps_avx512vl(auVar185);
                  uVar149 = vcmpps_avx512vl(auVar184,auVar185,1);
                  auVar184 = vsubps_avx512vl(auVar185,auVar399);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar223._0_4_ = (uint)bVar24 * auVar184._0_4_ | (uint)!bVar24 * auVar185._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar223._4_4_ = (uint)bVar24 * auVar184._4_4_ | (uint)!bVar24 * auVar185._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar223._8_4_ = (uint)bVar24 * auVar184._8_4_ | (uint)!bVar24 * auVar185._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar223._12_4_ = (uint)bVar24 * auVar184._12_4_ | (uint)!bVar24 * auVar185._12_4_
                  ;
                  auVar214 = vfmsub231ps_avx512vl(auVar214,auVar223,auVar405);
                  auVar214 = vfnmsub231ps_avx512vl(auVar214,auVar223,auVar495);
                  auVar447._0_4_ = auVar214._0_4_ * auVar214._0_4_;
                  auVar447._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                  auVar447._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                  auVar447._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                  auVar184 = vfmadd213ps_avx512vl(auVar181,auVar214,auVar464);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar470);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar476);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar482);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar387);
                  auVar214 = vfmadd213ps_avx512vl(auVar184,auVar447,auVar214);
                  auVar184 = vaddps_avx512vl(auVar214,auVar399);
                  auVar214 = vcvttps2dq_avx512vl(auVar223);
                  auVar214 = vpslld_avx(auVar214,0x17);
                  auVar214 = vpaddd_avx(auVar214,auVar489);
                  auVar214 = vfmadd213ps_fma(auVar214,auVar184,auVar399);
                  uVar149 = vcmpps_avx512vl(auVar214,auVar212,2);
                  auVar67._8_4_ = 0x800000;
                  auVar67._0_8_ = 0x80000000800000;
                  auVar67._12_4_ = 0x800000;
                  auVar214 = vmaxps_avx512vl(auVar214,auVar67);
                  auVar186 = vpsrld_avx(auVar214,0x17);
                  auVar184 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar68._8_4_ = 0x3f000000;
                  auVar68._0_8_ = 0x3f0000003f000000;
                  auVar68._12_4_ = 0x3f000000;
                  auVar214 = vpternlogd_avx512vl(auVar214,auVar184,auVar68,0xea);
                  uVar162 = vcmpps_avx512vl(auVar214,auVar182,1);
                  auVar184 = vaddps_avx512vl(auVar214,auVar183);
                  auVar214 = vaddps_avx512vl(auVar184,auVar214);
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar224._0_4_ = (uint)bVar24 * auVar214._0_4_ | (uint)!bVar24 * auVar184._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar224._4_4_ = (uint)bVar24 * auVar214._4_4_ | (uint)!bVar24 * auVar184._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar224._8_4_ = (uint)bVar24 * auVar214._8_4_ | (uint)!bVar24 * auVar184._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar224._12_4_ = (uint)bVar24 * auVar214._12_4_ | (uint)!bVar24 * auVar184._12_4_
                  ;
                  auVar184 = vmulps_avx512vl(auVar224,auVar224);
                  auVar214 = vfmadd213ps_avx512vl(auVar204,auVar224,auVar205);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar224,auVar206);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar224,auVar207);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar224,auVar208);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar224,auVar209);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar224,auVar210);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar224,auVar222);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar224,auVar215);
                  auVar185 = vmulps_avx512vl(auVar184,auVar224);
                  auVar185 = vmulps_avx512vl(auVar185,auVar214);
                  auVar69._8_4_ = 0xffffff82;
                  auVar69._0_8_ = 0xffffff82ffffff82;
                  auVar69._12_4_ = 0xffffff82;
                  auVar214 = vpaddd_avx512vl(auVar186,auVar69);
                  auVar214 = vcvtdq2ps_avx(auVar214);
                  auVar186 = vsubps_avx512vl(auVar214,auVar399);
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar225._0_4_ = (uint)bVar24 * auVar186._0_4_ | (uint)!bVar24 * auVar214._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar225._4_4_ = (uint)bVar24 * auVar186._4_4_ | (uint)!bVar24 * auVar214._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar225._8_4_ = (uint)bVar24 * auVar186._8_4_ | (uint)!bVar24 * auVar214._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar225._12_4_ = (uint)bVar24 * auVar186._12_4_ | (uint)!bVar24 * auVar214._12_4_
                  ;
                  auVar214 = vfmadd231ps_avx512vl(auVar185,auVar225,auVar495);
                  auVar214 = vfmsub231ps_avx512vl(auVar214,auVar387,auVar184);
                  auVar214 = vsubps_avx512vl(auVar214,auVar224);
                  auVar214 = vfnmadd231ps_fma(auVar214,auVar405,auVar225);
                  auVar184 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar226._0_4_ =
                       (uint)bVar24 * auVar184._0_4_ |
                       (uint)!bVar24 * (int)(auVar214._0_4_ + auVar214._0_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar226._4_4_ =
                       (uint)bVar24 * auVar184._4_4_ |
                       (uint)!bVar24 * (int)(auVar214._4_4_ + auVar214._4_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar226._8_4_ =
                       (uint)bVar24 * auVar184._8_4_ |
                       (uint)!bVar24 * (int)(auVar214._8_4_ + auVar214._8_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar226._12_4_ =
                       (uint)bVar24 * auVar184._12_4_ |
                       (uint)!bVar24 * (int)(auVar214._12_4_ + auVar214._12_4_);
                  auVar214 = vminps_avx(auVar226,auVar374);
                  auVar214 = vmaxps_avx(auVar214,auVar381);
                  auVar184 = vfmadd213ps_fma(auVar393,auVar214,auVar387);
                  auVar185 = vcvttps2dq_avx512vl(auVar184);
                  auVar185 = vcvtdq2ps_avx512vl(auVar185);
                  uVar149 = vcmpps_avx512vl(auVar184,auVar185,1);
                  auVar184 = vsubps_avx512vl(auVar185,auVar399);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar227._0_4_ = (uint)bVar24 * auVar184._0_4_ | (uint)!bVar24 * auVar185._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar227._4_4_ = (uint)bVar24 * auVar184._4_4_ | (uint)!bVar24 * auVar185._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar227._8_4_ = (uint)bVar24 * auVar184._8_4_ | (uint)!bVar24 * auVar185._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar227._12_4_ = (uint)bVar24 * auVar184._12_4_ | (uint)!bVar24 * auVar185._12_4_
                  ;
                  auVar214 = vfmsub231ps_avx512vl(auVar214,auVar227,auVar405);
                  auVar214 = vfnmsub231ps_avx512vl(auVar214,auVar227,auVar495);
                  auVar448._0_4_ = auVar214._0_4_ * auVar214._0_4_;
                  auVar448._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                  auVar448._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                  auVar448._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                  auVar184 = vfmadd213ps_avx512vl(auVar181,auVar214,auVar464);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar470);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar476);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar482);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar387);
                  auVar214 = vfmadd213ps_avx512vl(auVar184,auVar448,auVar214);
                  auVar184 = vaddps_avx512vl(auVar214,auVar399);
                  auVar214 = vcvttps2dq_avx512vl(auVar227);
                  auVar214 = vpslld_avx(auVar214,0x17);
                  auVar214 = vpaddd_avx(auVar214,auVar489);
                  auVar184 = vfmadd213ps_fma(auVar214,auVar184,auVar399);
                  auVar214 = vrcpps_avx(auVar184);
                  auVar185 = vaddps_avx512vl(auVar214,auVar214);
                  in_ZMM16 = ZEXT1664(auVar185);
                  auVar184 = vfmsub213ps_avx512vl(auVar184,auVar185,auVar211);
                  auVar214 = vfnmadd213ps_avx512vl(auVar184,auVar214,auVar185);
                  auVar213 = vfmsub231ps_fma(auVar213,auVar213,auVar214);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar421._4_4_ = uVar2;
                  auVar421._0_4_ = uVar2;
                  auVar421._8_4_ = uVar2;
                  auVar421._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar66._4_4_ = uVar2;
                  auVar66._0_4_ = uVar2;
                  auVar66._8_4_ = uVar2;
                  auVar66._12_4_ = uVar2;
                  auVar214 = vfmadd213ps_avx512vl(auVar421,auVar213,auVar66);
                  auVar214 = vmaxps_avx(auVar214,auVar212);
                  auVar214 = vminps_avx(auVar214,auVar399);
                  auVar362._0_4_ = auVar214._0_4_ * auVar213._0_4_;
                  auVar362._4_4_ = auVar214._4_4_ * auVar213._4_4_;
                  auVar362._8_4_ = auVar214._8_4_ * auVar213._8_4_;
                  auVar362._12_4_ = auVar214._12_4_ * auVar213._12_4_;
                  auVar213 = auVar362;
                }
                *(undefined1 (*) [16])pAVar158 = auVar213;
                pAVar158 = pAVar158 + 2;
                uVar163 = uVar163 + 1;
                iVar174 = iVar174 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar166 = iVar166 + 1;
          } while (iVar166 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_228.c);
    }
    if (((iVar173 == 1) && (uVar146 == 4)) && (0 < (long)local_228.c)) {
      p_Var13 = local_1e0[-3];
      iVar145 = *(int *)(&this->field_0xdc + (long)p_Var13);
      iVar152 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar152;
      iVar172 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      uVar11 = *(undefined4 *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar9 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      pvVar176 = (void *)(ulong)uVar9;
      local_1c8._0_8_ = p_Var13;
      uVar157 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      local_2f8 = 0;
      auVar212 = ZEXT816(0) << 0x40;
      auVar375._8_4_ = 0x42b0c0a5;
      auVar375._0_8_ = 0x42b0c0a542b0c0a5;
      auVar375._12_4_ = 0x42b0c0a5;
      auVar382._8_4_ = 0xc2b0c0a5;
      auVar382._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar382._12_4_ = 0xc2b0c0a5;
      auVar388._8_4_ = 0x3f000000;
      auVar388._0_8_ = 0x3f0000003f000000;
      auVar388._12_4_ = 0x3f000000;
      auVar394._8_4_ = 0x3fb8aa3b;
      auVar394._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar394._12_4_ = 0x3fb8aa3b;
      auVar400._8_4_ = 0x3f800000;
      auVar400._0_8_ = 0x3f8000003f800000;
      auVar400._12_4_ = 0x3f800000;
      auVar406._8_4_ = 0x3f318000;
      auVar406._0_8_ = 0x3f3180003f318000;
      auVar406._12_4_ = 0x3f318000;
      auVar181 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar465._8_4_ = 0x3ab743ce;
      auVar465._0_8_ = 0x3ab743ce3ab743ce;
      auVar465._12_4_ = 0x3ab743ce;
      auVar471._8_4_ = 0x3c088908;
      auVar471._0_8_ = 0x3c0889083c088908;
      auVar471._12_4_ = 0x3c088908;
      auVar477._8_4_ = 0x3d2aa9c1;
      auVar477._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar477._12_4_ = 0x3d2aa9c1;
      auVar483._8_4_ = 0x3e2aaaaa;
      auVar483._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar483._12_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT1664(auVar483);
      auVar490._8_4_ = 0x3f800000;
      auVar490._0_8_ = 0x3f8000003f800000;
      auVar490._12_4_ = 0x3f800000;
      auVar496._8_4_ = 0xb95e8083;
      auVar496._0_8_ = 0xb95e8083b95e8083;
      auVar496._12_4_ = 0xb95e8083;
      auVar182 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      in_ZMM20 = ZEXT1664(auVar182);
      auVar183 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT1664(auVar183);
      auVar204 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar205 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar206 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar207 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar208 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar209 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar210 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar222 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar215 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar211 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar142 = bottom_blob->w;
          iVar175 = bottom_blob->h;
          pAVar158 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * local_2f8 *
                     CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize));
          uVar10 = bottom_blob->c;
          iVar166 = 0;
          do {
            if (0 < local_228.w) {
              uVar163 = 0;
              iVar174 = (1 - uVar9) * iVar145;
              do {
                if (lVar160 == 0) {
                  auVar213 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar213 = *(undefined1 (*) [16])(lVar160 + local_2f8 * 0x10);
                }
                auVar341 = ZEXT1664(auVar213);
                if (0 < (int)uVar10) {
                  pvVar150 = (void *)((this->weight_data_tm).cstep * local_2f8 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar149 = 0;
                  do {
                    if (0 < (int)uVar157) {
                      pvVar177 = (void *)0x0;
                      uVar162 = 0;
                      do {
                        iVar138 = (((int)uVar162 - uVar157) + 1) * iVar152 + iVar166;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar161, iVar138 % iVar161 == 0)
                            ) && ((iVar139 < iVar175 && (pvVar151 = pvVar176, 0 < (int)uVar9)))) {
                          pvVar168 = pvVar177;
                          iVar138 = iVar174;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar140 = iVar138 / iVar172, iVar138 % iVar172 == 0)) &&
                               (iVar140 < iVar142)) {
                              uVar2 = *(undefined4 *)
                                       ((long)bottom_blob->data +
                                       (long)iVar140 * 4 +
                                       (long)iVar139 * (long)bottom_blob->w * bottom_blob->elemsize
                                       + bottom_blob->cstep * bottom_blob->elemsize * uVar149);
                              auVar422._4_4_ = uVar2;
                              auVar422._0_4_ = uVar2;
                              auVar422._8_4_ = uVar2;
                              auVar422._12_4_ = uVar2;
                              auVar213 = vfmadd231ps_fma(auVar341._0_16_,auVar422,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar150 +
                                                          ((ulong)pvVar168 & 0xffffffff) * 4));
                              auVar341 = ZEXT1664(auVar213);
                            }
                            pvVar168 = (void *)((long)pvVar168 + 4);
                            iVar138 = iVar138 + iVar145;
                            pvVar151 = (void *)((long)pvVar151 - 1);
                          } while (pvVar151 != (void *)0x0);
                        }
                        uVar162 = uVar162 + 1;
                        pvVar177 = (void *)((long)pvVar177 + (long)pvVar176 * 4);
                      } while (uVar162 != uVar157);
                    }
                    auVar213 = auVar341._0_16_;
                    pvVar150 = (void *)((long)pvVar150 + (long)(int)(uVar9 * uVar157 * 4) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar10);
                }
                switch(uVar11) {
                case 1:
                  auVar213 = vmaxps_avx(auVar213,auVar212);
                  break;
                case 2:
                  auVar214 = vmaxps_avx(auVar213,auVar212);
                  auVar213 = vminps_avx(auVar213,auVar212);
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar83._4_4_ = uVar2;
                  auVar83._0_4_ = uVar2;
                  auVar83._8_4_ = uVar2;
                  auVar83._12_4_ = uVar2;
                  auVar213 = vfmadd132ps_avx512vl(auVar213,auVar214,auVar83);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar81._4_4_ = uVar2;
                  auVar81._0_4_ = uVar2;
                  auVar81._8_4_ = uVar2;
                  auVar81._12_4_ = uVar2;
                  auVar213 = vmaxps_avx512vl(auVar213,auVar81);
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar82._4_4_ = uVar2;
                  auVar82._0_4_ = uVar2;
                  auVar82._8_4_ = uVar2;
                  auVar82._12_4_ = uVar2;
                  auVar213 = vminps_avx512vl(auVar213,auVar82);
                  break;
                case 4:
                  auVar79._8_4_ = 0x80000000;
                  auVar79._0_8_ = 0x8000000080000000;
                  auVar79._12_4_ = 0x80000000;
                  auVar213 = vxorps_avx512vl(auVar213,auVar79);
                  auVar213 = vminps_avx(auVar213,auVar375);
                  auVar213 = vmaxps_avx(auVar213,auVar382);
                  auVar214 = vfmadd231ps_fma(auVar388,auVar213,auVar394);
                  auVar184 = vcvttps2dq_avx512vl(auVar214);
                  auVar184 = vcvtdq2ps_avx512vl(auVar184);
                  uVar149 = vcmpps_avx512vl(auVar214,auVar184,1);
                  auVar214 = vsubps_avx512vl(auVar184,auVar400);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar234._0_4_ = (uint)bVar24 * auVar214._0_4_ | (uint)!bVar24 * auVar184._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar234._4_4_ = (uint)bVar24 * auVar214._4_4_ | (uint)!bVar24 * auVar184._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar234._8_4_ = (uint)bVar24 * auVar214._8_4_ | (uint)!bVar24 * auVar184._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar234._12_4_ = (uint)bVar24 * auVar214._12_4_ | (uint)!bVar24 * auVar184._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar234);
                  auVar213 = vfmsub231ps_avx512vl(auVar213,auVar234,auVar406);
                  auVar80._8_4_ = 0x395e8083;
                  auVar80._0_8_ = 0x395e8083395e8083;
                  auVar80._12_4_ = 0x395e8083;
                  auVar214 = vfmsub231ps_avx512vl(auVar213,auVar234,auVar80);
                  auVar423._0_4_ = auVar214._0_4_ * auVar214._0_4_;
                  auVar423._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                  auVar423._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                  auVar423._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                  auVar213 = vfmadd213ps_fma(auVar181,auVar214,auVar465);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar214,auVar471);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar214,auVar477);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar214,auVar483);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar214,auVar388);
                  auVar213 = vfmadd213ps_fma(auVar213,auVar423,auVar214);
                  auVar424._0_4_ = auVar213._0_4_ + 1.0;
                  auVar424._4_4_ = auVar213._4_4_ + 1.0;
                  auVar424._8_4_ = auVar213._8_4_ + 1.0;
                  auVar424._12_4_ = auVar213._12_4_ + 1.0;
                  auVar213 = vcvttps2dq_avx512vl(auVar234);
                  auVar213 = vpslld_avx(auVar213,0x17);
                  auVar213 = vpaddd_avx(auVar490,auVar213);
                  auVar214 = vfmadd213ps_fma(auVar213,auVar424,auVar400);
                  auVar213 = vrcpps_avx(auVar214);
                  auVar214 = vfmsub213ps_fma(auVar214,auVar213,auVar400);
                  auVar213 = vfnmadd132ps_fma(auVar214,auVar213,auVar213);
                  break;
                case 5:
                  auVar214 = vminps_avx(auVar213,auVar375);
                  auVar214 = vmaxps_avx(auVar214,auVar382);
                  auVar184 = vfmadd213ps_fma(auVar394,auVar214,auVar388);
                  auVar185 = vcvttps2dq_avx512vl(auVar184);
                  auVar185 = vcvtdq2ps_avx512vl(auVar185);
                  uVar149 = vcmpps_avx512vl(auVar184,auVar185,1);
                  auVar184 = vsubps_avx512vl(auVar185,auVar400);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar229._0_4_ = (uint)bVar24 * auVar184._0_4_ | (uint)!bVar24 * auVar185._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar229._4_4_ = (uint)bVar24 * auVar184._4_4_ | (uint)!bVar24 * auVar185._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar229._8_4_ = (uint)bVar24 * auVar184._8_4_ | (uint)!bVar24 * auVar185._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar229._12_4_ = (uint)bVar24 * auVar184._12_4_ | (uint)!bVar24 * auVar185._12_4_
                  ;
                  auVar214 = vfmsub231ps_avx512vl(auVar214,auVar229,auVar406);
                  auVar214 = vfnmsub231ps_avx512vl(auVar214,auVar229,auVar496);
                  auVar449._0_4_ = auVar214._0_4_ * auVar214._0_4_;
                  auVar449._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                  auVar449._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                  auVar449._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                  auVar184 = vfmadd213ps_avx512vl(auVar181,auVar214,auVar465);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar471);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar477);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar483);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar388);
                  auVar214 = vfmadd213ps_avx512vl(auVar184,auVar449,auVar214);
                  auVar184 = vaddps_avx512vl(auVar214,auVar400);
                  auVar214 = vcvttps2dq_avx512vl(auVar229);
                  auVar214 = vpslld_avx(auVar214,0x17);
                  auVar214 = vpaddd_avx(auVar214,auVar490);
                  auVar214 = vfmadd213ps_fma(auVar214,auVar184,auVar400);
                  uVar149 = vcmpps_avx512vl(auVar214,auVar212,2);
                  auVar76._8_4_ = 0x800000;
                  auVar76._0_8_ = 0x80000000800000;
                  auVar76._12_4_ = 0x800000;
                  auVar214 = vmaxps_avx512vl(auVar214,auVar76);
                  auVar186 = vpsrld_avx(auVar214,0x17);
                  auVar184 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar77._8_4_ = 0x3f000000;
                  auVar77._0_8_ = 0x3f0000003f000000;
                  auVar77._12_4_ = 0x3f000000;
                  auVar214 = vpternlogd_avx512vl(auVar214,auVar184,auVar77,0xea);
                  uVar162 = vcmpps_avx512vl(auVar214,auVar182,1);
                  auVar184 = vaddps_avx512vl(auVar214,auVar183);
                  auVar214 = vaddps_avx512vl(auVar184,auVar214);
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar230._0_4_ = (uint)bVar24 * auVar214._0_4_ | (uint)!bVar24 * auVar184._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar230._4_4_ = (uint)bVar24 * auVar214._4_4_ | (uint)!bVar24 * auVar184._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar230._8_4_ = (uint)bVar24 * auVar214._8_4_ | (uint)!bVar24 * auVar184._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar230._12_4_ = (uint)bVar24 * auVar214._12_4_ | (uint)!bVar24 * auVar184._12_4_
                  ;
                  auVar184 = vmulps_avx512vl(auVar230,auVar230);
                  auVar214 = vfmadd213ps_avx512vl(auVar204,auVar230,auVar205);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar230,auVar206);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar230,auVar207);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar230,auVar208);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar230,auVar209);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar230,auVar210);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar230,auVar222);
                  auVar214 = vfmadd213ps_avx512vl(auVar214,auVar230,auVar215);
                  auVar185 = vmulps_avx512vl(auVar184,auVar230);
                  auVar185 = vmulps_avx512vl(auVar185,auVar214);
                  auVar78._8_4_ = 0xffffff82;
                  auVar78._0_8_ = 0xffffff82ffffff82;
                  auVar78._12_4_ = 0xffffff82;
                  auVar214 = vpaddd_avx512vl(auVar186,auVar78);
                  auVar214 = vcvtdq2ps_avx(auVar214);
                  auVar186 = vsubps_avx512vl(auVar214,auVar400);
                  bVar24 = (bool)((byte)uVar162 & 1);
                  auVar231._0_4_ = (uint)bVar24 * auVar186._0_4_ | (uint)!bVar24 * auVar214._0_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar231._4_4_ = (uint)bVar24 * auVar186._4_4_ | (uint)!bVar24 * auVar214._4_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar231._8_4_ = (uint)bVar24 * auVar186._8_4_ | (uint)!bVar24 * auVar214._8_4_;
                  bVar24 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar231._12_4_ = (uint)bVar24 * auVar186._12_4_ | (uint)!bVar24 * auVar214._12_4_
                  ;
                  auVar214 = vfmadd231ps_avx512vl(auVar185,auVar231,auVar496);
                  auVar214 = vfmsub231ps_avx512vl(auVar214,auVar388,auVar184);
                  auVar214 = vsubps_avx512vl(auVar214,auVar230);
                  auVar214 = vfnmadd231ps_fma(auVar214,auVar406,auVar231);
                  auVar184 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar232._0_4_ =
                       (uint)bVar24 * auVar184._0_4_ |
                       (uint)!bVar24 * (int)(auVar214._0_4_ + auVar214._0_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar232._4_4_ =
                       (uint)bVar24 * auVar184._4_4_ |
                       (uint)!bVar24 * (int)(auVar214._4_4_ + auVar214._4_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar232._8_4_ =
                       (uint)bVar24 * auVar184._8_4_ |
                       (uint)!bVar24 * (int)(auVar214._8_4_ + auVar214._8_4_);
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar232._12_4_ =
                       (uint)bVar24 * auVar184._12_4_ |
                       (uint)!bVar24 * (int)(auVar214._12_4_ + auVar214._12_4_);
                  auVar214 = vminps_avx(auVar232,auVar375);
                  auVar214 = vmaxps_avx(auVar214,auVar382);
                  auVar184 = vfmadd213ps_fma(auVar394,auVar214,auVar388);
                  auVar185 = vcvttps2dq_avx512vl(auVar184);
                  auVar185 = vcvtdq2ps_avx512vl(auVar185);
                  uVar149 = vcmpps_avx512vl(auVar184,auVar185,1);
                  auVar184 = vsubps_avx512vl(auVar185,auVar400);
                  bVar24 = (bool)((byte)uVar149 & 1);
                  auVar233._0_4_ = (uint)bVar24 * auVar184._0_4_ | (uint)!bVar24 * auVar185._0_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 1) & 1);
                  auVar233._4_4_ = (uint)bVar24 * auVar184._4_4_ | (uint)!bVar24 * auVar185._4_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 2) & 1);
                  auVar233._8_4_ = (uint)bVar24 * auVar184._8_4_ | (uint)!bVar24 * auVar185._8_4_;
                  bVar24 = (bool)((byte)(uVar149 >> 3) & 1);
                  auVar233._12_4_ = (uint)bVar24 * auVar184._12_4_ | (uint)!bVar24 * auVar185._12_4_
                  ;
                  auVar214 = vfmsub231ps_avx512vl(auVar214,auVar233,auVar406);
                  auVar214 = vfnmsub231ps_avx512vl(auVar214,auVar233,auVar496);
                  auVar450._0_4_ = auVar214._0_4_ * auVar214._0_4_;
                  auVar450._4_4_ = auVar214._4_4_ * auVar214._4_4_;
                  auVar450._8_4_ = auVar214._8_4_ * auVar214._8_4_;
                  auVar450._12_4_ = auVar214._12_4_ * auVar214._12_4_;
                  auVar184 = vfmadd213ps_avx512vl(auVar181,auVar214,auVar465);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar471);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar477);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar483);
                  auVar184 = vfmadd213ps_avx512vl(auVar184,auVar214,auVar388);
                  auVar214 = vfmadd213ps_avx512vl(auVar184,auVar450,auVar214);
                  auVar184 = vaddps_avx512vl(auVar214,auVar400);
                  auVar214 = vcvttps2dq_avx512vl(auVar233);
                  auVar214 = vpslld_avx(auVar214,0x17);
                  auVar214 = vpaddd_avx(auVar214,auVar490);
                  auVar184 = vfmadd213ps_fma(auVar214,auVar184,auVar400);
                  auVar214 = vrcpps_avx(auVar184);
                  auVar185 = vaddps_avx512vl(auVar214,auVar214);
                  in_ZMM16 = ZEXT1664(auVar185);
                  auVar184 = vfmsub213ps_avx512vl(auVar184,auVar185,auVar211);
                  auVar214 = vfnmadd213ps_avx512vl(auVar184,auVar214,auVar185);
                  auVar213 = vfmsub231ps_fma(auVar213,auVar213,auVar214);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var13);
                  auVar425._4_4_ = uVar2;
                  auVar425._0_4_ = uVar2;
                  auVar425._8_4_ = uVar2;
                  auVar425._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar75._4_4_ = uVar2;
                  auVar75._0_4_ = uVar2;
                  auVar75._8_4_ = uVar2;
                  auVar75._12_4_ = uVar2;
                  auVar214 = vfmadd213ps_avx512vl(auVar425,auVar213,auVar75);
                  auVar214 = vmaxps_avx(auVar214,auVar212);
                  auVar214 = vminps_avx(auVar214,auVar400);
                  auVar363._0_4_ = auVar214._0_4_ * auVar213._0_4_;
                  auVar363._4_4_ = auVar214._4_4_ * auVar213._4_4_;
                  auVar363._8_4_ = auVar214._8_4_ * auVar213._8_4_;
                  auVar363._12_4_ = auVar214._12_4_ * auVar213._12_4_;
                  auVar213 = auVar363;
                }
                *(undefined1 (*) [16])pAVar158 = auVar213;
                pAVar158 = pAVar158 + 2;
                uVar163 = uVar163 + 1;
                iVar174 = iVar174 + 1;
              } while (uVar163 != local_228.w);
            }
            iVar166 = iVar166 + 1;
          } while (iVar166 != local_228.h);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_228.c);
    }
    auVar182 = in_ZMM21._0_16_;
    auVar181 = in_ZMM16._0_16_;
    if (((iVar173 == 4) && (uVar146 == 1)) && (local_1d0 = (long)local_228.c, 0 < local_1d0)) {
      p_Var13 = local_1e0[-3];
      uVar9 = *(uint *)(&this->field_0xdc + (long)p_Var13);
      pvVar151 = (void *)(ulong)uVar9;
      iVar145 = *(int *)(&this->field_0xe0 + (long)p_Var13);
      local_248._0_4_ = iVar145;
      iVar152 = *(int *)(&this->field_0xe4 + (long)p_Var13);
      iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var13);
      iVar161 = *(int *)(&this->field_0x114 + (long)p_Var13);
      lVar160 = *(long *)(&this->field_0x1a8 + (long)p_Var13);
      uVar157 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var13);
      local_188 = (Allocator *)local_228.data;
      local_180 = (Allocator *)
                  (CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize) * local_228.cstep);
      uVar163 = bottom_blob->w;
      pvVar168 = (void *)(ulong)uVar163;
      iVar142 = bottom_blob->h;
      uVar12 = bottom_blob->c;
      local_168._0_4_ = local_228.h;
      local_2f8 = 0;
      do {
        if (0 < (int)local_168._0_4_) {
          sVar15 = (this->weight_data_tm).cstep;
          sVar16 = (this->weight_data_tm).elemsize;
          local_2d0 = (Allocator *)((long)&local_188->_vptr_Allocator + (long)local_180 * local_2f8)
          ;
          pvVar176 = (this->weight_data_tm).data;
          iVar175 = 0;
          do {
            if (0 < iVar8) {
              iVar174 = bottom_blob->w;
              pvVar150 = bottom_blob->data;
              sVar17 = bottom_blob->elemsize;
              sVar18 = bottom_blob->cstep;
              local_1c8._0_8_ = *(undefined8 *)(&this->field_0x118 + (long)p_Var13);
              uVar148 = 0;
              iVar166 = (1 - uVar157) * uVar9;
              do {
                if (lVar160 == 0) {
                  fVar357 = 0.0;
                }
                else {
                  fVar357 = *(float *)(lVar160 + local_2f8 * 4);
                }
                if ((int)uVar12 < 1) {
                  auVar181 = SUB6416(ZEXT864(0),0);
                }
                else {
                  auVar341 = ZEXT864(0);
                  uVar149 = 0;
                  pvVar177 = (void *)(sVar15 * local_2f8 * sVar16 + (long)pvVar176);
                  do {
                    if (0 < (int)uVar10) {
                      uVar147 = 0;
                      uVar162 = 0;
                      do {
                        iVar138 = (((int)uVar162 - uVar10) + 1) * iVar145 + iVar175;
                        if (((-1 < iVar138) && (iVar139 = iVar138 / iVar172, iVar138 % iVar172 == 0)
                            ) && ((0 < (int)uVar157 && (iVar139 < iVar142)))) {
                          uVar164 = (ulong)uVar157;
                          uVar155 = uVar147;
                          iVar138 = iVar166;
                          do {
                            if (((-1 < iVar138) &&
                                (iVar140 = iVar138 / iVar152, iVar138 % iVar152 == 0)) &&
                               (iVar140 < (int)uVar163)) {
                              auVar181 = vfmadd231ps_fma(auVar341._0_16_,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar150 +
                                                          (long)(iVar140 << 2) * 4 +
                                                          (long)iVar139 * (long)iVar174 * sVar17 +
                                                          sVar18 * sVar17 * uVar149),
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar177 +
                                                          (uVar155 & 0xffffffff) * 4));
                              auVar341 = ZEXT1664(auVar181);
                            }
                            uVar155 = uVar155 + 4;
                            iVar138 = iVar138 + uVar9;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar162 = uVar162 + 1;
                        uVar147 = uVar147 + (ulong)uVar157 * 4;
                      } while (uVar162 != uVar10);
                    }
                    auVar181 = auVar341._0_16_;
                    pvVar177 = (void *)((long)pvVar177 + (long)(int)(uVar157 * uVar10 * 4) * 4);
                    uVar149 = uVar149 + 1;
                  } while (uVar149 != uVar12);
                }
                auVar182 = vshufpd_avx(auVar181,auVar181,1);
                auVar364._0_4_ = auVar182._0_4_ + auVar181._0_4_;
                auVar364._4_4_ = auVar182._4_4_ + auVar181._4_4_;
                auVar364._8_4_ = auVar182._8_4_ + auVar181._8_4_;
                auVar364._12_4_ = auVar182._12_4_ + auVar181._12_4_;
                auVar181 = vmovshdup_avx(auVar364);
                fVar357 = auVar181._0_4_ + fVar357 + auVar364._0_4_;
                auVar181 = ZEXT416((uint)fVar357);
                fVar372 = fVar357;
                if (iVar161 - 1U < 6) {
                  switch(iVar161) {
                  case 1:
                    auVar181 = vmaxss_avx(ZEXT416((uint)fVar357),ZEXT416(0));
                    fVar372 = auVar181._0_4_;
                    break;
                  case 2:
                    uVar42 = vcmpss_avx512f(ZEXT416((uint)fVar357),ZEXT416(0),0xe);
                    bVar24 = (bool)((byte)uVar42 & 1);
                    fVar372 = (float)((uint)bVar24 * 0x3f800000 +
                                     (uint)!bVar24 * (int)*(float *)local_1c8._0_8_) * fVar357;
                    break;
                  case 3:
                    auVar181 = vmaxss_avx(auVar181,ZEXT416((uint)*(float *)local_1c8._0_8_));
                    fVar372 = auVar181._0_4_;
                    if (*(float *)(local_1c8._0_8_ + 4) < auVar181._0_4_) {
                      fVar372 = *(float *)(local_1c8._0_8_ + 4);
                    }
                    break;
                  case 4:
                    auVar181 = vminss_avx(auVar181,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar85._8_4_ = 0x80000000;
                    auVar85._0_8_ = 0x8000000080000000;
                    auVar85._12_4_ = 0x80000000;
                    auVar182 = vxorps_avx512vl(auVar181,auVar85);
                    uVar42 = vcmpss_avx512f(auVar181,ZEXT416(0xc2b0c0a5),1);
                    bVar24 = (bool)((byte)uVar42 & 1);
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar357 = expf((float)((uint)bVar24 * 0x42b0c0a5 +
                                          (uint)!bVar24 * auVar182._0_4_));
                    fVar372 = 1.0 / (fVar357 + 1.0);
                    break;
                  case 5:
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar372 = expf(fVar357);
                    fVar372 = logf(fVar372 + 1.0);
                    fVar372 = tanhf(fVar372);
                    fVar372 = fVar372 * fVar357;
                    break;
                  case 6:
                    fVar3 = *(float *)local_1c8._0_8_;
                    auVar84._8_4_ = 0x80000000;
                    auVar84._0_8_ = 0x8000000080000000;
                    auVar84._12_4_ = 0x80000000;
                    auVar182 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)),
                                               auVar84);
                    fVar379 = auVar182._0_4_ / fVar3;
                    fVar372 = 0.0;
                    if ((fVar379 <= fVar357) &&
                       (fVar372 = fVar357, fVar357 <= fVar379 + 1.0 / fVar3)) {
                      auVar181 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar181,
                                                 ZEXT416((uint)*(float *)(local_1c8._0_8_ + 4)));
                      fVar372 = auVar181._0_4_ * fVar357;
                    }
                  }
                }
                *(float *)&local_2d0->_vptr_Allocator = fVar372;
                local_2d0 = (Allocator *)((long)&local_2d0->_vptr_Allocator + 4);
                uVar148 = uVar148 + 1;
                iVar166 = iVar166 + 1;
              } while (uVar148 != iVar8);
            }
            iVar175 = iVar175 + 1;
          } while (iVar175 != local_168._0_4_);
        }
        auVar182 = in_ZMM21._0_16_;
        auVar181 = in_ZMM16._0_16_;
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != local_1d0);
    }
    iVar145 = local_228.h;
    iVar8 = local_228.w;
    if (((iVar173 == 1) && (uVar146 == 1)) &&
       (pp_Var21 = this->_vptr_Deconvolution_x86_avx512,
       0 < *(int *)(&this->field_0xd0 + (long)pp_Var21[-3]))) {
      local_1d0 = local_228.cstep * CONCAT44(local_228.elemsize._4_4_,(int)local_228.elemsize);
      local_188 = (Allocator *)local_228.data;
      iVar173 = bottom_blob->h;
      uVar9 = bottom_blob->c;
      uVar149 = (ulong)(uint)local_228.w;
      lVar159 = (long)local_1d4;
      auVar287 = vpbroadcastd_avx512f(ZEXT416((uint)bottom_blob->w));
      lVar160 = (long)local_228.w;
      local_2f8 = 0;
      auVar181 = vxorps_avx512vl(auVar181,auVar181);
      auVar288 = ZEXT1664(auVar181);
      auVar346 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar345 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar344 = vpmovsxbd_avx512f(_DAT_00598144);
      auVar343 = vpternlogd_avx512f(in_ZMM20,in_ZMM20,in_ZMM20,0xff);
      auVar181 = vxorps_avx512vl(auVar182,auVar182);
      auVar289 = ZEXT1664(auVar181);
      auVar342 = vpbroadcastq_avx512f(ZEXT816(0x10));
      auVar341 = vpbroadcastd_avx512f(ZEXT416(0x10));
      uVar147 = CONCAT62((int6)((ulong)pvVar168 >> 0x10),0x1000);
      uVar162 = CONCAT62((int6)((ulong)pvVar151 >> 0x10),0x8000);
      local_1c8 = vmovdqu64_avx512f(auVar287);
      do {
        if (0 < iVar145) {
          local_2e0 = (Allocator *)((long)&local_188->_vptr_Allocator + local_1d0 * local_2f8);
          pp_Var19 = this->_vptr_Deconvolution_x86_avx512;
          sVar15 = (this->weight_data_tm).cstep;
          sVar16 = (this->weight_data_tm).elemsize;
          pvVar151 = (this->weight_data_tm).data;
          auVar136._60_4_ = 0;
          auVar136._0_60_ = local_168._4_60_;
          local_168._0_64_ = auVar136 << 0x20;
          do {
            if (0 < iVar8) {
              iVar152 = bottom_blob->w;
              pvVar168 = bottom_blob->data;
              sVar17 = bottom_blob->elemsize;
              sVar18 = bottom_blob->cstep;
              pp_Var20 = this->_vptr_Deconvolution_x86_avx512;
              iVar172 = local_168._0_4_ - local_170;
              uVar164 = 0;
              do {
                auVar181 = auVar288._0_16_;
                auVar182 = auVar289._0_16_;
                p_Var13 = pp_Var19[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var13) == 0) {
                  auVar290 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar290 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var13) +
                                              local_2f8 * 4));
                }
                auVar183 = auVar290._0_16_;
                if (0 < (int)uVar9) {
                  p_Var13 = pp_Var20[-3];
                  auVar292 = vpbroadcastd_avx512f();
                  local_248._0_8_ = (void *)(sVar15 * sVar16 * local_2f8 + (long)pvVar151);
                  uVar155 = 0;
                  auVar291 = auVar292;
                  do {
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var13)) {
                      iVar161 = 0;
                      do {
                        iVar142 = *(int *)(&this->field_0xe0 + (long)p_Var13) * iVar161 + iVar172;
                        if (((-1 < iVar142) &&
                            (iVar175 = iVar142 / *(int *)(&this->field_0xe8 + (long)p_Var13),
                            iVar142 % *(int *)(&this->field_0xe8 + (long)p_Var13) == 0)) &&
                           ((iVar175 < iVar173 &&
                            (iVar142 = *(int *)(&this->field_0xd4 + (long)p_Var13), 0 < iVar142))))
                        {
                          auVar316._16_48_ = auVar291._16_48_;
                          auVar316._0_16_ = auVar181;
                          auVar315._4_60_ = auVar316._4_60_;
                          auVar315._0_4_ = auVar290._0_4_;
                          auVar410 = ZEXT1664(auVar315._0_16_);
                          auVar290 = vpbroadcastq_avx512f();
                          auVar291 = vpbroadcastd_avx512f
                                               (ZEXT416(*(uint *)(&this->field_0xdc + (long)p_Var13)
                                                       ));
                          uVar165 = 0;
                          auVar293 = vmovdqa64_avx512f(auVar345);
                          auVar294 = vmovdqa64_avx512f(auVar346);
                          auVar295 = vmovdqa64_avx512f(auVar344);
                          do {
                            uVar42 = vpcmpuq_avx512f(auVar293,auVar290,2);
                            uVar43 = vpcmpuq_avx512f(auVar294,auVar290,2);
                            bVar32 = (byte)uVar43;
                            uVar178 = CONCAT11(bVar32,(byte)uVar42);
                            auVar296 = vpmulld_avx512f(auVar291,auVar295);
                            auVar296 = vpaddd_avx512f(auVar292,auVar296);
                            uVar179 = vpcmpgtd_avx512f(auVar296,auVar343);
                            uVar179 = uVar178 & uVar179;
                            auVar297 = vpgatherdd_avx512f(*(undefined4 *)
                                                           (&this->field_0xe4 +
                                                           (long)(p_Var13 + uVar162 * 4)));
                            iVar166 = (uint)((byte)uVar179 & 1) * auVar297._0_4_;
                            iVar174 = (uint)((byte)(uVar179 >> 1) & 1) * auVar297._4_4_;
                            auVar317._4_4_ = iVar174;
                            auVar317._0_4_ = iVar166;
                            iVar138 = (uint)((byte)(uVar179 >> 2) & 1) * auVar297._8_4_;
                            auVar317._8_4_ = iVar138;
                            iVar139 = (uint)((byte)(uVar179 >> 3) & 1) * auVar297._12_4_;
                            auVar317._12_4_ = iVar139;
                            auVar317._16_4_ = (uint)((byte)(uVar179 >> 4) & 1) * auVar297._16_4_;
                            auVar317._20_4_ = (uint)((byte)(uVar179 >> 5) & 1) * auVar297._20_4_;
                            auVar317._24_4_ = (uint)((byte)(uVar179 >> 6) & 1) * auVar297._24_4_;
                            auVar317._28_4_ = (uint)((byte)(uVar179 >> 7) & 1) * auVar297._28_4_;
                            auVar317._32_4_ = (uint)((byte)(uVar179 >> 8) & 1) * auVar297._32_4_;
                            auVar317._36_4_ = (uint)((byte)(uVar179 >> 9) & 1) * auVar297._36_4_;
                            auVar317._40_4_ = (uint)((byte)(uVar179 >> 10) & 1) * auVar297._40_4_;
                            auVar317._44_4_ = (uint)((byte)(uVar179 >> 0xb) & 1) * auVar297._44_4_;
                            auVar317._48_4_ = (uint)((byte)(uVar179 >> 0xc) & 1) * auVar297._48_4_;
                            auVar317._52_4_ = (uint)((byte)(uVar179 >> 0xd) & 1) * auVar297._52_4_;
                            auVar317._56_4_ = (uint)((byte)(uVar179 >> 0xe) & 1) * auVar297._56_4_;
                            auVar317._60_4_ = (uint)(byte)(uVar179 >> 0xf) * auVar297._60_4_;
                            if ((uVar179 & 1) != 0) {
                              in_ZMM13 = (float  [16])ZEXT464((uint)(auVar296._0_4_ % iVar166));
                            }
                            if ((uVar179 & 2) != 0) {
                              auVar183 = vpinsrd_avx(in_ZMM13._0_16_,auVar296._4_4_ % iVar174,1);
                              in_ZMM13 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])in_ZMM13,auVar183,0)
                              ;
                            }
                            if ((uVar179 & 4) != 0) {
                              auVar183 = vpinsrd_avx(in_ZMM13._0_16_,auVar296._8_4_ % iVar138,2);
                              in_ZMM13 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])in_ZMM13,auVar183,0)
                              ;
                            }
                            if ((uVar179 & 8) != 0) {
                              auVar183 = vpinsrd_avx(in_ZMM13._0_16_,auVar296._12_4_ % iVar139,3);
                              in_ZMM13 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])in_ZMM13,auVar183,0)
                              ;
                            }
                            afVar318 = in_ZMM13;
                            if ((uVar179 & 0x10) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar318._0_16_ = in_ZMM13._0_16_;
                              afVar318[4] = auVar297._16_4_;
                              afVar318[5] = in_ZMM13[5];
                              afVar318[6] = in_ZMM13[6];
                              afVar318[7] = in_ZMM13[7];
                              afVar318[8] = in_ZMM13[8];
                              afVar318[9] = in_ZMM13[9];
                              afVar318[10] = in_ZMM13[10];
                              afVar318[0xb] = in_ZMM13[0xb];
                              afVar318[0xc] = in_ZMM13[0xc];
                              afVar318[0xd] = in_ZMM13[0xd];
                              afVar318[0xe] = in_ZMM13[0xe];
                              afVar318[0xf] = in_ZMM13[0xf];
                            }
                            afVar319 = afVar318;
                            if ((uVar179 & 0x20) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar319._0_20_ = afVar318._0_20_;
                              afVar319[5] = auVar297._20_4_;
                              afVar319[6] = afVar318[6];
                              afVar319[7] = afVar318[7];
                              afVar319[8] = afVar318[8];
                              afVar319[9] = afVar318[9];
                              afVar319[10] = afVar318[10];
                              afVar319[0xb] = afVar318[0xb];
                              afVar319[0xc] = afVar318[0xc];
                              afVar319[0xd] = afVar318[0xd];
                              afVar319[0xe] = afVar318[0xe];
                              afVar319[0xf] = afVar318[0xf];
                            }
                            afVar320 = afVar319;
                            if ((uVar179 & 0x40) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar320._0_24_ = afVar319._0_24_;
                              afVar320[6] = auVar297._24_4_;
                              afVar320[7] = afVar319[7];
                              afVar320[8] = afVar319[8];
                              afVar320[9] = afVar319[9];
                              afVar320[10] = afVar319[10];
                              afVar320[0xb] = afVar319[0xb];
                              afVar320[0xc] = afVar319[0xc];
                              afVar320[0xd] = afVar319[0xd];
                              afVar320[0xe] = afVar319[0xe];
                              afVar320[0xf] = afVar319[0xf];
                            }
                            afVar321 = afVar320;
                            if ((uVar179 & 0x80) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar321._0_28_ = afVar320._0_28_;
                              afVar321[7] = auVar297._28_4_;
                              afVar321[8] = afVar320[8];
                              afVar321[9] = afVar320[9];
                              afVar321[10] = afVar320[10];
                              afVar321[0xb] = afVar320[0xb];
                              afVar321[0xc] = afVar320[0xc];
                              afVar321[0xd] = afVar320[0xd];
                              afVar321[0xe] = afVar320[0xe];
                              afVar321[0xf] = afVar320[0xf];
                            }
                            vextracti32x4_avx512f(auVar296,2);
                            vextracti32x4_avx512f(auVar317,2);
                            afVar322 = afVar321;
                            if ((uVar179 & 0x100) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar322._0_32_ = afVar321._0_32_;
                              afVar322[8] = auVar297._32_4_;
                              afVar322[9] = afVar321[9];
                              afVar322[10] = afVar321[10];
                              afVar322[0xb] = afVar321[0xb];
                              afVar322[0xc] = afVar321[0xc];
                              afVar322[0xd] = afVar321[0xd];
                              afVar322[0xe] = afVar321[0xe];
                              afVar322[0xf] = afVar321[0xf];
                            }
                            afVar323 = afVar322;
                            if ((uVar179 & 0x200) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar323._0_36_ = afVar322._0_36_;
                              afVar323[9] = auVar297._36_4_;
                              afVar323[10] = afVar322[10];
                              afVar323[0xb] = afVar322[0xb];
                              afVar323[0xc] = afVar322[0xc];
                              afVar323[0xd] = afVar322[0xd];
                              afVar323[0xe] = afVar322[0xe];
                              afVar323[0xf] = afVar322[0xf];
                            }
                            afVar324 = afVar323;
                            if ((uVar179 & 0x400) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar324._0_40_ = afVar323._0_40_;
                              afVar324[10] = auVar297._40_4_;
                              afVar324[0xb] = afVar323[0xb];
                              afVar324[0xc] = afVar323[0xc];
                              afVar324[0xd] = afVar323[0xd];
                              afVar324[0xe] = afVar323[0xe];
                              afVar324[0xf] = afVar323[0xf];
                            }
                            afVar325 = afVar324;
                            if ((uVar179 & 0x800) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar325._0_44_ = afVar324._0_44_;
                              afVar325[0xb] = auVar297._44_4_;
                              afVar325[0xc] = afVar324[0xc];
                              afVar325[0xd] = afVar324[0xd];
                              afVar325[0xe] = afVar324[0xe];
                              afVar325[0xf] = afVar324[0xf];
                            }
                            vextracti32x4_avx512f(auVar296,3);
                            vextracti32x4_avx512f(auVar317,3);
                            afVar326 = afVar325;
                            if ((uVar179 & 0x1000) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar326._0_48_ = afVar325._0_48_;
                              bVar24 = (bool)((byte)((uVar147 & 0xffffffff) >> 0xc) & 1);
                              afVar326[0xc] =
                                   (uint)bVar24 * auVar297._48_4_ |
                                   (uint)!bVar24 * (int)afVar325[0xc];
                              afVar326[0xd] = afVar325[0xd];
                              afVar326[0xe] = afVar325[0xe];
                              afVar326[0xf] = afVar325[0xf];
                            }
                            afVar327 = afVar326;
                            if ((uVar179 & 0x2000) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar327._0_52_ = afVar326._0_52_;
                              afVar327[0xd] = auVar297._52_4_;
                              afVar327[0xe] = afVar326[0xe];
                              afVar327[0xf] = afVar326[0xf];
                            }
                            afVar487 = afVar327;
                            if ((uVar179 & 0x4000) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              afVar487._0_56_ = afVar327._0_56_;
                              afVar487[0xe] = auVar297._56_4_;
                              afVar487[0xf] = afVar327[0xf];
                            }
                            if ((uVar179 & 0x8000) != 0) {
                              auVar297 = vpbroadcastd_avx512f();
                              bVar24 = (bool)((byte)((uVar162 & 0xffffffff) >> 0xf) & 1);
                              afVar487[0xf] =
                                   (float)((uint)bVar24 * auVar297._60_4_ |
                                          (uint)!bVar24 * (int)afVar487[0xf]);
                            }
                            uVar180 = vptestnmd_avx512f((undefined1  [64])afVar487,
                                                        (undefined1  [64])afVar487);
                            uVar179 = uVar179 & uVar180;
                            if ((uVar179 & 1) != 0) {
                              afVar487 = (float  [16])ZEXT464((uint)(auVar296._0_4_ / iVar166));
                            }
                            if ((uVar179 & 2) != 0) {
                              auVar183 = vpinsrd_avx(afVar487._0_16_,auVar296._4_4_ / iVar174,1);
                              afVar487 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])afVar487,auVar183,0)
                              ;
                            }
                            if ((uVar179 & 4) != 0) {
                              auVar183 = vpinsrd_avx(afVar487._0_16_,auVar296._8_4_ / iVar138,2);
                              afVar487 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])afVar487,auVar183,0)
                              ;
                            }
                            if ((uVar179 & 8) != 0) {
                              auVar183 = vpinsrd_avx(afVar487._0_16_,auVar296._12_4_ / iVar139,3);
                              afVar487 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])afVar487,auVar183,0)
                              ;
                            }
                            afVar328 = afVar487;
                            if ((uVar179 & 0x10) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar328._0_16_ = afVar487._0_16_;
                              afVar328[4] = auVar296._16_4_;
                              afVar328[5] = afVar487[5];
                              afVar328[6] = afVar487[6];
                              afVar328[7] = afVar487[7];
                              afVar328[8] = afVar487[8];
                              afVar328[9] = afVar487[9];
                              afVar328[10] = afVar487[10];
                              afVar328[0xb] = afVar487[0xb];
                              afVar328[0xc] = afVar487[0xc];
                              afVar328[0xd] = afVar487[0xd];
                              afVar328[0xe] = afVar487[0xe];
                              afVar328[0xf] = afVar487[0xf];
                            }
                            afVar329 = afVar328;
                            if ((uVar179 & 0x20) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar329._0_20_ = afVar328._0_20_;
                              afVar329[5] = auVar296._20_4_;
                              afVar329[6] = afVar328[6];
                              afVar329[7] = afVar328[7];
                              afVar329[8] = afVar328[8];
                              afVar329[9] = afVar328[9];
                              afVar329[10] = afVar328[10];
                              afVar329[0xb] = afVar328[0xb];
                              afVar329[0xc] = afVar328[0xc];
                              afVar329[0xd] = afVar328[0xd];
                              afVar329[0xe] = afVar328[0xe];
                              afVar329[0xf] = afVar328[0xf];
                            }
                            afVar330 = afVar329;
                            if ((uVar179 & 0x40) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar330._0_24_ = afVar329._0_24_;
                              afVar330[6] = auVar296._24_4_;
                              afVar330[7] = afVar329[7];
                              afVar330[8] = afVar329[8];
                              afVar330[9] = afVar329[9];
                              afVar330[10] = afVar329[10];
                              afVar330[0xb] = afVar329[0xb];
                              afVar330[0xc] = afVar329[0xc];
                              afVar330[0xd] = afVar329[0xd];
                              afVar330[0xe] = afVar329[0xe];
                              afVar330[0xf] = afVar329[0xf];
                            }
                            afVar331 = afVar330;
                            if ((uVar179 & 0x80) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar331._0_28_ = afVar330._0_28_;
                              afVar331[7] = auVar296._28_4_;
                              afVar331[8] = afVar330[8];
                              afVar331[9] = afVar330[9];
                              afVar331[10] = afVar330[10];
                              afVar331[0xb] = afVar330[0xb];
                              afVar331[0xc] = afVar330[0xc];
                              afVar331[0xd] = afVar330[0xd];
                              afVar331[0xe] = afVar330[0xe];
                              afVar331[0xf] = afVar330[0xf];
                            }
                            afVar332 = afVar331;
                            if ((uVar179 & 0x100) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar332._0_32_ = afVar331._0_32_;
                              afVar332[8] = auVar296._32_4_;
                              afVar332[9] = afVar331[9];
                              afVar332[10] = afVar331[10];
                              afVar332[0xb] = afVar331[0xb];
                              afVar332[0xc] = afVar331[0xc];
                              afVar332[0xd] = afVar331[0xd];
                              afVar332[0xe] = afVar331[0xe];
                              afVar332[0xf] = afVar331[0xf];
                            }
                            afVar333 = afVar332;
                            if ((uVar179 & 0x200) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar333._0_36_ = afVar332._0_36_;
                              afVar333[9] = auVar296._36_4_;
                              afVar333[10] = afVar332[10];
                              afVar333[0xb] = afVar332[0xb];
                              afVar333[0xc] = afVar332[0xc];
                              afVar333[0xd] = afVar332[0xd];
                              afVar333[0xe] = afVar332[0xe];
                              afVar333[0xf] = afVar332[0xf];
                            }
                            afVar334 = afVar333;
                            if ((uVar179 & 0x400) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar334._0_40_ = afVar333._0_40_;
                              afVar334[10] = auVar296._40_4_;
                              afVar334[0xb] = afVar333[0xb];
                              afVar334[0xc] = afVar333[0xc];
                              afVar334[0xd] = afVar333[0xd];
                              afVar334[0xe] = afVar333[0xe];
                              afVar334[0xf] = afVar333[0xf];
                            }
                            afVar335 = afVar334;
                            if ((uVar179 & 0x800) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar335._0_44_ = afVar334._0_44_;
                              afVar335[0xb] = auVar296._44_4_;
                              afVar335[0xc] = afVar334[0xc];
                              afVar335[0xd] = afVar334[0xd];
                              afVar335[0xe] = afVar334[0xe];
                              afVar335[0xf] = afVar334[0xf];
                            }
                            afVar336 = afVar335;
                            if ((uVar179 & 0x1000) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar336._0_48_ = afVar335._0_48_;
                              bVar24 = (bool)((byte)((uVar147 & 0xffffffff) >> 0xc) & 1);
                              afVar336[0xc] =
                                   (uint)bVar24 * auVar296._48_4_ |
                                   (uint)!bVar24 * (int)afVar335[0xc];
                              afVar336[0xd] = afVar335[0xd];
                              afVar336[0xe] = afVar335[0xe];
                              afVar336[0xf] = afVar335[0xf];
                            }
                            afVar337 = afVar336;
                            if ((uVar179 & 0x2000) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              afVar337._0_52_ = afVar336._0_52_;
                              afVar337[0xd] = auVar296._52_4_;
                              afVar337[0xe] = afVar336[0xe];
                              afVar337[0xf] = afVar336[0xf];
                            }
                            in_ZMM13 = afVar337;
                            if ((uVar179 & 0x4000) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              in_ZMM13._0_56_ = afVar337._0_56_;
                              in_ZMM13[0xe] = auVar296._56_4_;
                              in_ZMM13[0xf] = afVar337[0xf];
                            }
                            if ((uVar179 & 0x8000) != 0) {
                              auVar296 = vpbroadcastd_avx512f();
                              bVar24 = (bool)((byte)((uVar162 & 0xffffffff) >> 0xf) & 1);
                              in_ZMM13[0xf] =
                                   (float)((uint)bVar24 * auVar296._60_4_ |
                                          (uint)!bVar24 * (int)in_ZMM13[0xf]);
                            }
                            uVar180 = vpcmpgtd_avx512f(auVar287,(undefined1  [64])in_ZMM13);
                            uVar180 = uVar179 & uVar180;
                            auVar296 = vgatherdps_avx512f(*(undefined4 *)
                                                           ((long)pvVar168 +
                                                           uVar147 * 4 +
                                                           (long)iVar175 * (long)iVar152 * sVar17 +
                                                           sVar18 * sVar17 * uVar155));
                            bVar23 = (byte)uVar180;
                            auVar338._4_4_ = (uint)((byte)(uVar180 >> 1) & 1) * auVar296._4_4_;
                            auVar338._0_4_ = (uint)(bVar23 & 1) * auVar296._0_4_;
                            auVar338._8_4_ = (uint)((byte)(uVar180 >> 2) & 1) * auVar296._8_4_;
                            auVar338._12_4_ = (uint)((byte)(uVar180 >> 3) & 1) * auVar296._12_4_;
                            auVar338._16_4_ = (uint)((byte)(uVar180 >> 4) & 1) * auVar296._16_4_;
                            auVar338._20_4_ = (uint)((byte)(uVar180 >> 5) & 1) * auVar296._20_4_;
                            auVar338._24_4_ = (uint)((byte)(uVar180 >> 6) & 1) * auVar296._24_4_;
                            auVar338._28_4_ = (uint)((byte)(uVar180 >> 7) & 1) * auVar296._28_4_;
                            bVar33 = (byte)(uVar180 >> 8);
                            auVar338._32_4_ = (uint)(bVar33 & 1) * auVar296._32_4_;
                            auVar338._36_4_ = (uint)((byte)(uVar180 >> 9) & 1) * auVar296._36_4_;
                            auVar338._40_4_ = (uint)((byte)(uVar180 >> 10) & 1) * auVar296._40_4_;
                            auVar338._44_4_ = (uint)((byte)(uVar180 >> 0xb) & 1) * auVar296._44_4_;
                            auVar338._48_4_ = (uint)((byte)(uVar180 >> 0xc) & 1) * auVar296._48_4_;
                            auVar338._52_4_ = (uint)((byte)(uVar180 >> 0xd) & 1) * auVar296._52_4_;
                            auVar338._56_4_ = (uint)((byte)(uVar180 >> 0xe) & 1) * auVar296._56_4_;
                            auVar338._60_4_ = (uint)(byte)(uVar180 >> 0xf) * auVar296._60_4_;
                            piVar14 = (int *)(local_248._0_8_ + (ulong)(uint)(iVar142 * iVar161) * 4
                                             + uVar165 * 4);
                            auVar339._4_4_ = (uint)((byte)(uVar180 >> 1) & 1) * piVar14[1];
                            auVar339._0_4_ = (uint)(bVar23 & 1) * *piVar14;
                            auVar339._8_4_ = (uint)((byte)(uVar180 >> 2) & 1) * piVar14[2];
                            auVar339._12_4_ = (uint)((byte)(uVar180 >> 3) & 1) * piVar14[3];
                            auVar339._16_4_ = (uint)((byte)(uVar180 >> 4) & 1) * piVar14[4];
                            auVar339._20_4_ = (uint)((byte)(uVar180 >> 5) & 1) * piVar14[5];
                            auVar339._24_4_ = (uint)((byte)(uVar180 >> 6) & 1) * piVar14[6];
                            auVar339._28_4_ = (uint)((byte)(uVar180 >> 7) & 1) * piVar14[7];
                            auVar339._32_4_ = (uint)(bVar33 & 1) * piVar14[8];
                            auVar339._36_4_ = (uint)((byte)(uVar180 >> 9) & 1) * piVar14[9];
                            auVar339._40_4_ = (uint)((byte)(uVar180 >> 10) & 1) * piVar14[10];
                            auVar339._44_4_ = (uint)((byte)(uVar180 >> 0xb) & 1) * piVar14[0xb];
                            auVar339._48_4_ = (uint)((byte)(uVar180 >> 0xc) & 1) * piVar14[0xc];
                            auVar339._52_4_ = (uint)((byte)(uVar180 >> 0xd) & 1) * piVar14[0xd];
                            auVar339._56_4_ = (uint)((byte)(uVar180 >> 0xe) & 1) * piVar14[0xe];
                            auVar339._60_4_ = (uint)(byte)(uVar180 >> 0xf) * piVar14[0xf];
                            uVar41 = vpcmpd_avx512f((undefined1  [64])in_ZMM13,auVar287,5);
                            uVar179 = uVar179 & uVar41;
                            auVar296 = vfmadd231ps_avx512f(auVar410,auVar339,auVar338);
                            iVar166 = auVar410._0_4_;
                            bVar25 = (bool)((byte)(uVar180 >> 1) & 1);
                            iVar174 = auVar410._4_4_;
                            bVar26 = (bool)((byte)(uVar180 >> 2) & 1);
                            iVar138 = auVar410._8_4_;
                            bVar27 = (bool)((byte)(uVar180 >> 3) & 1);
                            iVar139 = auVar410._12_4_;
                            bVar28 = (bool)((byte)(uVar180 >> 4) & 1);
                            iVar140 = auVar410._16_4_;
                            bVar29 = (bool)((byte)(uVar180 >> 5) & 1);
                            iVar141 = auVar410._20_4_;
                            bVar30 = (bool)((byte)(uVar180 >> 6) & 1);
                            iVar347 = auVar410._24_4_;
                            bVar31 = (bool)((byte)(uVar180 >> 7) & 1);
                            iVar348 = auVar410._28_4_;
                            iVar349 = auVar410._32_4_;
                            bVar34 = (bool)((byte)(uVar180 >> 9) & 1);
                            iVar350 = auVar410._36_4_;
                            bVar35 = (bool)((byte)(uVar180 >> 10) & 1);
                            iVar351 = auVar410._40_4_;
                            bVar36 = (bool)((byte)(uVar180 >> 0xb) & 1);
                            iVar352 = auVar410._44_4_;
                            bVar37 = (bool)((byte)(uVar180 >> 0xc) & 1);
                            iVar353 = auVar410._48_4_;
                            bVar38 = (bool)((byte)(uVar180 >> 0xd) & 1);
                            iVar354 = auVar410._52_4_;
                            bVar39 = (bool)((byte)(uVar180 >> 0xe) & 1);
                            iVar355 = auVar410._56_4_;
                            bVar40 = SUB81(uVar180 >> 0xf,0);
                            iVar356 = auVar410._60_4_;
                            bVar24 = (bool)((byte)uVar179 & 1);
                            auVar410._0_4_ =
                                 (uint)bVar24 * iVar166 |
                                 (uint)!bVar24 *
                                 ((uint)(bVar23 & 1) * auVar296._0_4_ |
                                 (uint)!(bool)(bVar23 & 1) * iVar166);
                            bVar24 = (bool)((byte)(uVar179 >> 1) & 1);
                            auVar410._4_4_ =
                                 (uint)bVar24 * iVar174 |
                                 (uint)!bVar24 *
                                 ((uint)bVar25 * auVar296._4_4_ | (uint)!bVar25 * iVar174);
                            bVar24 = (bool)((byte)(uVar179 >> 2) & 1);
                            auVar410._8_4_ =
                                 (uint)bVar24 * iVar138 |
                                 (uint)!bVar24 *
                                 ((uint)bVar26 * auVar296._8_4_ | (uint)!bVar26 * iVar138);
                            bVar24 = (bool)((byte)(uVar179 >> 3) & 1);
                            auVar410._12_4_ =
                                 (uint)bVar24 * iVar139 |
                                 (uint)!bVar24 *
                                 ((uint)bVar27 * auVar296._12_4_ | (uint)!bVar27 * iVar139);
                            bVar24 = (bool)((byte)(uVar179 >> 4) & 1);
                            auVar410._16_4_ =
                                 (uint)bVar24 * iVar140 |
                                 (uint)!bVar24 *
                                 ((uint)bVar28 * auVar296._16_4_ | (uint)!bVar28 * iVar140);
                            bVar24 = (bool)((byte)(uVar179 >> 5) & 1);
                            auVar410._20_4_ =
                                 (uint)bVar24 * iVar141 |
                                 (uint)!bVar24 *
                                 ((uint)bVar29 * auVar296._20_4_ | (uint)!bVar29 * iVar141);
                            bVar24 = (bool)((byte)(uVar179 >> 6) & 1);
                            auVar410._24_4_ =
                                 (uint)bVar24 * iVar347 |
                                 (uint)!bVar24 *
                                 ((uint)bVar30 * auVar296._24_4_ | (uint)!bVar30 * iVar347);
                            bVar24 = (bool)((byte)(uVar179 >> 7) & 1);
                            auVar410._28_4_ =
                                 (uint)bVar24 * iVar348 |
                                 (uint)!bVar24 *
                                 ((uint)bVar31 * auVar296._28_4_ | (uint)!bVar31 * iVar348);
                            bVar24 = (bool)((byte)(uVar179 >> 8) & 1);
                            auVar410._32_4_ =
                                 (uint)bVar24 * iVar349 |
                                 (uint)!bVar24 *
                                 ((uint)(bVar33 & 1) * auVar296._32_4_ |
                                 (uint)!(bool)(bVar33 & 1) * iVar349);
                            bVar24 = (bool)((byte)(uVar179 >> 9) & 1);
                            auVar410._36_4_ =
                                 (uint)bVar24 * iVar350 |
                                 (uint)!bVar24 *
                                 ((uint)bVar34 * auVar296._36_4_ | (uint)!bVar34 * iVar350);
                            bVar24 = (bool)((byte)(uVar179 >> 10) & 1);
                            auVar410._40_4_ =
                                 (uint)bVar24 * iVar351 |
                                 (uint)!bVar24 *
                                 ((uint)bVar35 * auVar296._40_4_ | (uint)!bVar35 * iVar351);
                            bVar24 = (bool)((byte)(uVar179 >> 0xb) & 1);
                            auVar410._44_4_ =
                                 (uint)bVar24 * iVar352 |
                                 (uint)!bVar24 *
                                 ((uint)bVar36 * auVar296._44_4_ | (uint)!bVar36 * iVar352);
                            bVar24 = (bool)((byte)(uVar179 >> 0xc) & 1);
                            auVar410._48_4_ =
                                 (uint)bVar24 * iVar353 |
                                 (uint)!bVar24 *
                                 ((uint)bVar37 * auVar296._48_4_ | (uint)!bVar37 * iVar353);
                            bVar24 = (bool)((byte)(uVar179 >> 0xd) & 1);
                            auVar410._52_4_ =
                                 (uint)bVar24 * iVar354 |
                                 (uint)!bVar24 *
                                 ((uint)bVar38 * auVar296._52_4_ | (uint)!bVar38 * iVar354);
                            bVar24 = (bool)((byte)(uVar179 >> 0xe) & 1);
                            auVar410._56_4_ =
                                 (uint)bVar24 * iVar355 |
                                 (uint)!bVar24 *
                                 ((uint)bVar39 * auVar296._56_4_ | (uint)!bVar39 * iVar355);
                            bVar24 = SUB81(uVar179 >> 0xf,0);
                            auVar410._60_4_ =
                                 (uint)bVar24 * iVar356 |
                                 (uint)!bVar24 *
                                 ((uint)bVar40 * auVar296._60_4_ | (uint)!bVar40 * iVar356);
                            uVar165 = uVar165 + 0x10;
                            auVar293 = vpaddq_avx512f(auVar293,auVar342);
                            auVar294 = vpaddq_avx512f(auVar294,auVar342);
                            auVar295 = vpaddd_avx512f(auVar295,auVar341);
                          } while ((iVar142 + 0xfU & 0xfffffff0) != uVar165);
                          bVar24 = (bool)((byte)uVar42 & 1);
                          auVar340._0_4_ = bVar24 * auVar410._0_4_ | (uint)!bVar24 * iVar166;
                          bVar24 = (bool)((byte)(uVar178 >> 1) & 1);
                          auVar340._4_4_ = bVar24 * auVar410._4_4_ | (uint)!bVar24 * iVar174;
                          bVar24 = (bool)((byte)(uVar178 >> 2) & 1);
                          auVar340._8_4_ = bVar24 * auVar410._8_4_ | (uint)!bVar24 * iVar138;
                          bVar24 = (bool)((byte)(uVar178 >> 3) & 1);
                          auVar340._12_4_ = bVar24 * auVar410._12_4_ | (uint)!bVar24 * iVar139;
                          bVar24 = (bool)((byte)(uVar178 >> 4) & 1);
                          auVar340._16_4_ = bVar24 * auVar410._16_4_ | (uint)!bVar24 * iVar140;
                          bVar24 = (bool)((byte)(uVar178 >> 5) & 1);
                          auVar340._20_4_ = bVar24 * auVar410._20_4_ | (uint)!bVar24 * iVar141;
                          bVar24 = (bool)((byte)(uVar178 >> 6) & 1);
                          auVar340._24_4_ = bVar24 * auVar410._24_4_ | (uint)!bVar24 * iVar347;
                          bVar24 = (bool)((byte)(uVar178 >> 7) & 1);
                          auVar340._28_4_ = bVar24 * auVar410._28_4_ | (uint)!bVar24 * iVar348;
                          auVar340._32_4_ =
                               (bVar32 & 1) * auVar410._32_4_ | (uint)!(bool)(bVar32 & 1) * iVar349;
                          bVar24 = (bool)(bVar32 >> 1 & 1);
                          auVar340._36_4_ = bVar24 * auVar410._36_4_ | (uint)!bVar24 * iVar350;
                          bVar24 = (bool)(bVar32 >> 2 & 1);
                          auVar340._40_4_ = bVar24 * auVar410._40_4_ | (uint)!bVar24 * iVar351;
                          bVar24 = (bool)(bVar32 >> 3 & 1);
                          auVar340._44_4_ = bVar24 * auVar410._44_4_ | (uint)!bVar24 * iVar352;
                          bVar24 = (bool)(bVar32 >> 4 & 1);
                          auVar340._48_4_ = bVar24 * auVar410._48_4_ | (uint)!bVar24 * iVar353;
                          bVar24 = (bool)(bVar32 >> 5 & 1);
                          auVar340._52_4_ = bVar24 * auVar410._52_4_ | (uint)!bVar24 * iVar354;
                          bVar24 = (bool)(bVar32 >> 6 & 1);
                          auVar340._56_4_ = bVar24 * auVar410._56_4_ | (uint)!bVar24 * iVar355;
                          auVar340._60_4_ =
                               (bVar32 >> 7) * auVar410._60_4_ |
                               (uint)!(bool)(bVar32 >> 7) * iVar356;
                          auVar235 = vextractf64x4_avx512f(auVar340,1);
                          auVar291 = vaddps_avx512f(auVar340,ZEXT3264(auVar235));
                          auVar365._0_4_ = auVar291._0_4_ + auVar291._16_4_;
                          auVar365._4_4_ = auVar291._4_4_ + auVar291._20_4_;
                          auVar365._8_4_ = auVar291._8_4_ + auVar291._24_4_;
                          auVar365._12_4_ = auVar291._12_4_ + auVar291._28_4_;
                          auVar183 = vshufpd_avx(auVar365,auVar365,1);
                          auVar366._0_4_ = auVar365._0_4_ + auVar183._0_4_;
                          auVar366._4_4_ = auVar365._4_4_ + auVar183._4_4_;
                          auVar366._8_4_ = auVar365._8_4_ + auVar183._8_4_;
                          auVar366._12_4_ = auVar365._12_4_ + auVar183._12_4_;
                          auVar183 = vhaddps_avx(auVar366,auVar366);
                          auVar290 = ZEXT1664(auVar183);
                        }
                        iVar161 = iVar161 + 1;
                      } while (iVar161 != *(int *)(&this->field_0xd8 + (long)p_Var13));
                    }
                    auVar183 = auVar290._0_16_;
                    uVar155 = uVar155 + 1;
                    local_248._0_8_ = local_248._0_8_ + lVar159 * 4;
                  } while (uVar155 != uVar9);
                }
                p_Var13 = pp_Var19[-3];
                fVar372 = auVar183._0_4_;
                fVar357 = fVar372;
                switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var13)) {
                case 1:
                  auVar181 = vmaxss_avx(auVar183,ZEXT416(0));
                  fVar357 = auVar181._0_4_;
                  break;
                case 2:
                  uVar42 = vcmpss_avx512f(auVar183,ZEXT416(0),0xe);
                  bVar24 = (bool)((byte)uVar42 & 1);
                  fVar357 = (float)((uint)bVar24 * 0x3f800000 +
                                   (uint)!bVar24 * **(int **)(&this->field_0x118 + (long)p_Var13)) *
                            fVar372;
                  break;
                case 3:
                  fVar372 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var13))[1];
                  auVar181 = vmaxss_avx(auVar183,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var13)));
                  fVar357 = auVar181._0_4_;
                  if (fVar372 < auVar181._0_4_) {
                    fVar357 = fVar372;
                  }
                  break;
                case 4:
                  auVar183 = vminss_avx(auVar183,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar87._8_4_ = 0x80000000;
                  auVar87._0_8_ = 0x8000000080000000;
                  auVar87._12_4_ = 0x80000000;
                  auVar204 = vxorps_avx512vl(auVar183,auVar87);
                  uVar42 = vcmpss_avx512f(auVar183,ZEXT416(0xc2b0c0a5),1);
                  bVar24 = (bool)((byte)uVar42 & 1);
                  in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                  fVar357 = expf((float)((uint)bVar24 * 0x42b0c0a5 + (uint)!bVar24 * auVar204._0_4_)
                                );
                  auVar341 = vpbroadcastd_avx512f(ZEXT416(0x10));
                  auVar342 = vpbroadcastq_avx512f(ZEXT816(0x10));
                  auVar182 = vxorps_avx512vl(auVar182,auVar182);
                  auVar289 = ZEXT1664(auVar182);
                  auVar343 = vpternlogd_avx512f(auVar343,auVar343,auVar343,0xff);
                  auVar344 = vpmovsxbd_avx512f(_DAT_00598144);
                  auVar345 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar346 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar181 = vxorps_avx512vl(auVar181,auVar181);
                  auVar288 = ZEXT1664(auVar181);
                  auVar287 = vmovdqu64_avx512f(local_1c8);
                  fVar357 = 1.0 / (fVar357 + 1.0);
                  break;
                case 5:
                  in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                  fVar357 = expf(fVar372);
                  fVar357 = logf(fVar357 + 1.0);
                  fVar357 = tanhf(fVar357);
                  auVar341 = vpbroadcastd_avx512f(ZEXT416(0x10));
                  auVar342 = vpbroadcastq_avx512f(ZEXT816(0x10));
                  auVar182 = vxorps_avx512vl(auVar182,auVar182);
                  auVar289 = ZEXT1664(auVar182);
                  auVar343 = vpternlogd_avx512f(auVar343,auVar343,auVar343,0xff);
                  auVar344 = vpmovsxbd_avx512f(_DAT_00598144);
                  auVar345 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar346 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar181 = vxorps_avx512vl(auVar181,auVar181);
                  auVar288 = ZEXT1664(auVar181);
                  auVar287 = vmovdqu64_avx512f(local_1c8);
                  local_248 = auVar183;
                  fVar357 = fVar357 * fVar372;
                  break;
                case 6:
                  fVar3 = **(float **)(&this->field_0x118 + (long)p_Var13);
                  auVar86._8_4_ = 0x80000000;
                  auVar86._0_8_ = 0x8000000080000000;
                  auVar86._12_4_ = 0x80000000;
                  auVar182 = ZEXT416((uint)(*(float **)(&this->field_0x118 + (long)p_Var13))[1]);
                  auVar181 = vxorps_avx512vl(auVar182,auVar86);
                  fVar379 = auVar181._0_4_ / fVar3;
                  fVar357 = 0.0;
                  if ((fVar379 <= fVar372) && (fVar357 = fVar372, fVar372 <= fVar379 + 1.0 / fVar3))
                  {
                    auVar181 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar183,auVar182);
                    fVar357 = auVar181._0_4_ * fVar372;
                  }
                }
                *(float *)((long)&local_2e0->_vptr_Allocator + uVar164 * 4) = fVar357;
                uVar164 = uVar164 + 1;
              } while (uVar164 != uVar149);
            }
            local_2e0 = (Allocator *)((long)&local_2e0->_vptr_Allocator + lVar160 * 4);
            iVar152 = local_168._0_4_ + 1;
            local_168._0_4_ = iVar152;
          } while (iVar152 != iVar145);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 < *(int *)(&this->field_0xd0 + (long)pp_Var21[-3]));
    }
  }
  pMVar137 = local_120;
  Deconvolution::cut_padding
            ((Deconvolution *)
             ((long)&this->_vptr_Deconvolution_x86_avx512 +
             (long)this->_vptr_Deconvolution_x86_avx512[-3]),&local_228,local_120,local_178);
  iVar152 = -100;
  if ((pMVar137->data != (void *)0x0) && (iVar152 = -100, (long)pMVar137->c * pMVar137->cstep != 0))
  {
    iVar152 = 0;
  }
LAB_00291354:
  piVar14 = (int *)CONCAT44(local_228.refcount._4_4_,(int)local_228.refcount);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_228.data != (Allocator *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar152;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}